

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  uint uVar18;
  uint uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [28];
  undefined1 auVar124 [12];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [24];
  uint uVar128;
  uint uVar129;
  uint uVar130;
  long lVar131;
  ulong uVar132;
  long lVar133;
  ulong uVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar154;
  float fVar158;
  float fVar165;
  float fVar168;
  float fVar171;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar155;
  float fVar159;
  float fVar162;
  float fVar174;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar156;
  float fVar157;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar195;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar196;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float fVar197;
  undefined1 auVar199 [16];
  float fVar198;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar212;
  float fVar214;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar208 [32];
  float fVar216;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar211 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar239 [16];
  float fVar238;
  undefined1 auVar241 [16];
  float fVar237;
  float fVar248;
  float fVar250;
  undefined1 auVar242 [32];
  undefined1 auVar240 [16];
  float fVar252;
  undefined1 auVar243 [32];
  float fVar249;
  float fVar251;
  float fVar253;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar254;
  undefined1 auVar247 [32];
  float fVar255;
  float fVar256;
  float fVar263;
  float fVar265;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [32];
  float fVar267;
  undefined1 auVar260 [32];
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar272;
  float fVar273;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar274 [32];
  float fVar281;
  float fVar283;
  float fVar285;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar289;
  float fVar290;
  undefined1 auVar279 [32];
  float fVar301;
  float fVar302;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar303;
  undefined1 auVar304 [16];
  float fVar312;
  undefined1 auVar305 [32];
  float fVar311;
  undefined1 auVar306 [32];
  float fVar313;
  undefined1 auVar307 [32];
  float fVar309;
  float fVar310;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar308 [64];
  float fVar317;
  undefined1 auVar318 [16];
  float fVar324;
  float fVar326;
  undefined1 auVar319 [32];
  float fVar325;
  float fVar327;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar328;
  float fVar329;
  float fVar335;
  float fVar337;
  float fVar339;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar336;
  float fVar338;
  float fVar340;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float in_register_0000151c;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar353;
  undefined1 auVar354 [16];
  float fVar359;
  float fVar360;
  undefined1 auVar355 [32];
  float fVar361;
  float fVar362;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar363;
  float fVar366;
  float fVar367;
  float fVar368;
  float in_register_0000159c;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar369;
  float fVar372;
  float fVar373;
  float fVar374;
  float in_register_000015dc;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  Precalculations *local_810;
  ulong local_808;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  RayHitK<4> *local_720;
  undefined1 (*local_718) [16];
  RayQueryContext *local_710;
  size_t local_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar134 = (ulong)(byte)PVar17;
  fVar197 = *(float *)(prim + uVar134 * 0x19 + 0x12);
  auVar241 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar241 = vinsertps_avx(auVar241,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar203 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar203 = vinsertps_avx(auVar203,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar241 = vsubps_avx(auVar241,*(undefined1 (*) [16])(prim + uVar134 * 0x19 + 6));
  auVar177._0_4_ = fVar197 * auVar241._0_4_;
  auVar177._4_4_ = fVar197 * auVar241._4_4_;
  auVar177._8_4_ = fVar197 * auVar241._8_4_;
  auVar177._12_4_ = fVar197 * auVar241._12_4_;
  auVar257._0_4_ = fVar197 * auVar203._0_4_;
  auVar257._4_4_ = fVar197 * auVar203._4_4_;
  auVar257._8_4_ = fVar197 * auVar203._8_4_;
  auVar257._12_4_ = fVar197 * auVar203._12_4_;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 10)));
  auVar147._16_16_ = auVar203;
  auVar147._0_16_ = auVar241;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 5 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 5 + 10)));
  auVar208._16_16_ = auVar203;
  auVar208._0_16_ = auVar241;
  auVar24 = vcvtdq2ps_avx(auVar208);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 10)));
  auVar224._16_16_ = auVar203;
  auVar224._0_16_ = auVar241;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 10)));
  auVar25 = vcvtdq2ps_avx(auVar224);
  auVar225._16_16_ = auVar203;
  auVar225._0_16_ = auVar241;
  auVar26 = vcvtdq2ps_avx(auVar225);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xc + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xc + 10)));
  auVar274._16_16_ = auVar203;
  auVar274._0_16_ = auVar241;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xd + 6)));
  auVar27 = vcvtdq2ps_avx(auVar274);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xd + 10)));
  auVar291._16_16_ = auVar203;
  auVar291._0_16_ = auVar241;
  auVar28 = vcvtdq2ps_avx(auVar291);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x12 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x12 + 10)));
  auVar292._16_16_ = auVar203;
  auVar292._0_16_ = auVar241;
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x13 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x13 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar292);
  auVar319._16_16_ = auVar203;
  auVar319._0_16_ = auVar241;
  auVar30 = vcvtdq2ps_avx(auVar319);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x14 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0x14 + 10)));
  auVar330._16_16_ = auVar203;
  auVar330._0_16_ = auVar241;
  auVar31 = vcvtdq2ps_avx(auVar330);
  auVar241 = vshufps_avx(auVar257,auVar257,0);
  auVar203 = vshufps_avx(auVar257,auVar257,0x55);
  auVar223 = vshufps_avx(auVar257,auVar257,0xaa);
  fVar197 = auVar223._0_4_;
  fVar212 = auVar223._4_4_;
  fVar214 = auVar223._8_4_;
  fVar216 = auVar223._12_4_;
  fVar218 = auVar203._0_4_;
  fVar219 = auVar203._4_4_;
  fVar220 = auVar203._8_4_;
  fVar255 = auVar203._12_4_;
  fVar263 = auVar241._0_4_;
  fVar265 = auVar241._4_4_;
  fVar267 = auVar241._8_4_;
  fVar269 = auVar241._12_4_;
  auVar345._0_4_ = fVar263 * auVar147._0_4_ + fVar218 * auVar24._0_4_ + fVar197 * auVar25._0_4_;
  auVar345._4_4_ = fVar265 * auVar147._4_4_ + fVar219 * auVar24._4_4_ + fVar212 * auVar25._4_4_;
  auVar345._8_4_ = fVar267 * auVar147._8_4_ + fVar220 * auVar24._8_4_ + fVar214 * auVar25._8_4_;
  auVar345._12_4_ = fVar269 * auVar147._12_4_ + fVar255 * auVar24._12_4_ + fVar216 * auVar25._12_4_;
  auVar345._16_4_ = fVar263 * auVar147._16_4_ + fVar218 * auVar24._16_4_ + fVar197 * auVar25._16_4_;
  auVar345._20_4_ = fVar265 * auVar147._20_4_ + fVar219 * auVar24._20_4_ + fVar212 * auVar25._20_4_;
  auVar345._24_4_ = fVar267 * auVar147._24_4_ + fVar220 * auVar24._24_4_ + fVar214 * auVar25._24_4_;
  auVar345._28_4_ = fVar255 + in_register_000015dc + in_register_0000151c;
  auVar342._0_4_ = fVar263 * auVar26._0_4_ + fVar218 * auVar27._0_4_ + auVar28._0_4_ * fVar197;
  auVar342._4_4_ = fVar265 * auVar26._4_4_ + fVar219 * auVar27._4_4_ + auVar28._4_4_ * fVar212;
  auVar342._8_4_ = fVar267 * auVar26._8_4_ + fVar220 * auVar27._8_4_ + auVar28._8_4_ * fVar214;
  auVar342._12_4_ = fVar269 * auVar26._12_4_ + fVar255 * auVar27._12_4_ + auVar28._12_4_ * fVar216;
  auVar342._16_4_ = fVar263 * auVar26._16_4_ + fVar218 * auVar27._16_4_ + auVar28._16_4_ * fVar197;
  auVar342._20_4_ = fVar265 * auVar26._20_4_ + fVar219 * auVar27._20_4_ + auVar28._20_4_ * fVar212;
  auVar342._24_4_ = fVar267 * auVar26._24_4_ + fVar220 * auVar27._24_4_ + auVar28._24_4_ * fVar214;
  auVar342._28_4_ = fVar255 + in_register_000015dc + in_register_0000159c;
  auVar259._0_4_ = fVar263 * auVar29._0_4_ + fVar218 * auVar30._0_4_ + auVar31._0_4_ * fVar197;
  auVar259._4_4_ = fVar265 * auVar29._4_4_ + fVar219 * auVar30._4_4_ + auVar31._4_4_ * fVar212;
  auVar259._8_4_ = fVar267 * auVar29._8_4_ + fVar220 * auVar30._8_4_ + auVar31._8_4_ * fVar214;
  auVar259._12_4_ = fVar269 * auVar29._12_4_ + fVar255 * auVar30._12_4_ + auVar31._12_4_ * fVar216;
  auVar259._16_4_ = fVar263 * auVar29._16_4_ + fVar218 * auVar30._16_4_ + auVar31._16_4_ * fVar197;
  auVar259._20_4_ = fVar265 * auVar29._20_4_ + fVar219 * auVar30._20_4_ + auVar31._20_4_ * fVar212;
  auVar259._24_4_ = fVar267 * auVar29._24_4_ + fVar220 * auVar30._24_4_ + auVar31._24_4_ * fVar214;
  auVar259._28_4_ = fVar269 + fVar255 + fVar216;
  auVar241 = vshufps_avx(auVar177,auVar177,0);
  auVar203 = vshufps_avx(auVar177,auVar177,0x55);
  auVar223 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar212 = auVar223._0_4_;
  fVar214 = auVar223._4_4_;
  fVar216 = auVar223._8_4_;
  fVar218 = auVar223._12_4_;
  fVar265 = auVar203._0_4_;
  fVar267 = auVar203._4_4_;
  fVar269 = auVar203._8_4_;
  fVar270 = auVar203._12_4_;
  fVar219 = auVar241._0_4_;
  fVar220 = auVar241._4_4_;
  fVar255 = auVar241._8_4_;
  fVar263 = auVar241._12_4_;
  fVar197 = auVar147._28_4_;
  auVar182._0_4_ = fVar219 * auVar147._0_4_ + fVar265 * auVar24._0_4_ + fVar212 * auVar25._0_4_;
  auVar182._4_4_ = fVar220 * auVar147._4_4_ + fVar267 * auVar24._4_4_ + fVar214 * auVar25._4_4_;
  auVar182._8_4_ = fVar255 * auVar147._8_4_ + fVar269 * auVar24._8_4_ + fVar216 * auVar25._8_4_;
  auVar182._12_4_ = fVar263 * auVar147._12_4_ + fVar270 * auVar24._12_4_ + fVar218 * auVar25._12_4_;
  auVar182._16_4_ = fVar219 * auVar147._16_4_ + fVar265 * auVar24._16_4_ + fVar212 * auVar25._16_4_;
  auVar182._20_4_ = fVar220 * auVar147._20_4_ + fVar267 * auVar24._20_4_ + fVar214 * auVar25._20_4_;
  auVar182._24_4_ = fVar255 * auVar147._24_4_ + fVar269 * auVar24._24_4_ + fVar216 * auVar25._24_4_;
  auVar182._28_4_ = fVar197 + auVar24._28_4_ + auVar25._28_4_;
  auVar242._0_4_ = fVar219 * auVar26._0_4_ + auVar28._0_4_ * fVar212 + fVar265 * auVar27._0_4_;
  auVar242._4_4_ = fVar220 * auVar26._4_4_ + auVar28._4_4_ * fVar214 + fVar267 * auVar27._4_4_;
  auVar242._8_4_ = fVar255 * auVar26._8_4_ + auVar28._8_4_ * fVar216 + fVar269 * auVar27._8_4_;
  auVar242._12_4_ = fVar263 * auVar26._12_4_ + auVar28._12_4_ * fVar218 + fVar270 * auVar27._12_4_;
  auVar242._16_4_ = fVar219 * auVar26._16_4_ + auVar28._16_4_ * fVar212 + fVar265 * auVar27._16_4_;
  auVar242._20_4_ = fVar220 * auVar26._20_4_ + auVar28._20_4_ * fVar214 + fVar267 * auVar27._20_4_;
  auVar242._24_4_ = fVar255 * auVar26._24_4_ + auVar28._24_4_ * fVar216 + fVar269 * auVar27._24_4_;
  auVar242._28_4_ = fVar197 + auVar28._28_4_ + auVar25._28_4_;
  auVar226._0_4_ = fVar219 * auVar29._0_4_ + fVar265 * auVar30._0_4_ + auVar31._0_4_ * fVar212;
  auVar226._4_4_ = fVar220 * auVar29._4_4_ + fVar267 * auVar30._4_4_ + auVar31._4_4_ * fVar214;
  auVar226._8_4_ = fVar255 * auVar29._8_4_ + fVar269 * auVar30._8_4_ + auVar31._8_4_ * fVar216;
  auVar226._12_4_ = fVar263 * auVar29._12_4_ + fVar270 * auVar30._12_4_ + auVar31._12_4_ * fVar218;
  auVar226._16_4_ = fVar219 * auVar29._16_4_ + fVar265 * auVar30._16_4_ + auVar31._16_4_ * fVar212;
  auVar226._20_4_ = fVar220 * auVar29._20_4_ + fVar267 * auVar30._20_4_ + auVar31._20_4_ * fVar214;
  auVar226._24_4_ = fVar255 * auVar29._24_4_ + fVar269 * auVar30._24_4_ + auVar31._24_4_ * fVar216;
  auVar226._28_4_ = fVar197 + auVar27._28_4_ + fVar218;
  auVar293._8_4_ = 0x7fffffff;
  auVar293._0_8_ = 0x7fffffff7fffffff;
  auVar293._12_4_ = 0x7fffffff;
  auVar293._16_4_ = 0x7fffffff;
  auVar293._20_4_ = 0x7fffffff;
  auVar293._24_4_ = 0x7fffffff;
  auVar293._28_4_ = 0x7fffffff;
  auVar140._8_4_ = 0x219392ef;
  auVar140._0_8_ = 0x219392ef219392ef;
  auVar140._12_4_ = 0x219392ef;
  auVar140._16_4_ = 0x219392ef;
  auVar140._20_4_ = 0x219392ef;
  auVar140._24_4_ = 0x219392ef;
  auVar140._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(auVar345,auVar293);
  auVar147 = vcmpps_avx(auVar147,auVar140,1);
  auVar24 = vblendvps_avx(auVar345,auVar140,auVar147);
  auVar147 = vandps_avx(auVar342,auVar293);
  auVar147 = vcmpps_avx(auVar147,auVar140,1);
  auVar25 = vblendvps_avx(auVar342,auVar140,auVar147);
  auVar147 = vandps_avx(auVar259,auVar293);
  auVar147 = vcmpps_avx(auVar147,auVar140,1);
  auVar147 = vblendvps_avx(auVar259,auVar140,auVar147);
  auVar26 = vrcpps_avx(auVar24);
  fVar197 = auVar26._0_4_;
  fVar212 = auVar26._4_4_;
  auVar27._4_4_ = auVar24._4_4_ * fVar212;
  auVar27._0_4_ = auVar24._0_4_ * fVar197;
  fVar214 = auVar26._8_4_;
  auVar27._8_4_ = auVar24._8_4_ * fVar214;
  fVar216 = auVar26._12_4_;
  auVar27._12_4_ = auVar24._12_4_ * fVar216;
  fVar218 = auVar26._16_4_;
  auVar27._16_4_ = auVar24._16_4_ * fVar218;
  fVar219 = auVar26._20_4_;
  auVar27._20_4_ = auVar24._20_4_ * fVar219;
  fVar220 = auVar26._24_4_;
  auVar27._24_4_ = auVar24._24_4_ * fVar220;
  auVar27._28_4_ = auVar24._28_4_;
  auVar294._8_4_ = 0x3f800000;
  auVar294._0_8_ = 0x3f8000003f800000;
  auVar294._12_4_ = 0x3f800000;
  auVar294._16_4_ = 0x3f800000;
  auVar294._20_4_ = 0x3f800000;
  auVar294._24_4_ = 0x3f800000;
  auVar294._28_4_ = 0x3f800000;
  auVar24 = vsubps_avx(auVar294,auVar27);
  fVar197 = fVar197 + fVar197 * auVar24._0_4_;
  fVar212 = fVar212 + fVar212 * auVar24._4_4_;
  fVar214 = fVar214 + fVar214 * auVar24._8_4_;
  fVar216 = fVar216 + fVar216 * auVar24._12_4_;
  fVar218 = fVar218 + fVar218 * auVar24._16_4_;
  fVar219 = fVar219 + fVar219 * auVar24._20_4_;
  fVar220 = fVar220 + fVar220 * auVar24._24_4_;
  auVar24 = vrcpps_avx(auVar25);
  fVar255 = auVar24._0_4_;
  fVar263 = auVar24._4_4_;
  auVar26._4_4_ = fVar263 * auVar25._4_4_;
  auVar26._0_4_ = fVar255 * auVar25._0_4_;
  fVar265 = auVar24._8_4_;
  auVar26._8_4_ = fVar265 * auVar25._8_4_;
  fVar267 = auVar24._12_4_;
  auVar26._12_4_ = fVar267 * auVar25._12_4_;
  fVar269 = auVar24._16_4_;
  auVar26._16_4_ = fVar269 * auVar25._16_4_;
  fVar270 = auVar24._20_4_;
  auVar26._20_4_ = fVar270 * auVar25._20_4_;
  fVar271 = auVar24._24_4_;
  auVar26._24_4_ = fVar271 * auVar25._24_4_;
  auVar26._28_4_ = auVar25._28_4_;
  auVar24 = vsubps_avx(auVar294,auVar26);
  fVar255 = fVar255 + fVar255 * auVar24._0_4_;
  fVar263 = fVar263 + fVar263 * auVar24._4_4_;
  fVar265 = fVar265 + fVar265 * auVar24._8_4_;
  fVar267 = fVar267 + fVar267 * auVar24._12_4_;
  fVar269 = fVar269 + fVar269 * auVar24._16_4_;
  fVar270 = fVar270 + fVar270 * auVar24._20_4_;
  fVar271 = fVar271 + fVar271 * auVar24._24_4_;
  auVar24 = vrcpps_avx(auVar147);
  fVar272 = auVar24._0_4_;
  fVar280 = auVar24._4_4_;
  auVar25._4_4_ = fVar280 * auVar147._4_4_;
  auVar25._0_4_ = fVar272 * auVar147._0_4_;
  fVar282 = auVar24._8_4_;
  auVar25._8_4_ = fVar282 * auVar147._8_4_;
  fVar284 = auVar24._12_4_;
  auVar25._12_4_ = fVar284 * auVar147._12_4_;
  fVar286 = auVar24._16_4_;
  auVar25._16_4_ = fVar286 * auVar147._16_4_;
  fVar287 = auVar24._20_4_;
  auVar25._20_4_ = fVar287 * auVar147._20_4_;
  fVar288 = auVar24._24_4_;
  auVar25._24_4_ = fVar288 * auVar147._24_4_;
  auVar25._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar294,auVar25);
  fVar272 = fVar272 + fVar272 * auVar147._0_4_;
  fVar280 = fVar280 + fVar280 * auVar147._4_4_;
  fVar282 = fVar282 + fVar282 * auVar147._8_4_;
  fVar284 = fVar284 + fVar284 * auVar147._12_4_;
  fVar286 = fVar286 + fVar286 * auVar147._16_4_;
  fVar287 = fVar287 + fVar287 * auVar147._20_4_;
  fVar288 = fVar288 + fVar288 * auVar147._24_4_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar134 * 7 + 6);
  auVar241 = vpmovsxwd_avx(auVar241);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar134 * 7 + 0xe);
  auVar203 = vpmovsxwd_avx(auVar203);
  auVar141._16_16_ = auVar203;
  auVar141._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar141);
  auVar147 = vsubps_avx(auVar147,auVar182);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar134 * 9 + 6);
  auVar241 = vpmovsxwd_avx(auVar223);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar134 * 9 + 0xe);
  auVar203 = vpmovsxwd_avx(auVar205);
  auVar138._0_4_ = fVar197 * auVar147._0_4_;
  auVar138._4_4_ = fVar212 * auVar147._4_4_;
  auVar138._8_4_ = fVar214 * auVar147._8_4_;
  auVar138._12_4_ = fVar216 * auVar147._12_4_;
  auVar28._16_4_ = fVar218 * auVar147._16_4_;
  auVar28._0_16_ = auVar138;
  auVar28._20_4_ = fVar219 * auVar147._20_4_;
  auVar28._24_4_ = fVar220 * auVar147._24_4_;
  auVar28._28_4_ = auVar147._28_4_;
  auVar295._16_16_ = auVar203;
  auVar295._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar295);
  auVar147 = vsubps_avx(auVar147,auVar182);
  auVar178._0_4_ = fVar197 * auVar147._0_4_;
  auVar178._4_4_ = fVar212 * auVar147._4_4_;
  auVar178._8_4_ = fVar214 * auVar147._8_4_;
  auVar178._12_4_ = fVar216 * auVar147._12_4_;
  auVar29._16_4_ = fVar218 * auVar147._16_4_;
  auVar29._0_16_ = auVar178;
  auVar29._20_4_ = fVar219 * auVar147._20_4_;
  auVar29._24_4_ = fVar220 * auVar147._24_4_;
  auVar29._28_4_ = auVar147._28_4_;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = *(ulong *)(prim + uVar134 * 0xe + 6);
  auVar241 = vpmovsxwd_avx(auVar341);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar134 * 0xe + 0xe);
  auVar203 = vpmovsxwd_avx(auVar10);
  auVar209._16_16_ = auVar203;
  auVar209._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar209);
  auVar147 = vsubps_avx(auVar147,auVar242);
  auVar199._0_4_ = fVar255 * auVar147._0_4_;
  auVar199._4_4_ = fVar263 * auVar147._4_4_;
  auVar199._8_4_ = fVar265 * auVar147._8_4_;
  auVar199._12_4_ = fVar267 * auVar147._12_4_;
  auVar30._16_4_ = fVar269 * auVar147._16_4_;
  auVar30._0_16_ = auVar199;
  auVar30._20_4_ = fVar270 * auVar147._20_4_;
  auVar30._24_4_ = fVar271 * auVar147._24_4_;
  auVar30._28_4_ = auVar147._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  auVar241 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar17 * 0x10 + 0xe);
  auVar203 = vpmovsxwd_avx(auVar12);
  auVar296._16_16_ = auVar203;
  auVar296._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar296);
  auVar147 = vsubps_avx(auVar147,auVar242);
  auVar239._0_4_ = fVar255 * auVar147._0_4_;
  auVar239._4_4_ = fVar263 * auVar147._4_4_;
  auVar239._8_4_ = fVar265 * auVar147._8_4_;
  auVar239._12_4_ = fVar267 * auVar147._12_4_;
  auVar24._16_4_ = fVar269 * auVar147._16_4_;
  auVar24._0_16_ = auVar239;
  auVar24._20_4_ = fVar270 * auVar147._20_4_;
  auVar24._24_4_ = fVar271 * auVar147._24_4_;
  auVar24._28_4_ = auVar147._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar134 * 0x15 + 6);
  auVar241 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar134 * 0x15 + 0xe);
  auVar203 = vpmovsxwd_avx(auVar14);
  auVar260._16_16_ = auVar203;
  auVar260._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar260);
  auVar147 = vsubps_avx(auVar147,auVar226);
  auVar258._0_4_ = fVar272 * auVar147._0_4_;
  auVar258._4_4_ = fVar280 * auVar147._4_4_;
  auVar258._8_4_ = fVar282 * auVar147._8_4_;
  auVar258._12_4_ = fVar284 * auVar147._12_4_;
  auVar31._16_4_ = fVar286 * auVar147._16_4_;
  auVar31._0_16_ = auVar258;
  auVar31._20_4_ = fVar287 * auVar147._20_4_;
  auVar31._24_4_ = fVar288 * auVar147._24_4_;
  auVar31._28_4_ = auVar147._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 6);
  auVar241 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 0xe);
  auVar203 = vpmovsxwd_avx(auVar16);
  auVar297._16_16_ = auVar203;
  auVar297._0_16_ = auVar241;
  auVar147 = vcvtdq2ps_avx(auVar297);
  auVar147 = vsubps_avx(auVar147,auVar226);
  auVar221._0_4_ = fVar272 * auVar147._0_4_;
  auVar221._4_4_ = fVar280 * auVar147._4_4_;
  auVar221._8_4_ = fVar282 * auVar147._8_4_;
  auVar221._12_4_ = fVar284 * auVar147._12_4_;
  auVar23._16_4_ = fVar286 * auVar147._16_4_;
  auVar23._0_16_ = auVar221;
  auVar23._20_4_ = fVar287 * auVar147._20_4_;
  auVar23._24_4_ = fVar288 * auVar147._24_4_;
  auVar23._28_4_ = auVar147._28_4_;
  auVar241 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar203 = vpminsd_avx(auVar138,auVar178);
  auVar331._16_16_ = auVar241;
  auVar331._0_16_ = auVar203;
  auVar223 = auVar24._16_16_;
  auVar308 = ZEXT1664(auVar223);
  auVar241 = vpminsd_avx(auVar30._16_16_,auVar223);
  auVar203 = vpminsd_avx(auVar199,auVar239);
  auVar343._16_16_ = auVar241;
  auVar343._0_16_ = auVar203;
  auVar147 = vmaxps_avx(auVar331,auVar343);
  auVar241 = vpminsd_avx(auVar31._16_16_,auVar23._16_16_);
  auVar203 = vpminsd_avx(auVar258,auVar221);
  auVar355._16_16_ = auVar241;
  auVar355._0_16_ = auVar203;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar364._4_4_ = uVar9;
  auVar364._0_4_ = uVar9;
  auVar364._8_4_ = uVar9;
  auVar364._12_4_ = uVar9;
  auVar364._16_4_ = uVar9;
  auVar364._20_4_ = uVar9;
  auVar364._24_4_ = uVar9;
  auVar364._28_4_ = uVar9;
  auVar24 = vmaxps_avx(auVar355,auVar364);
  auVar147 = vmaxps_avx(auVar147,auVar24);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar241 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar203 = vpmaxsd_avx(auVar138,auVar178);
  auVar142._16_16_ = auVar241;
  auVar142._0_16_ = auVar203;
  auVar241 = vpmaxsd_avx(auVar30._16_16_,auVar223);
  auVar203 = vpmaxsd_avx(auVar199,auVar239);
  auVar183._16_16_ = auVar241;
  auVar183._0_16_ = auVar203;
  auVar147 = vminps_avx(auVar142,auVar183);
  auVar241 = vpmaxsd_avx(auVar31._16_16_,auVar23._16_16_);
  auVar203 = vpmaxsd_avx(auVar258,auVar221);
  auVar184._16_16_ = auVar241;
  auVar184._0_16_ = auVar203;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar210._4_4_ = uVar9;
  auVar210._0_4_ = uVar9;
  auVar210._8_4_ = uVar9;
  auVar210._12_4_ = uVar9;
  auVar210._16_4_ = uVar9;
  auVar210._20_4_ = uVar9;
  auVar210._24_4_ = uVar9;
  auVar210._28_4_ = uVar9;
  auVar24 = vminps_avx(auVar184,auVar210);
  auVar147 = vminps_avx(auVar147,auVar24);
  auVar32._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar32._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar32._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar32._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar32._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar32._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar32._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar32._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_80,auVar32,2);
  auVar241 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar185._16_16_ = auVar241;
  auVar185._0_16_ = auVar241;
  auVar24 = vcvtdq2ps_avx(auVar185);
  auVar24 = vcmpps_avx(_DAT_01f7b060,auVar24,1);
  auVar147 = vandps_avx(auVar147,auVar24);
  uVar128 = vmovmskps_avx(auVar147);
  local_5e0 = mm_lookupmask_ps._16_8_;
  uStack_5d8 = mm_lookupmask_ps._24_8_;
  uStack_5d0 = mm_lookupmask_ps._16_8_;
  uStack_5c8 = mm_lookupmask_ps._24_8_;
  local_5e8 = pre->ray_space + k;
  local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_810 = pre;
  do {
    uVar134 = (ulong)uVar128;
    if (uVar134 == 0) {
      return;
    }
    auVar147 = auVar308._0_32_;
    lVar131 = 0;
    if (uVar134 != 0) {
      for (; (uVar128 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    uVar134 = uVar134 - 1 & uVar134;
    uVar128 = *(uint *)(prim + 2);
    uVar18 = *(uint *)(prim + lVar131 * 4 + 6);
    local_808 = (ulong)uVar18;
    pGVar21 = (context->scene->geometries).items[uVar128].ptr;
    uVar132 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                              pGVar21[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * local_808);
    p_Var22 = pGVar21[1].intersectionFilterN;
    lVar131 = *(long *)&pGVar21[1].time_range.upper;
    auVar241 = *(undefined1 (*) [16])(lVar131 + (long)p_Var22 * uVar132);
    auVar203 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 1) * (long)p_Var22);
    auVar223 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 2) * (long)p_Var22);
    lVar133 = 0;
    if (uVar134 != 0) {
      for (; (uVar134 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
      }
    }
    auVar205 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 3) * (long)p_Var22);
    if (((uVar134 != 0) && (uVar132 = uVar134 - 1 & uVar134, uVar132 != 0)) &&
       (lVar131 = 0, uVar132 != 0)) {
      for (; (uVar132 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
      }
    }
    uVar19 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar341 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar12 = vinsertps_avx(auVar341,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar11 = vsubps_avx(auVar241,auVar12);
    auVar341 = vshufps_avx(auVar11,auVar11,0);
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    fVar197 = (local_5e8->vx).field_0.m128[0];
    fVar212 = (local_5e8->vx).field_0.m128[1];
    fVar214 = (local_5e8->vx).field_0.m128[2];
    fVar216 = (local_5e8->vx).field_0.m128[3];
    fVar218 = (local_5e8->vy).field_0.m128[0];
    fVar219 = (local_5e8->vy).field_0.m128[1];
    fVar220 = (local_5e8->vy).field_0.m128[2];
    fVar255 = (local_5e8->vy).field_0.m128[3];
    fVar263 = (local_5e8->vz).field_0.m128[0];
    fVar265 = (local_5e8->vz).field_0.m128[1];
    fVar267 = (local_5e8->vz).field_0.m128[2];
    fVar269 = (local_5e8->vz).field_0.m128[3];
    auVar179._0_4_ = auVar341._0_4_ * fVar197 + auVar10._0_4_ * fVar218 + fVar263 * auVar11._0_4_;
    auVar179._4_4_ = auVar341._4_4_ * fVar212 + auVar10._4_4_ * fVar219 + fVar265 * auVar11._4_4_;
    auVar179._8_4_ = auVar341._8_4_ * fVar214 + auVar10._8_4_ * fVar220 + fVar267 * auVar11._8_4_;
    auVar179._12_4_ =
         auVar341._12_4_ * fVar216 + auVar10._12_4_ * fVar255 + fVar269 * auVar11._12_4_;
    auVar341 = vblendps_avx(auVar179,auVar241,8);
    auVar13 = vsubps_avx(auVar203,auVar12);
    auVar10 = vshufps_avx(auVar13,auVar13,0);
    auVar11 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar354._0_4_ = auVar10._0_4_ * fVar197 + auVar11._0_4_ * fVar218 + fVar263 * auVar13._0_4_;
    auVar354._4_4_ = auVar10._4_4_ * fVar212 + auVar11._4_4_ * fVar219 + fVar265 * auVar13._4_4_;
    auVar354._8_4_ = auVar10._8_4_ * fVar214 + auVar11._8_4_ * fVar220 + fVar267 * auVar13._8_4_;
    auVar354._12_4_ = auVar10._12_4_ * fVar216 + auVar11._12_4_ * fVar255 + fVar269 * auVar13._12_4_
    ;
    auVar10 = vblendps_avx(auVar354,auVar203,8);
    auVar14 = vsubps_avx(auVar223,auVar12);
    auVar11 = vshufps_avx(auVar14,auVar14,0);
    auVar13 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar304._0_4_ = auVar11._0_4_ * fVar197 + auVar13._0_4_ * fVar218 + fVar263 * auVar14._0_4_;
    auVar304._4_4_ = auVar11._4_4_ * fVar212 + auVar13._4_4_ * fVar219 + fVar265 * auVar14._4_4_;
    auVar304._8_4_ = auVar11._8_4_ * fVar214 + auVar13._8_4_ * fVar220 + fVar267 * auVar14._8_4_;
    auVar304._12_4_ = auVar11._12_4_ * fVar216 + auVar13._12_4_ * fVar255 + fVar269 * auVar14._12_4_
    ;
    auVar14 = vshufps_avx(auVar223,auVar223,0xff);
    auVar11 = vblendps_avx(auVar304,auVar223,8);
    auVar15 = vsubps_avx(auVar205,auVar12);
    auVar12 = vshufps_avx(auVar15,auVar15,0);
    auVar13 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar318._0_4_ = auVar12._0_4_ * fVar197 + auVar13._0_4_ * fVar218 + fVar263 * auVar15._0_4_;
    auVar318._4_4_ = auVar12._4_4_ * fVar212 + auVar13._4_4_ * fVar219 + fVar265 * auVar15._4_4_;
    auVar318._8_4_ = auVar12._8_4_ * fVar214 + auVar13._8_4_ * fVar220 + fVar267 * auVar15._8_4_;
    auVar318._12_4_ = auVar12._12_4_ * fVar216 + auVar13._12_4_ * fVar255 + fVar269 * auVar15._12_4_
    ;
    auVar15 = vshufps_avx(auVar205,auVar205,0xff);
    auVar12 = vblendps_avx(auVar318,auVar205,8);
    auVar240._8_4_ = 0x7fffffff;
    auVar240._0_8_ = 0x7fffffff7fffffff;
    auVar240._12_4_ = 0x7fffffff;
    auVar341 = vandps_avx(auVar341,auVar240);
    auVar10 = vandps_avx(auVar10,auVar240);
    auVar13 = vmaxps_avx(auVar341,auVar10);
    auVar341 = vandps_avx(auVar11,auVar240);
    auVar10 = vandps_avx(auVar12,auVar240);
    auVar341 = vmaxps_avx(auVar341,auVar10);
    auVar341 = vmaxps_avx(auVar13,auVar341);
    auVar10 = vmovshdup_avx(auVar341);
    auVar10 = vmaxss_avx(auVar10,auVar341);
    auVar341 = vshufpd_avx(auVar341,auVar341,1);
    auVar341 = vmaxss_avx(auVar341,auVar10);
    lVar131 = (long)(int)uVar19 * 0x44;
    fVar272 = *(float *)(bezier_basis0 + lVar131 + 0x908);
    fVar280 = *(float *)(bezier_basis0 + lVar131 + 0x90c);
    fVar282 = *(float *)(bezier_basis0 + lVar131 + 0x910);
    fVar284 = *(float *)(bezier_basis0 + lVar131 + 0x914);
    fVar286 = *(float *)(bezier_basis0 + lVar131 + 0x918);
    fVar287 = *(float *)(bezier_basis0 + lVar131 + 0x91c);
    fVar288 = *(float *)(bezier_basis0 + lVar131 + 0x920);
    local_7e0._0_16_ = auVar304;
    auVar10 = vshufps_avx(auVar304,auVar304,0);
    register0x00001490 = auVar10;
    _local_500 = auVar10;
    auVar11 = vshufps_avx(auVar304,auVar304,0x55);
    register0x00001390 = auVar11;
    _local_520 = auVar11;
    register0x00001410 = auVar14;
    _local_120 = auVar14;
    fVar197 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar131 + 0xd8c);
    fVar212 = *(float *)(bezier_basis0 + lVar131 + 0xd90);
    fVar214 = *(float *)(bezier_basis0 + lVar131 + 0xd94);
    fVar216 = *(float *)(bezier_basis0 + lVar131 + 0xd98);
    fVar218 = *(float *)(bezier_basis0 + lVar131 + 0xd9c);
    fVar219 = *(float *)(bezier_basis0 + lVar131 + 0xda0);
    fVar220 = *(float *)(bezier_basis0 + lVar131 + 0xda4);
    auVar123 = *(undefined1 (*) [28])(bezier_basis0 + lVar131 + 0xd8c);
    auVar12 = vshufps_avx(auVar318,auVar318,0);
    register0x00001310 = auVar12;
    _local_4a0 = auVar12;
    auVar13 = vshufps_avx(auVar318,auVar318,0x55);
    register0x000015d0 = auVar13;
    _local_5a0 = auVar13;
    register0x000013d0 = auVar15;
    _local_160 = auVar15;
    fVar237 = auVar12._0_4_;
    fVar248 = auVar12._4_4_;
    fVar250 = auVar12._8_4_;
    fVar252 = auVar12._12_4_;
    fVar369 = auVar13._0_4_;
    fVar372 = auVar13._4_4_;
    fVar373 = auVar13._8_4_;
    fVar374 = auVar13._12_4_;
    fVar328 = auVar10._0_4_;
    fVar335 = auVar10._4_4_;
    fVar337 = auVar10._8_4_;
    fVar339 = auVar10._12_4_;
    fVar273 = auVar11._0_4_;
    fVar281 = auVar11._4_4_;
    fVar283 = auVar11._8_4_;
    fVar285 = auVar11._12_4_;
    fVar267 = auVar15._0_4_;
    fVar269 = auVar15._4_4_;
    fVar270 = auVar15._8_4_;
    fVar271 = auVar15._12_4_;
    fVar238 = auVar14._0_4_;
    fVar249 = auVar14._4_4_;
    fVar251 = auVar14._8_4_;
    auVar10 = vshufps_avx(auVar354,auVar354,0);
    register0x00001490 = auVar10;
    _local_2e0 = auVar10;
    fVar311 = *(float *)(bezier_basis0 + lVar131 + 0x484);
    fVar233 = *(float *)(bezier_basis0 + lVar131 + 0x488);
    fVar301 = *(float *)(bezier_basis0 + lVar131 + 0x48c);
    fVar313 = *(float *)(bezier_basis0 + lVar131 + 0x490);
    fVar314 = *(float *)(bezier_basis0 + lVar131 + 0x494);
    fVar234 = *(float *)(bezier_basis0 + lVar131 + 0x498);
    fVar302 = *(float *)(bezier_basis0 + lVar131 + 0x49c);
    fVar329 = auVar10._0_4_;
    fVar336 = auVar10._4_4_;
    fVar338 = auVar10._8_4_;
    fVar340 = auVar10._12_4_;
    auVar11 = vshufps_avx(auVar354,auVar354,0x55);
    register0x00001410 = auVar11;
    _local_480 = auVar11;
    fVar303 = auVar11._0_4_;
    fVar309 = auVar11._4_4_;
    fVar310 = auVar11._8_4_;
    fVar312 = auVar11._12_4_;
    auVar11 = vshufps_avx(auVar203,auVar203,0xff);
    register0x00001590 = auVar11;
    _local_a0 = auVar11;
    fVar325 = auVar11._0_4_;
    fVar353 = auVar11._4_4_;
    fVar359 = auVar11._8_4_;
    fVar360 = auVar11._12_4_;
    fVar362 = *(float *)(bezier_basis0 + lVar131 + 0x924) + 0.0 + 0.0;
    auVar11 = vshufps_avx(auVar179,auVar179,0);
    register0x00001350 = auVar11;
    _local_140 = auVar11;
    pauVar1 = (undefined1 (*) [16])(bezier_basis0 + lVar131);
    fVar255 = *(float *)*pauVar1;
    fVar263 = *(float *)(bezier_basis0 + lVar131 + 4);
    fVar265 = *(float *)(bezier_basis0 + lVar131 + 8);
    auVar124 = *(undefined1 (*) [12])*pauVar1;
    fVar315 = *(float *)(bezier_basis0 + lVar131 + 0xc);
    fStack_330 = *(float *)(bezier_basis0 + lVar131 + 0x10);
    fStack_32c = *(float *)(bezier_basis0 + lVar131 + 0x14);
    fStack_328 = *(float *)(bezier_basis0 + lVar131 + 0x18);
    fVar256 = auVar11._0_4_;
    fVar264 = auVar11._4_4_;
    fVar266 = auVar11._8_4_;
    fVar268 = auVar11._12_4_;
    auVar344._0_4_ = fVar256 * fVar255 + fVar329 * fVar311 + fVar328 * fVar272 + fVar237 * fVar197;
    auVar344._4_4_ = fVar264 * fVar263 + fVar336 * fVar233 + fVar335 * fVar280 + fVar248 * fVar212;
    auVar344._8_4_ = fVar266 * fVar265 + fVar338 * fVar301 + fVar337 * fVar282 + fVar250 * fVar214;
    auVar344._12_4_ = fVar268 * fVar315 + fVar340 * fVar313 + fVar339 * fVar284 + fVar252 * fVar216;
    auVar344._16_4_ =
         fVar256 * fStack_330 + fVar329 * fVar314 + fVar328 * fVar286 + fVar237 * fVar218;
    auVar344._20_4_ =
         fVar264 * fStack_32c + fVar336 * fVar234 + fVar335 * fVar287 + fVar248 * fVar219;
    auVar344._24_4_ =
         fVar266 * fStack_328 + fVar338 * fVar302 + fVar337 * fVar288 + fVar250 * fVar220;
    auVar344._28_4_ = fVar285 + 0.0;
    auVar11 = vshufps_avx(auVar179,auVar179,0x55);
    register0x00001290 = auVar11;
    _local_740 = auVar11;
    fVar198 = auVar11._0_4_;
    fVar213 = auVar11._4_4_;
    fVar215 = auVar11._8_4_;
    fVar217 = auVar11._12_4_;
    auVar346._0_4_ = fVar198 * fVar255 + fVar303 * fVar311 + fVar273 * fVar272 + fVar369 * fVar197;
    auVar346._4_4_ = fVar213 * fVar263 + fVar309 * fVar233 + fVar281 * fVar280 + fVar372 * fVar212;
    auVar346._8_4_ = fVar215 * fVar265 + fVar310 * fVar301 + fVar283 * fVar282 + fVar373 * fVar214;
    auVar346._12_4_ = fVar217 * fVar315 + fVar312 * fVar313 + fVar285 * fVar284 + fVar374 * fVar216;
    auVar346._16_4_ =
         fVar198 * fStack_330 + fVar303 * fVar314 + fVar273 * fVar286 + fVar369 * fVar218;
    auVar346._20_4_ =
         fVar213 * fStack_32c + fVar309 * fVar234 + fVar281 * fVar287 + fVar372 * fVar219;
    auVar346._24_4_ =
         fVar215 * fStack_328 + fVar310 * fVar302 + fVar283 * fVar288 + fVar373 * fVar220;
    auVar346._28_4_ = 0;
    auVar11 = vpermilps_avx(auVar241,0xff);
    register0x00001450 = auVar11;
    _local_c0 = auVar11;
    _local_340 = *pauVar1;
    auVar15 = _local_340;
    uStack_324 = *(undefined4 *)(bezier_basis0 + lVar131 + 0x1c);
    fVar253 = auVar11._0_4_;
    fVar317 = auVar11._4_4_;
    fVar324 = auVar11._8_4_;
    fVar135 = fVar325 * fVar311 + fVar238 * fVar272 + fVar267 * fVar197 + fVar253 * fVar255;
    fVar154 = fVar353 * fVar233 + fVar249 * fVar280 + fVar269 * fVar212 + fVar317 * fVar263;
    fVar158 = fVar359 * fVar301 + fVar251 * fVar282 + fVar270 * fVar214 + fVar324 * fVar265;
    fVar162 = fVar360 * fVar313 + auVar14._12_4_ * fVar284 + fVar271 * fVar216 +
              auVar11._12_4_ * fVar315;
    fVar165 = fVar325 * fVar314 + fVar238 * fVar286 + fVar267 * fVar218 + fVar253 * fStack_330;
    fVar168 = fVar353 * fVar234 + fVar249 * fVar287 + fVar269 * fVar219 + fVar317 * fStack_32c;
    fVar171 = fVar359 * fVar302 + fVar251 * fVar288 + fVar270 * fVar220 + fVar324 * fStack_328;
    fVar174 = fVar362 + 0.0;
    fVar316 = *(float *)(bezier_basis1 + lVar131 + 0x908);
    fVar236 = *(float *)(bezier_basis1 + lVar131 + 0x90c);
    fVar195 = *(float *)(bezier_basis1 + lVar131 + 0x910);
    fVar327 = *(float *)(bezier_basis1 + lVar131 + 0x914);
    fVar155 = *(float *)(bezier_basis1 + lVar131 + 0x918);
    fVar159 = *(float *)(bezier_basis1 + lVar131 + 0x91c);
    fVar136 = *(float *)(bezier_basis1 + lVar131 + 0x920);
    fVar156 = *(float *)(bezier_basis1 + lVar131 + 0xd8c);
    fVar160 = *(float *)(bezier_basis1 + lVar131 + 0xd90);
    fVar163 = *(float *)(bezier_basis1 + lVar131 + 0xd94);
    fVar166 = *(float *)(bezier_basis1 + lVar131 + 0xd98);
    fVar169 = *(float *)(bezier_basis1 + lVar131 + 0xd9c);
    fVar172 = *(float *)(bezier_basis1 + lVar131 + 0xda0);
    fVar175 = *(float *)(bezier_basis1 + lVar131 + 0xda4);
    fVar254 = *(float *)(bezier_basis1 + lVar131 + 0x484);
    fVar289 = *(float *)(bezier_basis1 + lVar131 + 0x488);
    fVar235 = *(float *)(bezier_basis1 + lVar131 + 0x48c);
    fVar137 = *(float *)(bezier_basis1 + lVar131 + 0x490);
    fVar157 = *(float *)(bezier_basis1 + lVar131 + 0x494);
    fVar161 = *(float *)(bezier_basis1 + lVar131 + 0x498);
    fVar164 = *(float *)(bezier_basis1 + lVar131 + 0x49c);
    fVar167 = *(float *)(bezier_basis1 + lVar131);
    fVar170 = *(float *)(bezier_basis1 + lVar131 + 4);
    fVar173 = *(float *)(bezier_basis1 + lVar131 + 8);
    fVar176 = *(float *)(bezier_basis1 + lVar131 + 0xc);
    fVar196 = *(float *)(bezier_basis1 + lVar131 + 0x10);
    fVar290 = *(float *)(bezier_basis1 + lVar131 + 0x14);
    fVar326 = *(float *)(bezier_basis1 + lVar131 + 0x18);
    auVar243._0_4_ = fVar256 * fVar167 + fVar329 * fVar254 + fVar316 * fVar328 + fVar237 * fVar156;
    auVar243._4_4_ = fVar264 * fVar170 + fVar336 * fVar289 + fVar236 * fVar335 + fVar248 * fVar160;
    auVar243._8_4_ = fVar266 * fVar173 + fVar338 * fVar235 + fVar195 * fVar337 + fVar250 * fVar163;
    auVar243._12_4_ = fVar268 * fVar176 + fVar340 * fVar137 + fVar327 * fVar339 + fVar252 * fVar166;
    auVar243._16_4_ = fVar256 * fVar196 + fVar329 * fVar157 + fVar155 * fVar328 + fVar237 * fVar169;
    auVar243._20_4_ = fVar264 * fVar290 + fVar336 * fVar161 + fVar159 * fVar335 + fVar248 * fVar172;
    auVar243._24_4_ = fVar266 * fVar326 + fVar338 * fVar164 + fVar136 * fVar337 + fVar250 * fVar175;
    auVar243._28_4_ = fVar360 + fVar362 + fVar252 + 0.0;
    local_320._0_4_ = fVar198 * fVar167 + fVar303 * fVar254 + fVar316 * fVar273 + fVar369 * fVar156;
    local_320._4_4_ = fVar213 * fVar170 + fVar309 * fVar289 + fVar236 * fVar281 + fVar372 * fVar160;
    local_320._8_4_ = fVar215 * fVar173 + fVar310 * fVar235 + fVar195 * fVar283 + fVar373 * fVar163;
    local_320._12_4_ = fVar217 * fVar176 + fVar312 * fVar137 + fVar327 * fVar285 + fVar374 * fVar166
    ;
    local_320._16_4_ = fVar198 * fVar196 + fVar303 * fVar157 + fVar155 * fVar273 + fVar369 * fVar169
    ;
    local_320._20_4_ = fVar213 * fVar290 + fVar309 * fVar161 + fVar159 * fVar281 + fVar372 * fVar172
    ;
    local_320._24_4_ = fVar215 * fVar326 + fVar310 * fVar164 + fVar136 * fVar283 + fVar373 * fVar175
    ;
    local_320._28_4_ = fVar217 + fVar362 + fVar285 + 0.0;
    auVar305._0_4_ = fVar325 * fVar254 + fVar316 * fVar238 + fVar267 * fVar156 + fVar253 * fVar167;
    auVar305._4_4_ = fVar353 * fVar289 + fVar236 * fVar249 + fVar269 * fVar160 + fVar317 * fVar170;
    auVar305._8_4_ = fVar359 * fVar235 + fVar195 * fVar251 + fVar270 * fVar163 + fVar324 * fVar173;
    auVar305._12_4_ =
         fVar360 * fVar137 + fVar327 * auVar14._12_4_ + fVar271 * fVar166 + auVar11._12_4_ * fVar176
    ;
    auVar305._16_4_ = fVar325 * fVar157 + fVar155 * fVar238 + fVar267 * fVar169 + fVar253 * fVar196;
    auVar305._20_4_ = fVar353 * fVar161 + fVar159 * fVar249 + fVar269 * fVar172 + fVar317 * fVar290;
    auVar305._24_4_ = fVar359 * fVar164 + fVar136 * fVar251 + fVar270 * fVar175 + fVar324 * fVar326;
    auVar305._28_4_ = fVar362 + fVar271 + fVar285 + fVar217;
    auVar26 = vsubps_avx(auVar243,auVar344);
    auVar27 = vsubps_avx(local_320,auVar346);
    fVar197 = auVar26._0_4_;
    fVar214 = auVar26._4_4_;
    auVar33._4_4_ = auVar346._4_4_ * fVar214;
    auVar33._0_4_ = auVar346._0_4_ * fVar197;
    fVar218 = auVar26._8_4_;
    auVar33._8_4_ = auVar346._8_4_ * fVar218;
    fVar220 = auVar26._12_4_;
    auVar33._12_4_ = auVar346._12_4_ * fVar220;
    fVar263 = auVar26._16_4_;
    auVar33._16_4_ = auVar346._16_4_ * fVar263;
    fVar267 = auVar26._20_4_;
    auVar33._20_4_ = auVar346._20_4_ * fVar267;
    fVar270 = auVar26._24_4_;
    auVar33._24_4_ = auVar346._24_4_ * fVar270;
    auVar33._28_4_ = fVar217;
    fVar212 = auVar27._0_4_;
    fVar216 = auVar27._4_4_;
    auVar34._4_4_ = auVar344._4_4_ * fVar216;
    auVar34._0_4_ = auVar344._0_4_ * fVar212;
    fVar219 = auVar27._8_4_;
    auVar34._8_4_ = auVar344._8_4_ * fVar219;
    fVar255 = auVar27._12_4_;
    auVar34._12_4_ = auVar344._12_4_ * fVar255;
    fVar265 = auVar27._16_4_;
    auVar34._16_4_ = auVar344._16_4_ * fVar265;
    fVar269 = auVar27._20_4_;
    auVar34._20_4_ = auVar344._20_4_ * fVar269;
    fVar271 = auVar27._24_4_;
    auVar34._24_4_ = auVar344._24_4_ * fVar271;
    auVar34._28_4_ = local_320._28_4_;
    auVar25 = vsubps_avx(auVar33,auVar34);
    auVar117._4_4_ = fVar154;
    auVar117._0_4_ = fVar135;
    auVar117._8_4_ = fVar158;
    auVar117._12_4_ = fVar162;
    auVar117._16_4_ = fVar165;
    auVar117._20_4_ = fVar168;
    auVar117._24_4_ = fVar171;
    auVar117._28_4_ = fVar174;
    auVar24 = vmaxps_avx(auVar117,auVar305);
    auVar35._4_4_ = auVar24._4_4_ * auVar24._4_4_ * (fVar214 * fVar214 + fVar216 * fVar216);
    auVar35._0_4_ = auVar24._0_4_ * auVar24._0_4_ * (fVar197 * fVar197 + fVar212 * fVar212);
    auVar35._8_4_ = auVar24._8_4_ * auVar24._8_4_ * (fVar218 * fVar218 + fVar219 * fVar219);
    auVar35._12_4_ = auVar24._12_4_ * auVar24._12_4_ * (fVar220 * fVar220 + fVar255 * fVar255);
    auVar35._16_4_ = auVar24._16_4_ * auVar24._16_4_ * (fVar263 * fVar263 + fVar265 * fVar265);
    auVar35._20_4_ = auVar24._20_4_ * auVar24._20_4_ * (fVar267 * fVar267 + fVar269 * fVar269);
    auVar35._24_4_ = auVar24._24_4_ * auVar24._24_4_ * (fVar270 * fVar270 + fVar271 * fVar271);
    auVar35._28_4_ = auVar27._28_4_ + local_320._28_4_;
    auVar36._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar36._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar36._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar36._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar36._16_4_ = auVar25._16_4_ * auVar25._16_4_;
    auVar36._20_4_ = auVar25._20_4_ * auVar25._20_4_;
    auVar36._24_4_ = auVar25._24_4_ * auVar25._24_4_;
    auVar36._28_4_ = auVar25._28_4_;
    auVar24 = vcmpps_avx(auVar36,auVar35,2);
    auVar222._0_4_ = (float)(int)uVar19;
    auVar222._4_12_ = auVar10._4_12_;
    local_4c0._0_16_ = auVar222;
    auVar10 = vshufps_avx(auVar222,auVar222,0);
    auVar227._16_16_ = auVar10;
    auVar227._0_16_ = auVar10;
    auVar25 = vcmpps_avx(_DAT_01f7b060,auVar227,1);
    auVar232 = ZEXT3264(auVar25);
    auVar10 = vpermilps_avx(auVar179,0xaa);
    register0x00001450 = auVar10;
    _local_180 = auVar10;
    auVar11 = vpermilps_avx(auVar354,0xaa);
    register0x00001550 = auVar11;
    _local_300 = auVar11;
    auVar12 = vpermilps_avx(auVar304,0xaa);
    register0x00001590 = auVar12;
    _local_e0 = auVar12;
    auVar13 = vpermilps_avx(auVar318,0xaa);
    register0x00001310 = auVar13;
    _local_540 = auVar13;
    auVar28 = auVar25 & auVar24;
    _local_760 = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
    local_670 = ZEXT416(uVar128);
    local_680 = ZEXT416(uVar18);
    auVar341 = ZEXT416((uint)(auVar341._0_4_ * 4.7683716e-07));
    local_8a0 = auVar241._0_4_;
    fStack_89c = auVar241._4_4_;
    fStack_898 = auVar241._8_4_;
    fStack_894 = auVar241._12_4_;
    local_880 = auVar203._0_4_;
    fStack_87c = auVar203._4_4_;
    fStack_878 = auVar203._8_4_;
    fStack_874 = auVar203._12_4_;
    local_890 = auVar223._0_4_;
    fStack_88c = auVar223._4_4_;
    fStack_888 = auVar223._8_4_;
    fStack_884 = auVar223._12_4_;
    local_830 = auVar205._0_4_;
    fStack_82c = auVar205._4_4_;
    fStack_828 = auVar205._8_4_;
    fStack_824 = auVar205._12_4_;
    fVar197 = fVar198;
    fVar212 = fVar213;
    fVar214 = fVar215;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0x7f,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar28 >> 0xbf,0) == '\0') &&
        (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f]) {
      auVar308 = ZEXT3264(auVar147);
    }
    else {
      local_360 = vandps_avx(auVar24,auVar25);
      fVar317 = auVar10._0_4_;
      fVar324 = auVar10._4_4_;
      fVar362 = auVar10._8_4_;
      fVar325 = auVar10._12_4_;
      fVar353 = auVar11._0_4_;
      fVar359 = auVar11._4_4_;
      fVar360 = auVar11._8_4_;
      fVar361 = auVar11._12_4_;
      fVar363 = auVar12._0_4_;
      fVar366 = auVar12._4_4_;
      fVar367 = auVar12._8_4_;
      fVar368 = auVar12._12_4_;
      fVar238 = auVar13._0_4_;
      fVar249 = auVar13._4_4_;
      fVar251 = auVar13._8_4_;
      fVar253 = auVar13._12_4_;
      fVar216 = auVar25._28_4_ + *(float *)(bezier_basis1 + lVar131 + 0x924) + 0.0;
      local_380._0_4_ =
           fVar317 * fVar167 + fVar353 * fVar254 + fVar363 * fVar316 + fVar238 * fVar156;
      local_380._4_4_ =
           fVar324 * fVar170 + fVar359 * fVar289 + fVar366 * fVar236 + fVar249 * fVar160;
      fStack_378 = fVar362 * fVar173 + fVar360 * fVar235 + fVar367 * fVar195 + fVar251 * fVar163;
      fStack_374 = fVar325 * fVar176 + fVar361 * fVar137 + fVar368 * fVar327 + fVar253 * fVar166;
      fStack_370 = fVar317 * fVar196 + fVar353 * fVar157 + fVar363 * fVar155 + fVar238 * fVar169;
      fStack_36c = fVar324 * fVar290 + fVar359 * fVar161 + fVar366 * fVar159 + fVar249 * fVar172;
      fStack_368 = fVar362 * fVar326 + fVar360 * fVar164 + fVar367 * fVar136 + fVar251 * fVar175;
      fStack_364 = local_360._28_4_ + fVar216;
      local_340._0_4_ = auVar124._0_4_;
      local_340._4_4_ = auVar124._4_4_;
      fStack_338 = auVar124._8_4_;
      local_700._0_4_ = auVar123._0_4_;
      local_700._4_4_ = auVar123._4_4_;
      fStack_6f8 = auVar123._8_4_;
      fStack_6f4 = auVar123._12_4_;
      fStack_6f0 = auVar123._16_4_;
      fStack_6ec = auVar123._20_4_;
      fStack_6e8 = auVar123._24_4_;
      local_6e0 = fVar317 * (float)local_340._0_4_ +
                  fVar353 * fVar311 + fVar363 * fVar272 + fVar238 * (float)local_700._0_4_;
      fStack_6dc = fVar324 * (float)local_340._4_4_ +
                   fVar359 * fVar233 + fVar366 * fVar280 + fVar249 * (float)local_700._4_4_;
      fStack_6d8 = fVar362 * fStack_338 +
                   fVar360 * fVar301 + fVar367 * fVar282 + fVar251 * fStack_6f8;
      fStack_6d4 = fVar325 * fVar315 + fVar361 * fVar313 + fVar368 * fVar284 + fVar253 * fStack_6f4;
      fStack_6d0 = fVar317 * fStack_330 +
                   fVar353 * fVar314 + fVar363 * fVar286 + fVar238 * fStack_6f0;
      fStack_6cc = fVar324 * fStack_32c +
                   fVar359 * fVar234 + fVar366 * fVar287 + fVar249 * fStack_6ec;
      fStack_6c8 = fVar362 * fStack_328 +
                   fVar360 * fVar302 + fVar367 * fVar288 + fVar251 * fStack_6e8;
      fStack_6c4 = fStack_364 + fVar216 + local_360._28_4_ + auVar25._28_4_;
      fVar216 = *(float *)(bezier_basis0 + lVar131 + 0x1210);
      fVar218 = *(float *)(bezier_basis0 + lVar131 + 0x1214);
      fVar219 = *(float *)(bezier_basis0 + lVar131 + 0x1218);
      fVar220 = *(float *)(bezier_basis0 + lVar131 + 0x121c);
      fVar255 = *(float *)(bezier_basis0 + lVar131 + 0x1220);
      fVar263 = *(float *)(bezier_basis0 + lVar131 + 0x1224);
      fVar265 = *(float *)(bezier_basis0 + lVar131 + 0x1228);
      fVar267 = *(float *)(bezier_basis0 + lVar131 + 0x1694);
      fVar269 = *(float *)(bezier_basis0 + lVar131 + 0x1698);
      fVar270 = *(float *)(bezier_basis0 + lVar131 + 0x169c);
      fVar271 = *(float *)(bezier_basis0 + lVar131 + 0x16a0);
      fVar272 = *(float *)(bezier_basis0 + lVar131 + 0x16a4);
      fVar280 = *(float *)(bezier_basis0 + lVar131 + 0x16a8);
      fVar282 = *(float *)(bezier_basis0 + lVar131 + 0x16ac);
      fVar284 = *(float *)(bezier_basis0 + lVar131 + 0x1b18);
      fVar286 = *(float *)(bezier_basis0 + lVar131 + 0x1b1c);
      fVar287 = *(float *)(bezier_basis0 + lVar131 + 0x1b20);
      fVar288 = *(float *)(bezier_basis0 + lVar131 + 0x1b24);
      fVar311 = *(float *)(bezier_basis0 + lVar131 + 0x1b28);
      fVar233 = *(float *)(bezier_basis0 + lVar131 + 0x1b2c);
      fVar301 = *(float *)(bezier_basis0 + lVar131 + 0x1b30);
      fVar313 = *(float *)(bezier_basis0 + lVar131 + 0x1f9c);
      fVar314 = *(float *)(bezier_basis0 + lVar131 + 0x1fa0);
      fVar234 = *(float *)(bezier_basis0 + lVar131 + 0x1fa4);
      fVar302 = *(float *)(bezier_basis0 + lVar131 + 0x1fa8);
      fVar315 = *(float *)(bezier_basis0 + lVar131 + 0x1fac);
      fVar316 = *(float *)(bezier_basis0 + lVar131 + 0x1fb0);
      fVar236 = *(float *)(bezier_basis0 + lVar131 + 0x1fb4);
      local_7e0._0_16_ = auVar341;
      fVar195 = *(float *)(bezier_basis0 + lVar131 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar131 + 0x1fb8);
      fVar327 = *(float *)(bezier_basis0 + lVar131 + 0x16b0) + fVar195;
      local_660 = fVar256 * fVar216 + fVar329 * fVar267 + fVar328 * fVar284 + fVar237 * fVar313;
      fStack_65c = fVar264 * fVar218 + fVar336 * fVar269 + fVar335 * fVar286 + fVar248 * fVar314;
      fStack_658 = fVar266 * fVar219 + fVar338 * fVar270 + fVar337 * fVar287 + fVar250 * fVar234;
      fStack_654 = fVar268 * fVar220 + fVar340 * fVar271 + fVar339 * fVar288 + fVar252 * fVar302;
      fStack_650 = fVar256 * fVar255 + fVar329 * fVar272 + fVar328 * fVar311 + fVar237 * fVar315;
      fStack_64c = fVar264 * fVar263 + fVar336 * fVar280 + fVar335 * fVar233 + fVar248 * fVar316;
      fStack_648 = fVar266 * fVar265 + fVar338 * fVar282 + fVar337 * fVar301 + fVar250 * fVar236;
      fStack_644 = *(float *)(bezier_basis0 + lVar131 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar131 + 0x1fb8) +
                   fVar325 + *(float *)(bezier_basis1 + lVar131 + 0x4a0);
      auVar186._0_4_ = fVar198 * fVar216 + fVar273 * fVar284 + fVar369 * fVar313 + fVar303 * fVar267
      ;
      auVar186._4_4_ = fVar213 * fVar218 + fVar281 * fVar286 + fVar372 * fVar314 + fVar309 * fVar269
      ;
      auVar186._8_4_ = fVar215 * fVar219 + fVar283 * fVar287 + fVar373 * fVar234 + fVar310 * fVar270
      ;
      auVar186._12_4_ =
           fVar217 * fVar220 + fVar285 * fVar288 + fVar374 * fVar302 + fVar312 * fVar271;
      auVar186._16_4_ =
           fVar198 * fVar255 + fVar273 * fVar311 + fVar369 * fVar315 + fVar303 * fVar272;
      auVar186._20_4_ =
           fVar213 * fVar263 + fVar281 * fVar233 + fVar372 * fVar316 + fVar309 * fVar280;
      auVar186._24_4_ =
           fVar215 * fVar265 + fVar283 * fVar301 + fVar373 * fVar236 + fVar310 * fVar282;
      auVar186._28_4_ =
           fVar195 + fVar325 + *(float *)(bezier_basis1 + lVar131 + 0x1c) +
                     fVar325 + *(float *)(bezier_basis1 + lVar131 + 0x4a0);
      auVar275._0_4_ = fVar353 * fVar267 + fVar363 * fVar284 + fVar238 * fVar313 + fVar317 * fVar216
      ;
      auVar275._4_4_ = fVar359 * fVar269 + fVar366 * fVar286 + fVar249 * fVar314 + fVar324 * fVar218
      ;
      auVar275._8_4_ = fVar360 * fVar270 + fVar367 * fVar287 + fVar251 * fVar234 + fVar362 * fVar219
      ;
      auVar275._12_4_ =
           fVar361 * fVar271 + fVar368 * fVar288 + fVar253 * fVar302 + fVar325 * fVar220;
      auVar275._16_4_ =
           fVar353 * fVar272 + fVar363 * fVar311 + fVar238 * fVar315 + fVar317 * fVar255;
      auVar275._20_4_ =
           fVar359 * fVar280 + fVar366 * fVar233 + fVar249 * fVar316 + fVar324 * fVar263;
      auVar275._24_4_ =
           fVar360 * fVar282 + fVar367 * fVar301 + fVar251 * fVar236 + fVar362 * fVar265;
      auVar275._28_4_ = fVar327 + *(float *)(bezier_basis0 + lVar131 + 0x122c);
      fVar216 = *(float *)(bezier_basis1 + lVar131 + 0x1b18);
      fVar218 = *(float *)(bezier_basis1 + lVar131 + 0x1b1c);
      fVar219 = *(float *)(bezier_basis1 + lVar131 + 0x1b20);
      fVar220 = *(float *)(bezier_basis1 + lVar131 + 0x1b24);
      fVar255 = *(float *)(bezier_basis1 + lVar131 + 0x1b28);
      fVar263 = *(float *)(bezier_basis1 + lVar131 + 0x1b2c);
      fVar265 = *(float *)(bezier_basis1 + lVar131 + 0x1b30);
      fVar267 = *(float *)(bezier_basis1 + lVar131 + 0x1f9c);
      fVar269 = *(float *)(bezier_basis1 + lVar131 + 0x1fa0);
      fVar270 = *(float *)(bezier_basis1 + lVar131 + 0x1fa4);
      fVar271 = *(float *)(bezier_basis1 + lVar131 + 0x1fa8);
      fVar272 = *(float *)(bezier_basis1 + lVar131 + 0x1fac);
      fVar280 = *(float *)(bezier_basis1 + lVar131 + 0x1fb0);
      fVar282 = *(float *)(bezier_basis1 + lVar131 + 0x1fb4);
      fVar284 = *(float *)(bezier_basis1 + lVar131 + 0x1694);
      fVar286 = *(float *)(bezier_basis1 + lVar131 + 0x1698);
      fVar287 = *(float *)(bezier_basis1 + lVar131 + 0x169c);
      fVar288 = *(float *)(bezier_basis1 + lVar131 + 0x16a0);
      fVar311 = *(float *)(bezier_basis1 + lVar131 + 0x16a4);
      fVar233 = *(float *)(bezier_basis1 + lVar131 + 0x16a8);
      fVar301 = *(float *)(bezier_basis1 + lVar131 + 0x16ac);
      fVar313 = *(float *)(bezier_basis1 + lVar131 + 0x1210);
      fVar314 = *(float *)(bezier_basis1 + lVar131 + 0x1214);
      fVar234 = *(float *)(bezier_basis1 + lVar131 + 0x1218);
      fVar302 = *(float *)(bezier_basis1 + lVar131 + 0x121c);
      fVar315 = *(float *)(bezier_basis1 + lVar131 + 0x1220);
      fVar316 = *(float *)(bezier_basis1 + lVar131 + 0x1224);
      fVar236 = *(float *)(bezier_basis1 + lVar131 + 0x1228);
      auVar298._0_4_ = fVar256 * fVar313 + fVar329 * fVar284 + fVar328 * fVar216 + fVar237 * fVar267
      ;
      auVar298._4_4_ = fVar264 * fVar314 + fVar336 * fVar286 + fVar335 * fVar218 + fVar248 * fVar269
      ;
      auVar298._8_4_ = fVar266 * fVar234 + fVar338 * fVar287 + fVar337 * fVar219 + fVar250 * fVar270
      ;
      auVar298._12_4_ =
           fVar268 * fVar302 + fVar340 * fVar288 + fVar339 * fVar220 + fVar252 * fVar271;
      auVar298._16_4_ =
           fVar256 * fVar315 + fVar329 * fVar311 + fVar328 * fVar255 + fVar237 * fVar272;
      auVar298._20_4_ =
           fVar264 * fVar316 + fVar336 * fVar233 + fVar335 * fVar263 + fVar248 * fVar280;
      auVar298._24_4_ =
           fVar266 * fVar236 + fVar338 * fVar301 + fVar337 * fVar265 + fVar250 * fVar282;
      auVar298._28_4_ = fVar285 + fVar285 + fVar327 + fVar252;
      auVar320._0_4_ = fVar198 * fVar313 + fVar303 * fVar284 + fVar273 * fVar216 + fVar369 * fVar267
      ;
      auVar320._4_4_ = fVar213 * fVar314 + fVar309 * fVar286 + fVar281 * fVar218 + fVar372 * fVar269
      ;
      auVar320._8_4_ = fVar215 * fVar234 + fVar310 * fVar287 + fVar283 * fVar219 + fVar373 * fVar270
      ;
      auVar320._12_4_ =
           fVar217 * fVar302 + fVar312 * fVar288 + fVar285 * fVar220 + fVar374 * fVar271;
      auVar320._16_4_ =
           fVar198 * fVar315 + fVar303 * fVar311 + fVar273 * fVar255 + fVar369 * fVar272;
      auVar320._20_4_ =
           fVar213 * fVar316 + fVar309 * fVar233 + fVar281 * fVar263 + fVar372 * fVar280;
      auVar320._24_4_ =
           fVar215 * fVar236 + fVar310 * fVar301 + fVar283 * fVar265 + fVar373 * fVar282;
      auVar320._28_4_ = fVar285 + fVar285 + fVar285 + fVar327;
      auVar211._0_4_ = fVar317 * fVar313 + fVar353 * fVar284 + fVar363 * fVar216 + fVar267 * fVar238
      ;
      auVar211._4_4_ = fVar324 * fVar314 + fVar359 * fVar286 + fVar366 * fVar218 + fVar269 * fVar249
      ;
      auVar211._8_4_ = fVar362 * fVar234 + fVar360 * fVar287 + fVar367 * fVar219 + fVar270 * fVar251
      ;
      auVar211._12_4_ =
           fVar325 * fVar302 + fVar361 * fVar288 + fVar368 * fVar220 + fVar271 * fVar253;
      auVar211._16_4_ =
           fVar317 * fVar315 + fVar353 * fVar311 + fVar363 * fVar255 + fVar272 * fVar238;
      auVar211._20_4_ =
           fVar324 * fVar316 + fVar359 * fVar233 + fVar366 * fVar263 + fVar280 * fVar249;
      auVar211._24_4_ =
           fVar362 * fVar236 + fVar360 * fVar301 + fVar367 * fVar265 + fVar282 * fVar251;
      auVar211._28_4_ =
           *(float *)(bezier_basis1 + lVar131 + 0x122c) +
           *(float *)(bezier_basis1 + lVar131 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar131 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar131 + 0x1fb8);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar121._4_4_ = fStack_65c;
      auVar121._0_4_ = local_660;
      auVar121._8_4_ = fStack_658;
      auVar121._12_4_ = fStack_654;
      auVar121._16_4_ = fStack_650;
      auVar121._20_4_ = fStack_64c;
      auVar121._24_4_ = fStack_648;
      auVar121._28_4_ = fStack_644;
      auVar24 = vandps_avx(auVar121,auVar244);
      auVar25 = vandps_avx(auVar186,auVar244);
      auVar25 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vandps_avx(auVar275,auVar244);
      auVar24 = vmaxps_avx(auVar25,auVar24);
      auVar241 = vpermilps_avx(auVar341,0);
      auVar276._16_16_ = auVar241;
      auVar276._0_16_ = auVar241;
      auVar24 = vcmpps_avx(auVar24,auVar276,1);
      auVar28 = vblendvps_avx(auVar121,auVar26,auVar24);
      auVar29 = vblendvps_avx(auVar186,auVar27,auVar24);
      auVar24 = vandps_avx(auVar298,auVar244);
      auVar25 = vandps_avx(auVar320,auVar244);
      auVar30 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vandps_avx(auVar211,auVar244);
      auVar24 = vmaxps_avx(auVar30,auVar24);
      auVar30 = vcmpps_avx(auVar24,auVar276,1);
      auVar24 = vblendvps_avx(auVar298,auVar26,auVar30);
      auVar26 = vblendvps_avx(auVar320,auVar27,auVar30);
      fVar327 = auVar28._0_4_;
      fVar155 = auVar28._4_4_;
      fVar159 = auVar28._8_4_;
      fVar136 = auVar28._12_4_;
      fVar156 = auVar28._16_4_;
      fVar160 = auVar28._20_4_;
      fVar163 = auVar28._24_4_;
      fVar166 = auVar24._0_4_;
      fVar169 = auVar24._4_4_;
      fVar172 = auVar24._8_4_;
      fVar175 = auVar24._12_4_;
      fVar254 = auVar24._16_4_;
      fVar289 = auVar24._20_4_;
      fVar235 = auVar24._24_4_;
      fVar137 = -auVar24._28_4_;
      fVar216 = auVar29._0_4_;
      fVar255 = auVar29._4_4_;
      fVar269 = auVar29._8_4_;
      fVar280 = auVar29._12_4_;
      fVar287 = auVar29._16_4_;
      fVar301 = auVar29._20_4_;
      fVar302 = auVar29._24_4_;
      auVar143._0_4_ = fVar216 * fVar216 + fVar327 * fVar327;
      auVar143._4_4_ = fVar255 * fVar255 + fVar155 * fVar155;
      auVar143._8_4_ = fVar269 * fVar269 + fVar159 * fVar159;
      auVar143._12_4_ = fVar280 * fVar280 + fVar136 * fVar136;
      auVar143._16_4_ = fVar287 * fVar287 + fVar156 * fVar156;
      auVar143._20_4_ = fVar301 * fVar301 + fVar160 * fVar160;
      auVar143._24_4_ = fVar302 * fVar302 + fVar163 * fVar163;
      auVar143._28_4_ = auVar320._28_4_ + auVar28._28_4_;
      auVar27 = vrsqrtps_avx(auVar143);
      fVar218 = auVar27._0_4_;
      fVar219 = auVar27._4_4_;
      auVar37._4_4_ = fVar219 * 1.5;
      auVar37._0_4_ = fVar218 * 1.5;
      fVar220 = auVar27._8_4_;
      auVar37._8_4_ = fVar220 * 1.5;
      fVar263 = auVar27._12_4_;
      auVar37._12_4_ = fVar263 * 1.5;
      fVar265 = auVar27._16_4_;
      auVar37._16_4_ = fVar265 * 1.5;
      fVar267 = auVar27._20_4_;
      auVar37._20_4_ = fVar267 * 1.5;
      fVar270 = auVar27._24_4_;
      fVar195 = auVar25._28_4_;
      auVar37._24_4_ = fVar270 * 1.5;
      auVar37._28_4_ = fVar195;
      auVar38._4_4_ = fVar219 * fVar219 * fVar219 * auVar143._4_4_ * 0.5;
      auVar38._0_4_ = fVar218 * fVar218 * fVar218 * auVar143._0_4_ * 0.5;
      auVar38._8_4_ = fVar220 * fVar220 * fVar220 * auVar143._8_4_ * 0.5;
      auVar38._12_4_ = fVar263 * fVar263 * fVar263 * auVar143._12_4_ * 0.5;
      auVar38._16_4_ = fVar265 * fVar265 * fVar265 * auVar143._16_4_ * 0.5;
      auVar38._20_4_ = fVar267 * fVar267 * fVar267 * auVar143._20_4_ * 0.5;
      auVar38._24_4_ = fVar270 * fVar270 * fVar270 * auVar143._24_4_ * 0.5;
      auVar38._28_4_ = auVar143._28_4_;
      auVar25 = vsubps_avx(auVar37,auVar38);
      fVar218 = auVar25._0_4_;
      fVar263 = auVar25._4_4_;
      fVar270 = auVar25._8_4_;
      fVar282 = auVar25._12_4_;
      fVar288 = auVar25._16_4_;
      fVar313 = auVar25._20_4_;
      fVar315 = auVar25._24_4_;
      fVar219 = auVar26._0_4_;
      fVar265 = auVar26._4_4_;
      fVar271 = auVar26._8_4_;
      fVar284 = auVar26._12_4_;
      fVar311 = auVar26._16_4_;
      fVar314 = auVar26._20_4_;
      fVar316 = auVar26._24_4_;
      auVar144._0_4_ = fVar219 * fVar219 + fVar166 * fVar166;
      auVar144._4_4_ = fVar265 * fVar265 + fVar169 * fVar169;
      auVar144._8_4_ = fVar271 * fVar271 + fVar172 * fVar172;
      auVar144._12_4_ = fVar284 * fVar284 + fVar175 * fVar175;
      auVar144._16_4_ = fVar311 * fVar311 + fVar254 * fVar254;
      auVar144._20_4_ = fVar314 * fVar314 + fVar289 * fVar289;
      auVar144._24_4_ = fVar316 * fVar316 + fVar235 * fVar235;
      auVar144._28_4_ = auVar24._28_4_ + auVar25._28_4_;
      auVar24 = vrsqrtps_avx(auVar144);
      fVar220 = auVar24._0_4_;
      fVar267 = auVar24._4_4_;
      auVar39._4_4_ = fVar267 * 1.5;
      auVar39._0_4_ = fVar220 * 1.5;
      fVar272 = auVar24._8_4_;
      auVar39._8_4_ = fVar272 * 1.5;
      fVar286 = auVar24._12_4_;
      auVar39._12_4_ = fVar286 * 1.5;
      fVar233 = auVar24._16_4_;
      auVar39._16_4_ = fVar233 * 1.5;
      fVar234 = auVar24._20_4_;
      auVar39._20_4_ = fVar234 * 1.5;
      fVar236 = auVar24._24_4_;
      auVar39._24_4_ = fVar236 * 1.5;
      auVar39._28_4_ = fVar195;
      auVar40._4_4_ = fVar267 * fVar267 * fVar267 * auVar144._4_4_ * 0.5;
      auVar40._0_4_ = fVar220 * fVar220 * fVar220 * auVar144._0_4_ * 0.5;
      auVar40._8_4_ = fVar272 * fVar272 * fVar272 * auVar144._8_4_ * 0.5;
      auVar40._12_4_ = fVar286 * fVar286 * fVar286 * auVar144._12_4_ * 0.5;
      auVar40._16_4_ = fVar233 * fVar233 * fVar233 * auVar144._16_4_ * 0.5;
      auVar40._20_4_ = fVar234 * fVar234 * fVar234 * auVar144._20_4_ * 0.5;
      auVar40._24_4_ = fVar236 * fVar236 * fVar236 * auVar144._24_4_ * 0.5;
      auVar40._28_4_ = auVar144._28_4_;
      auVar24 = vsubps_avx(auVar39,auVar40);
      fVar220 = auVar24._0_4_;
      fVar267 = auVar24._4_4_;
      fVar272 = auVar24._8_4_;
      fVar286 = auVar24._12_4_;
      fVar233 = auVar24._16_4_;
      fVar234 = auVar24._20_4_;
      fVar236 = auVar24._24_4_;
      fVar216 = fVar135 * fVar216 * fVar218;
      fVar255 = fVar154 * fVar255 * fVar263;
      auVar41._4_4_ = fVar255;
      auVar41._0_4_ = fVar216;
      fVar269 = fVar158 * fVar269 * fVar270;
      auVar41._8_4_ = fVar269;
      fVar280 = fVar162 * fVar280 * fVar282;
      auVar41._12_4_ = fVar280;
      fVar287 = fVar165 * fVar287 * fVar288;
      auVar41._16_4_ = fVar287;
      fVar301 = fVar168 * fVar301 * fVar313;
      auVar41._20_4_ = fVar301;
      fVar302 = fVar171 * fVar302 * fVar315;
      auVar41._24_4_ = fVar302;
      auVar41._28_4_ = fVar137;
      local_700._4_4_ = auVar344._4_4_ + fVar255;
      local_700._0_4_ = auVar344._0_4_ + fVar216;
      fStack_6f8 = auVar344._8_4_ + fVar269;
      fStack_6f4 = auVar344._12_4_ + fVar280;
      fStack_6f0 = auVar344._16_4_ + fVar287;
      fStack_6ec = auVar344._20_4_ + fVar301;
      fStack_6e8 = auVar344._24_4_ + fVar302;
      fStack_6e4 = auVar344._28_4_ + fVar137;
      fVar216 = fVar135 * fVar218 * -fVar327;
      fVar255 = fVar154 * fVar263 * -fVar155;
      auVar42._4_4_ = fVar255;
      auVar42._0_4_ = fVar216;
      fVar269 = fVar158 * fVar270 * -fVar159;
      auVar42._8_4_ = fVar269;
      fVar280 = fVar162 * fVar282 * -fVar136;
      auVar42._12_4_ = fVar280;
      fVar287 = fVar165 * fVar288 * -fVar156;
      auVar42._16_4_ = fVar287;
      fVar301 = fVar168 * fVar313 * -fVar160;
      auVar42._20_4_ = fVar301;
      fVar302 = fVar171 * fVar315 * -fVar163;
      auVar42._24_4_ = fVar302;
      auVar42._28_4_ = fVar195;
      local_560._4_4_ = fVar255 + auVar346._4_4_;
      local_560._0_4_ = fVar216 + auVar346._0_4_;
      fStack_558 = fVar269 + auVar346._8_4_;
      fStack_554 = fVar280 + auVar346._12_4_;
      fStack_550 = fVar287 + auVar346._16_4_;
      fStack_54c = fVar301 + auVar346._20_4_;
      fStack_548 = fVar302 + auVar346._24_4_;
      fStack_544 = fVar195 + 0.0;
      fVar216 = fVar135 * fVar218 * 0.0;
      fVar218 = fVar154 * fVar263 * 0.0;
      auVar43._4_4_ = fVar218;
      auVar43._0_4_ = fVar216;
      fVar255 = fVar158 * fVar270 * 0.0;
      auVar43._8_4_ = fVar255;
      fVar263 = fVar162 * fVar282 * 0.0;
      auVar43._12_4_ = fVar263;
      fVar269 = fVar165 * fVar288 * 0.0;
      auVar43._16_4_ = fVar269;
      fVar270 = fVar168 * fVar313 * 0.0;
      auVar43._20_4_ = fVar270;
      fVar280 = fVar171 * fVar315 * 0.0;
      auVar43._24_4_ = fVar280;
      auVar43._28_4_ = fVar340;
      auVar119._4_4_ = fStack_6dc;
      auVar119._0_4_ = local_6e0;
      auVar119._8_4_ = fStack_6d8;
      auVar119._12_4_ = fStack_6d4;
      auVar119._16_4_ = fStack_6d0;
      auVar119._20_4_ = fStack_6cc;
      auVar119._24_4_ = fStack_6c8;
      auVar119._28_4_ = fStack_6c4;
      auVar277._0_4_ = fVar216 + local_6e0;
      auVar277._4_4_ = fVar218 + fStack_6dc;
      auVar277._8_4_ = fVar255 + fStack_6d8;
      auVar277._12_4_ = fVar263 + fStack_6d4;
      auVar277._16_4_ = fVar269 + fStack_6d0;
      auVar277._20_4_ = fVar270 + fStack_6cc;
      auVar277._24_4_ = fVar280 + fStack_6c8;
      auVar277._28_4_ = fVar340 + fStack_6c4;
      fVar216 = auVar305._0_4_ * fVar219 * fVar220;
      fVar218 = auVar305._4_4_ * fVar265 * fVar267;
      auVar44._4_4_ = fVar218;
      auVar44._0_4_ = fVar216;
      fVar219 = auVar305._8_4_ * fVar271 * fVar272;
      auVar44._8_4_ = fVar219;
      fVar255 = auVar305._12_4_ * fVar284 * fVar286;
      auVar44._12_4_ = fVar255;
      fVar263 = auVar305._16_4_ * fVar311 * fVar233;
      auVar44._16_4_ = fVar263;
      fVar265 = auVar305._20_4_ * fVar314 * fVar234;
      auVar44._20_4_ = fVar265;
      fVar269 = auVar305._24_4_ * fVar316 * fVar236;
      auVar44._24_4_ = fVar269;
      auVar44._28_4_ = auVar26._28_4_;
      auVar30 = vsubps_avx(auVar344,auVar41);
      auVar321._0_4_ = auVar243._0_4_ + fVar216;
      auVar321._4_4_ = auVar243._4_4_ + fVar218;
      auVar321._8_4_ = auVar243._8_4_ + fVar219;
      auVar321._12_4_ = auVar243._12_4_ + fVar255;
      auVar321._16_4_ = auVar243._16_4_ + fVar263;
      auVar321._20_4_ = auVar243._20_4_ + fVar265;
      auVar321._24_4_ = auVar243._24_4_ + fVar269;
      auVar321._28_4_ = auVar243._28_4_ + auVar26._28_4_;
      fVar216 = auVar305._0_4_ * fVar220 * -fVar166;
      fVar218 = auVar305._4_4_ * fVar267 * -fVar169;
      auVar45._4_4_ = fVar218;
      auVar45._0_4_ = fVar216;
      fVar219 = auVar305._8_4_ * fVar272 * -fVar172;
      auVar45._8_4_ = fVar219;
      fVar255 = auVar305._12_4_ * fVar286 * -fVar175;
      auVar45._12_4_ = fVar255;
      fVar263 = auVar305._16_4_ * fVar233 * -fVar254;
      auVar45._16_4_ = fVar263;
      fVar265 = auVar305._20_4_ * fVar234 * -fVar289;
      auVar45._20_4_ = fVar265;
      fVar269 = auVar305._24_4_ * fVar236 * -fVar235;
      auVar45._24_4_ = fVar269;
      auVar45._28_4_ = fVar361;
      auVar31 = vsubps_avx(auVar346,auVar42);
      auVar332._0_4_ = fVar216 + local_320._0_4_;
      auVar332._4_4_ = fVar218 + local_320._4_4_;
      auVar332._8_4_ = fVar219 + local_320._8_4_;
      auVar332._12_4_ = fVar255 + local_320._12_4_;
      auVar332._16_4_ = fVar263 + local_320._16_4_;
      auVar332._20_4_ = fVar265 + local_320._20_4_;
      auVar332._24_4_ = fVar269 + local_320._24_4_;
      auVar332._28_4_ = fVar361 + local_320._28_4_;
      fVar216 = auVar305._0_4_ * fVar220 * 0.0;
      fVar218 = auVar305._4_4_ * fVar267 * 0.0;
      auVar46._4_4_ = fVar218;
      auVar46._0_4_ = fVar216;
      fVar219 = auVar305._8_4_ * fVar272 * 0.0;
      auVar46._8_4_ = fVar219;
      fVar220 = auVar305._12_4_ * fVar286 * 0.0;
      auVar46._12_4_ = fVar220;
      fVar255 = auVar305._16_4_ * fVar233 * 0.0;
      auVar46._16_4_ = fVar255;
      fVar263 = auVar305._20_4_ * fVar234 * 0.0;
      auVar46._20_4_ = fVar263;
      fVar265 = auVar305._24_4_ * fVar236 * 0.0;
      auVar46._24_4_ = fVar265;
      auVar46._28_4_ = 0x3f000000;
      auVar23 = vsubps_avx(auVar119,auVar43);
      auVar365._0_4_ = fVar216 + (float)local_380._0_4_;
      auVar365._4_4_ = fVar218 + (float)local_380._4_4_;
      auVar365._8_4_ = fVar219 + fStack_378;
      auVar365._12_4_ = fVar220 + fStack_374;
      auVar365._16_4_ = fVar255 + fStack_370;
      auVar365._20_4_ = fVar263 + fStack_36c;
      auVar365._24_4_ = fVar265 + fStack_368;
      auVar365._28_4_ = fStack_364 + 0.5;
      auVar24 = vsubps_avx(auVar243,auVar44);
      auVar25 = vsubps_avx(local_320,auVar45);
      auVar140 = vsubps_avx(_local_380,auVar46);
      auVar26 = vsubps_avx(auVar332,auVar31);
      auVar27 = vsubps_avx(auVar365,auVar23);
      auVar47._4_4_ = auVar23._4_4_ * auVar26._4_4_;
      auVar47._0_4_ = auVar23._0_4_ * auVar26._0_4_;
      auVar47._8_4_ = auVar23._8_4_ * auVar26._8_4_;
      auVar47._12_4_ = auVar23._12_4_ * auVar26._12_4_;
      auVar47._16_4_ = auVar23._16_4_ * auVar26._16_4_;
      auVar47._20_4_ = auVar23._20_4_ * auVar26._20_4_;
      auVar47._24_4_ = auVar23._24_4_ * auVar26._24_4_;
      auVar47._28_4_ = fVar325;
      auVar48._4_4_ = auVar31._4_4_ * auVar27._4_4_;
      auVar48._0_4_ = auVar31._0_4_ * auVar27._0_4_;
      auVar48._8_4_ = auVar31._8_4_ * auVar27._8_4_;
      auVar48._12_4_ = auVar31._12_4_ * auVar27._12_4_;
      auVar48._16_4_ = auVar31._16_4_ * auVar27._16_4_;
      auVar48._20_4_ = auVar31._20_4_ * auVar27._20_4_;
      auVar48._24_4_ = auVar31._24_4_ * auVar27._24_4_;
      auVar48._28_4_ = local_320._28_4_;
      auVar28 = vsubps_avx(auVar48,auVar47);
      auVar49._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar49._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar49._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar49._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar49._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar49._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar49._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar49._28_4_ = auVar27._28_4_;
      auVar29 = vsubps_avx(auVar321,auVar30);
      auVar50._4_4_ = auVar23._4_4_ * auVar29._4_4_;
      auVar50._0_4_ = auVar23._0_4_ * auVar29._0_4_;
      auVar50._8_4_ = auVar23._8_4_ * auVar29._8_4_;
      auVar50._12_4_ = auVar23._12_4_ * auVar29._12_4_;
      auVar50._16_4_ = auVar23._16_4_ * auVar29._16_4_;
      auVar50._20_4_ = auVar23._20_4_ * auVar29._20_4_;
      auVar50._24_4_ = auVar23._24_4_ * auVar29._24_4_;
      auVar50._28_4_ = auVar243._28_4_;
      auVar32 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = auVar29._4_4_ * auVar31._4_4_;
      auVar51._0_4_ = auVar29._0_4_ * auVar31._0_4_;
      auVar51._8_4_ = auVar29._8_4_ * auVar31._8_4_;
      auVar51._12_4_ = auVar29._12_4_ * auVar31._12_4_;
      auVar51._16_4_ = auVar29._16_4_ * auVar31._16_4_;
      auVar51._20_4_ = auVar29._20_4_ * auVar31._20_4_;
      auVar51._24_4_ = auVar29._24_4_ * auVar31._24_4_;
      auVar51._28_4_ = auVar27._28_4_;
      auVar52._4_4_ = auVar30._4_4_ * auVar26._4_4_;
      auVar52._0_4_ = auVar30._0_4_ * auVar26._0_4_;
      auVar52._8_4_ = auVar30._8_4_ * auVar26._8_4_;
      auVar52._12_4_ = auVar30._12_4_ * auVar26._12_4_;
      auVar52._16_4_ = auVar30._16_4_ * auVar26._16_4_;
      auVar52._20_4_ = auVar30._20_4_ * auVar26._20_4_;
      auVar52._24_4_ = auVar30._24_4_ * auVar26._24_4_;
      auVar52._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar52,auVar51);
      auVar145._0_4_ = auVar28._0_4_ * 0.0 + auVar26._0_4_ + auVar32._0_4_ * 0.0;
      auVar145._4_4_ = auVar28._4_4_ * 0.0 + auVar26._4_4_ + auVar32._4_4_ * 0.0;
      auVar145._8_4_ = auVar28._8_4_ * 0.0 + auVar26._8_4_ + auVar32._8_4_ * 0.0;
      auVar145._12_4_ = auVar28._12_4_ * 0.0 + auVar26._12_4_ + auVar32._12_4_ * 0.0;
      auVar145._16_4_ = auVar28._16_4_ * 0.0 + auVar26._16_4_ + auVar32._16_4_ * 0.0;
      auVar145._20_4_ = auVar28._20_4_ * 0.0 + auVar26._20_4_ + auVar32._20_4_ * 0.0;
      auVar145._24_4_ = auVar28._24_4_ * 0.0 + auVar26._24_4_ + auVar32._24_4_ * 0.0;
      auVar145._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar32._28_4_;
      auVar32 = vcmpps_avx(auVar145,ZEXT432(0) << 0x20,2);
      auVar24 = vblendvps_avx(auVar24,_local_700,auVar32);
      auVar25 = vblendvps_avx(auVar25,_local_560,auVar32);
      auVar26 = vblendvps_avx(auVar140,auVar277,auVar32);
      auVar27 = vblendvps_avx(auVar30,auVar321,auVar32);
      auVar28 = vblendvps_avx(auVar31,auVar332,auVar32);
      auVar29 = vblendvps_avx(auVar23,auVar365,auVar32);
      auVar30 = vblendvps_avx(auVar321,auVar30,auVar32);
      auVar31 = vblendvps_avx(auVar332,auVar31,auVar32);
      auVar241 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      auStack_690 = auVar344._16_16_;
      auVar23 = vblendvps_avx(auVar365,auVar23,auVar32);
      auVar30 = vsubps_avx(auVar30,auVar24);
      auVar141 = vsubps_avx(auVar31,auVar25);
      auVar23 = vsubps_avx(auVar23,auVar26);
      auVar142 = vsubps_avx(auVar25,auVar28);
      fVar216 = auVar141._0_4_;
      fVar163 = auVar26._0_4_;
      fVar263 = auVar141._4_4_;
      fVar166 = auVar26._4_4_;
      auVar53._4_4_ = fVar166 * fVar263;
      auVar53._0_4_ = fVar163 * fVar216;
      fVar271 = auVar141._8_4_;
      fVar169 = auVar26._8_4_;
      auVar53._8_4_ = fVar169 * fVar271;
      fVar286 = auVar141._12_4_;
      fVar172 = auVar26._12_4_;
      auVar53._12_4_ = fVar172 * fVar286;
      fVar301 = auVar141._16_4_;
      fVar175 = auVar26._16_4_;
      auVar53._16_4_ = fVar175 * fVar301;
      fVar315 = auVar141._20_4_;
      fVar254 = auVar26._20_4_;
      auVar53._20_4_ = fVar254 * fVar315;
      fVar155 = auVar141._24_4_;
      fVar289 = auVar26._24_4_;
      auVar53._24_4_ = fVar289 * fVar155;
      auVar53._28_4_ = auVar31._28_4_;
      fVar218 = auVar25._0_4_;
      fVar173 = auVar23._0_4_;
      fVar265 = auVar25._4_4_;
      fVar176 = auVar23._4_4_;
      auVar54._4_4_ = fVar176 * fVar265;
      auVar54._0_4_ = fVar173 * fVar218;
      fVar272 = auVar25._8_4_;
      fVar196 = auVar23._8_4_;
      auVar54._8_4_ = fVar196 * fVar272;
      fVar287 = auVar25._12_4_;
      fVar290 = auVar23._12_4_;
      auVar54._12_4_ = fVar290 * fVar287;
      fVar313 = auVar25._16_4_;
      fVar326 = auVar23._16_4_;
      auVar54._16_4_ = fVar326 * fVar313;
      fVar316 = auVar25._20_4_;
      fVar237 = auVar23._20_4_;
      auVar54._20_4_ = fVar237 * fVar316;
      fVar159 = auVar25._24_4_;
      fVar248 = auVar23._24_4_;
      uVar9 = auVar140._28_4_;
      auVar54._24_4_ = fVar248 * fVar159;
      auVar54._28_4_ = uVar9;
      auVar31 = vsubps_avx(auVar54,auVar53);
      fVar219 = auVar24._0_4_;
      fVar267 = auVar24._4_4_;
      auVar55._4_4_ = fVar176 * fVar267;
      auVar55._0_4_ = fVar173 * fVar219;
      fVar280 = auVar24._8_4_;
      auVar55._8_4_ = fVar196 * fVar280;
      fVar288 = auVar24._12_4_;
      auVar55._12_4_ = fVar290 * fVar288;
      fVar314 = auVar24._16_4_;
      auVar55._16_4_ = fVar326 * fVar314;
      fVar236 = auVar24._20_4_;
      auVar55._20_4_ = fVar237 * fVar236;
      fVar136 = auVar24._24_4_;
      auVar55._24_4_ = fVar248 * fVar136;
      auVar55._28_4_ = uVar9;
      fVar220 = auVar30._0_4_;
      fVar269 = auVar30._4_4_;
      auVar56._4_4_ = fVar166 * fVar269;
      auVar56._0_4_ = fVar163 * fVar220;
      fVar282 = auVar30._8_4_;
      auVar56._8_4_ = fVar169 * fVar282;
      fVar311 = auVar30._12_4_;
      auVar56._12_4_ = fVar172 * fVar311;
      fVar234 = auVar30._16_4_;
      auVar56._16_4_ = fVar175 * fVar234;
      fVar195 = auVar30._20_4_;
      auVar56._20_4_ = fVar254 * fVar195;
      fVar156 = auVar30._24_4_;
      auVar56._24_4_ = fVar289 * fVar156;
      auVar56._28_4_ = auVar365._28_4_;
      auVar140 = vsubps_avx(auVar56,auVar55);
      auVar57._4_4_ = fVar265 * fVar269;
      auVar57._0_4_ = fVar218 * fVar220;
      auVar57._8_4_ = fVar272 * fVar282;
      auVar57._12_4_ = fVar287 * fVar311;
      auVar57._16_4_ = fVar313 * fVar234;
      auVar57._20_4_ = fVar316 * fVar195;
      auVar57._24_4_ = fVar159 * fVar156;
      auVar57._28_4_ = uVar9;
      auVar370._0_4_ = fVar219 * fVar216;
      auVar370._4_4_ = fVar267 * fVar263;
      auVar370._8_4_ = fVar280 * fVar271;
      auVar370._12_4_ = fVar288 * fVar286;
      auVar370._16_4_ = fVar314 * fVar301;
      auVar370._20_4_ = fVar236 * fVar315;
      auVar370._24_4_ = fVar136 * fVar155;
      auVar370._28_4_ = 0;
      auVar182 = vsubps_avx(auVar370,auVar57);
      auVar183 = vsubps_avx(auVar26,auVar29);
      fVar255 = auVar182._28_4_ + auVar140._28_4_;
      auVar187._0_4_ = auVar182._0_4_ + auVar140._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
      auVar187._4_4_ = auVar182._4_4_ + auVar140._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
      auVar187._8_4_ = auVar182._8_4_ + auVar140._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
      auVar187._12_4_ = auVar182._12_4_ + auVar140._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
      auVar187._16_4_ = auVar182._16_4_ + auVar140._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
      auVar187._20_4_ = auVar182._20_4_ + auVar140._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
      auVar187._24_4_ = auVar182._24_4_ + auVar140._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
      auVar187._28_4_ = fVar255 + auVar31._28_4_;
      fVar235 = auVar142._0_4_;
      fVar137 = auVar142._4_4_;
      auVar58._4_4_ = fVar137 * auVar29._4_4_;
      auVar58._0_4_ = fVar235 * auVar29._0_4_;
      fVar157 = auVar142._8_4_;
      auVar58._8_4_ = fVar157 * auVar29._8_4_;
      fVar161 = auVar142._12_4_;
      auVar58._12_4_ = fVar161 * auVar29._12_4_;
      fVar164 = auVar142._16_4_;
      auVar58._16_4_ = fVar164 * auVar29._16_4_;
      fVar167 = auVar142._20_4_;
      auVar58._20_4_ = fVar167 * auVar29._20_4_;
      fVar170 = auVar142._24_4_;
      auVar58._24_4_ = fVar170 * auVar29._24_4_;
      auVar58._28_4_ = fVar255;
      fVar255 = auVar183._0_4_;
      fVar270 = auVar183._4_4_;
      auVar59._4_4_ = auVar28._4_4_ * fVar270;
      auVar59._0_4_ = auVar28._0_4_ * fVar255;
      fVar284 = auVar183._8_4_;
      auVar59._8_4_ = auVar28._8_4_ * fVar284;
      fVar233 = auVar183._12_4_;
      auVar59._12_4_ = auVar28._12_4_ * fVar233;
      fVar302 = auVar183._16_4_;
      auVar59._16_4_ = auVar28._16_4_ * fVar302;
      fVar327 = auVar183._20_4_;
      auVar59._20_4_ = auVar28._20_4_ * fVar327;
      fVar160 = auVar183._24_4_;
      auVar59._24_4_ = auVar28._24_4_ * fVar160;
      auVar59._28_4_ = auVar182._28_4_;
      auVar140 = vsubps_avx(auVar59,auVar58);
      auVar142 = vsubps_avx(auVar24,auVar27);
      fVar250 = auVar142._0_4_;
      fVar252 = auVar142._4_4_;
      auVar60._4_4_ = fVar252 * auVar29._4_4_;
      auVar60._0_4_ = fVar250 * auVar29._0_4_;
      fVar256 = auVar142._8_4_;
      auVar60._8_4_ = fVar256 * auVar29._8_4_;
      fVar264 = auVar142._12_4_;
      auVar60._12_4_ = fVar264 * auVar29._12_4_;
      fVar266 = auVar142._16_4_;
      auVar60._16_4_ = fVar266 * auVar29._16_4_;
      fVar268 = auVar142._20_4_;
      auVar60._20_4_ = fVar268 * auVar29._20_4_;
      fVar273 = auVar142._24_4_;
      auVar60._24_4_ = fVar273 * auVar29._24_4_;
      auVar60._28_4_ = auVar29._28_4_;
      auVar61._4_4_ = auVar27._4_4_ * fVar270;
      auVar61._0_4_ = auVar27._0_4_ * fVar255;
      auVar61._8_4_ = auVar27._8_4_ * fVar284;
      auVar61._12_4_ = auVar27._12_4_ * fVar233;
      auVar61._16_4_ = auVar27._16_4_ * fVar302;
      auVar61._20_4_ = auVar27._20_4_ * fVar327;
      auVar61._24_4_ = auVar27._24_4_ * fVar160;
      auVar61._28_4_ = auVar31._28_4_;
      auVar31 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = auVar28._4_4_ * fVar252;
      auVar62._0_4_ = auVar28._0_4_ * fVar250;
      auVar62._8_4_ = auVar28._8_4_ * fVar256;
      auVar62._12_4_ = auVar28._12_4_ * fVar264;
      auVar62._16_4_ = auVar28._16_4_ * fVar266;
      auVar62._20_4_ = auVar28._20_4_ * fVar268;
      auVar62._24_4_ = auVar28._24_4_ * fVar273;
      auVar62._28_4_ = auVar29._28_4_;
      auVar63._4_4_ = auVar27._4_4_ * fVar137;
      auVar63._0_4_ = auVar27._0_4_ * fVar235;
      auVar63._8_4_ = auVar27._8_4_ * fVar157;
      auVar63._12_4_ = auVar27._12_4_ * fVar161;
      auVar63._16_4_ = auVar27._16_4_ * fVar164;
      auVar63._20_4_ = auVar27._20_4_ * fVar167;
      auVar63._24_4_ = auVar27._24_4_ * fVar170;
      auVar63._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar63,auVar62);
      auVar245._0_4_ = auVar140._0_4_ * 0.0 + auVar27._0_4_ + auVar31._0_4_ * 0.0;
      auVar245._4_4_ = auVar140._4_4_ * 0.0 + auVar27._4_4_ + auVar31._4_4_ * 0.0;
      auVar245._8_4_ = auVar140._8_4_ * 0.0 + auVar27._8_4_ + auVar31._8_4_ * 0.0;
      auVar245._12_4_ = auVar140._12_4_ * 0.0 + auVar27._12_4_ + auVar31._12_4_ * 0.0;
      auVar245._16_4_ = auVar140._16_4_ * 0.0 + auVar27._16_4_ + auVar31._16_4_ * 0.0;
      auVar245._20_4_ = auVar140._20_4_ * 0.0 + auVar27._20_4_ + auVar31._20_4_ * 0.0;
      auVar245._24_4_ = auVar140._24_4_ * 0.0 + auVar27._24_4_ + auVar31._24_4_ * 0.0;
      auVar245._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar31._28_4_;
      auVar27 = vmaxps_avx(auVar187,auVar245);
      auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
      auVar203 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
      auVar241 = vpand_avx(auVar203,auVar241);
      auVar203 = vpmovsxwd_avx(auVar241);
      auVar223 = vpunpckhwd_avx(auVar241,auVar241);
      auVar228._16_16_ = auVar223;
      auVar228._0_16_ = auVar203;
      if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar228 >> 0x7f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar223 >> 0x3f,0) == '\0') &&
          (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar223[0xf]
         ) {
LAB_00a451a5:
        auVar308 = ZEXT3264(auVar147);
        auVar232 = ZEXT3264(auVar228);
        auVar194 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar349._4_4_ = fVar154;
        auVar349._0_4_ = fVar135;
        auVar349._8_4_ = fVar158;
        auVar349._12_4_ = fVar162;
        auVar349._16_4_ = fVar165;
        auVar349._20_4_ = fVar168;
        auVar349._24_4_ = fVar171;
        auVar349._28_4_ = fVar174;
      }
      else {
        auVar64._4_4_ = fVar270 * fVar263;
        auVar64._0_4_ = fVar255 * fVar216;
        auVar64._8_4_ = fVar284 * fVar271;
        auVar64._12_4_ = fVar233 * fVar286;
        auVar64._16_4_ = fVar302 * fVar301;
        auVar64._20_4_ = fVar327 * fVar315;
        auVar64._24_4_ = fVar160 * fVar155;
        auVar64._28_4_ = auVar223._12_4_;
        auVar347._0_4_ = fVar235 * fVar173;
        auVar347._4_4_ = fVar137 * fVar176;
        auVar347._8_4_ = fVar157 * fVar196;
        auVar347._12_4_ = fVar161 * fVar290;
        auVar347._16_4_ = fVar164 * fVar326;
        auVar347._20_4_ = fVar167 * fVar237;
        auVar347._24_4_ = fVar170 * fVar248;
        auVar347._28_4_ = 0;
        auVar27 = vsubps_avx(auVar347,auVar64);
        auVar65._4_4_ = fVar252 * fVar176;
        auVar65._0_4_ = fVar250 * fVar173;
        auVar65._8_4_ = fVar256 * fVar196;
        auVar65._12_4_ = fVar264 * fVar290;
        auVar65._16_4_ = fVar266 * fVar326;
        auVar65._20_4_ = fVar268 * fVar237;
        auVar65._24_4_ = fVar273 * fVar248;
        auVar65._28_4_ = auVar23._28_4_;
        auVar66._4_4_ = fVar270 * fVar269;
        auVar66._0_4_ = fVar255 * fVar220;
        auVar66._8_4_ = fVar284 * fVar282;
        auVar66._12_4_ = fVar233 * fVar311;
        auVar66._16_4_ = fVar302 * fVar234;
        auVar66._20_4_ = fVar327 * fVar195;
        auVar66._24_4_ = fVar160 * fVar156;
        auVar66._28_4_ = auVar183._28_4_;
        auVar29 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = fVar137 * fVar269;
        auVar67._0_4_ = fVar235 * fVar220;
        auVar67._8_4_ = fVar157 * fVar282;
        auVar67._12_4_ = fVar161 * fVar311;
        auVar67._16_4_ = fVar164 * fVar234;
        auVar67._20_4_ = fVar167 * fVar195;
        auVar67._24_4_ = fVar170 * fVar156;
        auVar67._28_4_ = auVar187._28_4_;
        auVar68._4_4_ = fVar252 * fVar263;
        auVar68._0_4_ = fVar250 * fVar216;
        auVar68._8_4_ = fVar256 * fVar271;
        auVar68._12_4_ = fVar264 * fVar286;
        auVar68._16_4_ = fVar266 * fVar301;
        auVar68._20_4_ = fVar268 * fVar315;
        auVar68._24_4_ = fVar273 * fVar155;
        auVar68._28_4_ = auVar141._28_4_;
        auVar31 = vsubps_avx(auVar68,auVar67);
        auVar299._0_4_ = auVar27._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
        auVar299._4_4_ = auVar27._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
        auVar299._8_4_ = auVar27._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
        auVar299._12_4_ = auVar27._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
        auVar299._16_4_ = auVar27._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
        auVar299._20_4_ = auVar27._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
        auVar299._24_4_ = auVar27._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
        auVar299._28_4_ = auVar141._28_4_ + auVar31._28_4_ + auVar187._28_4_;
        auVar28 = vrcpps_avx(auVar299);
        fVar216 = auVar28._0_4_;
        fVar220 = auVar28._4_4_;
        auVar69._4_4_ = auVar299._4_4_ * fVar220;
        auVar69._0_4_ = auVar299._0_4_ * fVar216;
        fVar255 = auVar28._8_4_;
        auVar69._8_4_ = auVar299._8_4_ * fVar255;
        fVar263 = auVar28._12_4_;
        auVar69._12_4_ = auVar299._12_4_ * fVar263;
        fVar269 = auVar28._16_4_;
        auVar69._16_4_ = auVar299._16_4_ * fVar269;
        fVar270 = auVar28._20_4_;
        auVar69._20_4_ = auVar299._20_4_ * fVar270;
        fVar271 = auVar28._24_4_;
        auVar69._24_4_ = auVar299._24_4_ * fVar271;
        auVar69._28_4_ = auVar183._28_4_;
        auVar348._8_4_ = 0x3f800000;
        auVar348._0_8_ = 0x3f8000003f800000;
        auVar348._12_4_ = 0x3f800000;
        auVar348._16_4_ = 0x3f800000;
        auVar348._20_4_ = 0x3f800000;
        auVar348._24_4_ = 0x3f800000;
        auVar348._28_4_ = 0x3f800000;
        auVar23 = vsubps_avx(auVar348,auVar69);
        fVar216 = auVar23._0_4_ * fVar216 + fVar216;
        fVar220 = auVar23._4_4_ * fVar220 + fVar220;
        fVar255 = auVar23._8_4_ * fVar255 + fVar255;
        fVar263 = auVar23._12_4_ * fVar263 + fVar263;
        fVar269 = auVar23._16_4_ * fVar269 + fVar269;
        fVar270 = auVar23._20_4_ * fVar270 + fVar270;
        fVar271 = auVar23._24_4_ * fVar271 + fVar271;
        auVar70._4_4_ =
             (auVar27._4_4_ * fVar267 + auVar29._4_4_ * fVar265 + auVar31._4_4_ * fVar166) * fVar220
        ;
        auVar70._0_4_ =
             (auVar27._0_4_ * fVar219 + auVar29._0_4_ * fVar218 + auVar31._0_4_ * fVar163) * fVar216
        ;
        auVar70._8_4_ =
             (auVar27._8_4_ * fVar280 + auVar29._8_4_ * fVar272 + auVar31._8_4_ * fVar169) * fVar255
        ;
        auVar70._12_4_ =
             (auVar27._12_4_ * fVar288 + auVar29._12_4_ * fVar287 + auVar31._12_4_ * fVar172) *
             fVar263;
        auVar70._16_4_ =
             (auVar27._16_4_ * fVar314 + auVar29._16_4_ * fVar313 + auVar31._16_4_ * fVar175) *
             fVar269;
        auVar70._20_4_ =
             (auVar27._20_4_ * fVar236 + auVar29._20_4_ * fVar316 + auVar31._20_4_ * fVar254) *
             fVar270;
        auVar70._24_4_ =
             (auVar27._24_4_ * fVar136 + auVar29._24_4_ * fVar159 + auVar31._24_4_ * fVar289) *
             fVar271;
        auVar70._28_4_ = auVar30._28_4_ + auVar26._28_4_;
        auVar203 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
        auVar146._16_16_ = auVar203;
        auVar146._0_16_ = auVar203;
        auVar26 = vcmpps_avx(auVar146,auVar70,2);
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar229._4_4_ = uVar9;
        auVar229._0_4_ = uVar9;
        auVar229._8_4_ = uVar9;
        auVar229._12_4_ = uVar9;
        auVar229._16_4_ = uVar9;
        auVar229._20_4_ = uVar9;
        auVar229._24_4_ = uVar9;
        auVar229._28_4_ = uVar9;
        auVar27 = vcmpps_avx(auVar70,auVar229,2);
        auVar26 = vandps_avx(auVar27,auVar26);
        auVar203 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar241 = vpand_avx(auVar241,auVar203);
        auVar203 = vpmovsxwd_avx(auVar241);
        auVar223 = vpshufd_avx(auVar241,0xee);
        auVar223 = vpmovsxwd_avx(auVar223);
        auVar228._16_16_ = auVar223;
        auVar228._0_16_ = auVar203;
        if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar228 >> 0x7f,0) == '\0') &&
              (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar223 >> 0x3f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar223[0xf]) goto LAB_00a451a5;
        auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,auVar299,4);
        auVar203 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar241 = vpand_avx(auVar241,auVar203);
        auVar203 = vpmovsxwd_avx(auVar241);
        auVar232 = ZEXT1664(auVar203);
        auVar241 = vpunpckhwd_avx(auVar241,auVar241);
        auVar278._16_16_ = auVar241;
        auVar278._0_16_ = auVar203;
        auVar194 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar308 = ZEXT3264(auVar147);
        auVar349._4_4_ = fVar154;
        auVar349._0_4_ = fVar135;
        auVar349._8_4_ = fVar158;
        auVar349._12_4_ = fVar162;
        auVar349._16_4_ = fVar165;
        auVar349._20_4_ = fVar168;
        auVar349._24_4_ = fVar171;
        auVar349._28_4_ = fVar174;
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar241 >> 0x3f,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar241[0xf] < '\0') {
          auVar71._4_4_ = auVar187._4_4_ * fVar220;
          auVar71._0_4_ = auVar187._0_4_ * fVar216;
          auVar71._8_4_ = auVar187._8_4_ * fVar255;
          auVar71._12_4_ = auVar187._12_4_ * fVar263;
          auVar71._16_4_ = auVar187._16_4_ * fVar269;
          auVar71._20_4_ = auVar187._20_4_ * fVar270;
          auVar71._24_4_ = auVar187._24_4_ * fVar271;
          auVar71._28_4_ = SUB84(uStack_5c8,4);
          auVar72._4_4_ = auVar245._4_4_ * fVar220;
          auVar72._0_4_ = auVar245._0_4_ * fVar216;
          auVar72._8_4_ = auVar245._8_4_ * fVar255;
          auVar72._12_4_ = auVar245._12_4_ * fVar263;
          auVar72._16_4_ = auVar245._16_4_ * fVar269;
          auVar72._20_4_ = auVar245._20_4_ * fVar270;
          auVar72._24_4_ = auVar245._24_4_ * fVar271;
          auVar72._28_4_ = auVar23._28_4_ + auVar28._28_4_;
          auVar246._8_4_ = 0x3f800000;
          auVar246._0_8_ = 0x3f8000003f800000;
          auVar246._12_4_ = 0x3f800000;
          auVar246._16_4_ = 0x3f800000;
          auVar246._20_4_ = 0x3f800000;
          auVar246._24_4_ = 0x3f800000;
          auVar246._28_4_ = 0x3f800000;
          auVar147 = vsubps_avx(auVar246,auVar71);
          auVar232 = ZEXT3264(auVar147);
          auVar147 = vblendvps_avx(auVar147,auVar71,auVar32);
          auVar308 = ZEXT3264(auVar147);
          auVar147 = vsubps_avx(auVar246,auVar72);
          _local_3a0 = vblendvps_avx(auVar147,auVar72,auVar32);
          auVar194 = ZEXT3264(auVar278);
          local_4e0 = auVar70;
        }
      }
      auVar147 = auVar194._0_32_;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0x7f,0) != '\0') ||
            (auVar194 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar147 >> 0xbf,0) != '\0') ||
          (auVar194 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar194[0x1f] < '\0') {
        auVar26 = vsubps_avx(auVar305,auVar349);
        fVar218 = auVar349._0_4_ + auVar308._0_4_ * auVar26._0_4_;
        fVar219 = auVar349._4_4_ + auVar308._4_4_ * auVar26._4_4_;
        fVar220 = auVar349._8_4_ + auVar308._8_4_ * auVar26._8_4_;
        fVar255 = auVar349._12_4_ + auVar308._12_4_ * auVar26._12_4_;
        fVar263 = auVar349._16_4_ + auVar308._16_4_ * auVar26._16_4_;
        fVar265 = auVar349._20_4_ + auVar308._20_4_ * auVar26._20_4_;
        fVar267 = auVar349._24_4_ + auVar308._24_4_ * auVar26._24_4_;
        fVar269 = auVar349._28_4_ + auVar26._28_4_;
        fVar216 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar73._4_4_ = (fVar219 + fVar219) * fVar216;
        auVar73._0_4_ = (fVar218 + fVar218) * fVar216;
        auVar73._8_4_ = (fVar220 + fVar220) * fVar216;
        auVar73._12_4_ = (fVar255 + fVar255) * fVar216;
        auVar73._16_4_ = (fVar263 + fVar263) * fVar216;
        auVar73._20_4_ = (fVar265 + fVar265) * fVar216;
        auVar73._24_4_ = (fVar267 + fVar267) * fVar216;
        auVar73._28_4_ = fVar269 + fVar269;
        auVar26 = vcmpps_avx(local_4e0,auVar73,6);
        auVar27 = auVar147 & auVar26;
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0x7f,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0xbf,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar27[0x1f] < '\0') {
          auVar232 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
          uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
          uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
          uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_7c0 = auVar308._0_32_;
          local_2c0 = local_7c0;
          auVar127 = _local_3a0;
          auVar27 = _local_3a0;
          local_2a0 = (float)local_3a0._0_4_;
          fStack_29c = (float)local_3a0._4_4_;
          fStack_298 = (float)uStack_398;
          fStack_294 = uStack_398._4_4_;
          fStack_290 = (float)uStack_390;
          fStack_28c = uStack_390._4_4_;
          fStack_288 = (float)uStack_388;
          fStack_284 = uStack_388._4_4_;
          local_280 = local_4e0;
          local_260 = 0;
          local_25c = uVar19;
          local_250 = local_8a0;
          fStack_24c = fStack_89c;
          fStack_248 = fStack_898;
          fStack_244 = fStack_894;
          local_240 = local_880;
          fStack_23c = fStack_87c;
          fStack_238 = fStack_878;
          fStack_234 = fStack_874;
          local_230 = local_890;
          fStack_22c = fStack_88c;
          fStack_228 = fStack_888;
          fStack_224 = fStack_884;
          local_220 = local_830;
          fStack_21c = fStack_82c;
          fStack_218 = fStack_828;
          fStack_214 = fStack_824;
          _local_3a0 = auVar27;
          if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_620 = vandps_avx(auVar26,auVar147);
            auVar200._0_4_ = 1.0 / auVar222._0_4_;
            auVar200._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar241 = vshufps_avx(auVar200,auVar200,0);
            local_1e0[0] = auVar241._0_4_ * (auVar308._0_4_ + 0.0);
            local_1e0[1] = auVar241._4_4_ * (auVar308._4_4_ + 1.0);
            local_1e0[2] = auVar241._8_4_ * (auVar308._8_4_ + 2.0);
            local_1e0[3] = auVar241._12_4_ * (auVar308._12_4_ + 3.0);
            fStack_1d0 = auVar241._0_4_ * (auVar308._16_4_ + 4.0);
            fStack_1cc = auVar241._4_4_ * (auVar308._20_4_ + 5.0);
            fStack_1c8 = auVar241._8_4_ * (auVar308._24_4_ + 6.0);
            fStack_1c4 = auVar308._28_4_ + 7.0;
            uStack_390 = auVar127._16_8_;
            uStack_388 = auVar27._24_8_;
            local_1c0 = local_3a0;
            uStack_1b8 = uStack_398;
            uStack_1b0 = uStack_390;
            uStack_1a8 = uStack_388;
            local_1a0 = local_4e0;
            auVar188._8_4_ = 0x7f800000;
            auVar188._0_8_ = 0x7f8000007f800000;
            auVar188._12_4_ = 0x7f800000;
            auVar188._16_4_ = 0x7f800000;
            auVar188._20_4_ = 0x7f800000;
            auVar188._24_4_ = 0x7f800000;
            auVar188._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar188,local_4e0,local_620);
            auVar26 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar26 = vminps_avx(auVar147,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar26 = vcmpps_avx(auVar147,auVar26,0);
            auVar27 = local_620 & auVar26;
            auVar147 = local_620;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar26,local_620);
            }
            uVar129 = vmovmskps_avx(auVar147);
            uVar130 = 0;
            if (uVar129 != 0) {
              for (; (uVar129 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
              }
            }
            uVar132 = (ulong)uVar130;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar216 = local_1e0[uVar132];
              uVar9 = *(undefined4 *)((long)&local_1c0 + uVar132 * 4);
              fVar219 = 1.0 - fVar216;
              fVar218 = fVar216 * fVar219 + fVar216 * fVar219;
              auVar241 = ZEXT416((uint)(fVar216 * fVar216 * 3.0));
              auVar241 = vshufps_avx(auVar241,auVar241,0);
              auVar203 = ZEXT416((uint)((fVar218 - fVar216 * fVar216) * 3.0));
              auVar203 = vshufps_avx(auVar203,auVar203,0);
              auVar223 = ZEXT416((uint)((fVar219 * fVar219 - fVar218) * 3.0));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar205 = ZEXT416((uint)(fVar219 * fVar219 * -3.0));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar201._0_4_ =
                   local_8a0 * auVar205._0_4_ +
                   local_880 * auVar223._0_4_ +
                   local_830 * auVar241._0_4_ + local_890 * auVar203._0_4_;
              auVar201._4_4_ =
                   fStack_89c * auVar205._4_4_ +
                   fStack_87c * auVar223._4_4_ +
                   fStack_82c * auVar241._4_4_ + fStack_88c * auVar203._4_4_;
              auVar201._8_4_ =
                   fStack_898 * auVar205._8_4_ +
                   fStack_878 * auVar223._8_4_ +
                   fStack_828 * auVar241._8_4_ + fStack_888 * auVar203._8_4_;
              auVar201._12_4_ =
                   fStack_894 * auVar205._12_4_ +
                   fStack_874 * auVar223._12_4_ +
                   fStack_824 * auVar241._12_4_ + fStack_884 * auVar203._12_4_;
              auVar232 = ZEXT464(*(uint *)(local_1a0 + uVar132 * 4));
              *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1a0 + uVar132 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar201._0_4_;
              uVar20 = vextractps_avx(auVar201,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
              uVar20 = vextractps_avx(auVar201,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
              *(float *)(ray + k * 4 + 0xf0) = fVar216;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
              *(uint *)(ray + k * 4 + 0x110) = uVar18;
              *(uint *)(ray + k * 4 + 0x120) = uVar128;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_6a0 = vpermilps_avx(local_670,0);
              _local_6c0 = vpermilps_avx(local_680,0);
              _auStack_6b0 = auVar24._16_16_;
              local_640._16_16_ = auVar25._16_16_;
              local_640._0_16_ = *local_718;
              auStack_7f0 = auVar305._16_16_;
              local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_710 = context;
              local_708 = k;
              _local_340 = auVar15;
              while( true ) {
                local_420 = local_1e0[uVar132];
                local_410 = *(undefined4 *)((long)&local_1c0 + uVar132 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar132 * 4);
                fVar218 = 1.0 - local_420;
                fVar216 = local_420 * fVar218 + local_420 * fVar218;
                auVar241 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                auVar241 = vshufps_avx(auVar241,auVar241,0);
                auVar203 = ZEXT416((uint)((fVar216 - local_420 * local_420) * 3.0));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar223 = ZEXT416((uint)((fVar218 * fVar218 - fVar216) * 3.0));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                local_790.context = context->user;
                auVar205 = ZEXT416((uint)(fVar218 * fVar218 * -3.0));
                auVar205 = vshufps_avx(auVar205,auVar205,0);
                auVar207._0_4_ =
                     local_8a0 * auVar205._0_4_ +
                     local_880 * auVar223._0_4_ +
                     local_830 * auVar241._0_4_ + local_890 * auVar203._0_4_;
                auVar207._4_4_ =
                     fStack_89c * auVar205._4_4_ +
                     fStack_87c * auVar223._4_4_ +
                     fStack_82c * auVar241._4_4_ + fStack_88c * auVar203._4_4_;
                auVar207._8_4_ =
                     fStack_898 * auVar205._8_4_ +
                     fStack_878 * auVar223._8_4_ +
                     fStack_828 * auVar241._8_4_ + fStack_888 * auVar203._8_4_;
                auVar207._12_4_ =
                     fStack_894 * auVar205._12_4_ +
                     fStack_874 * auVar223._12_4_ +
                     fStack_824 * auVar241._12_4_ + fStack_884 * auVar203._12_4_;
                auVar241 = vshufps_avx(auVar207,auVar207,0);
                local_450[0] = (RTCHitN)auVar241[0];
                local_450[1] = (RTCHitN)auVar241[1];
                local_450[2] = (RTCHitN)auVar241[2];
                local_450[3] = (RTCHitN)auVar241[3];
                local_450[4] = (RTCHitN)auVar241[4];
                local_450[5] = (RTCHitN)auVar241[5];
                local_450[6] = (RTCHitN)auVar241[6];
                local_450[7] = (RTCHitN)auVar241[7];
                local_450[8] = (RTCHitN)auVar241[8];
                local_450[9] = (RTCHitN)auVar241[9];
                local_450[10] = (RTCHitN)auVar241[10];
                local_450[0xb] = (RTCHitN)auVar241[0xb];
                local_450[0xc] = (RTCHitN)auVar241[0xc];
                local_450[0xd] = (RTCHitN)auVar241[0xd];
                local_450[0xe] = (RTCHitN)auVar241[0xe];
                local_450[0xf] = (RTCHitN)auVar241[0xf];
                auVar241 = vshufps_avx(auVar207,auVar207,0x55);
                local_440 = auVar241;
                local_430 = vshufps_avx(auVar207,auVar207,0xaa);
                fStack_41c = local_420;
                fStack_418 = local_420;
                fStack_414 = local_420;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                local_400 = local_6c0;
                uStack_3f8 = uStack_6b8;
                local_3f0 = local_6a0;
                vcmpps_avx(ZEXT1632(local_6a0),ZEXT1632(local_6a0),0xf);
                uStack_3dc = (local_790.context)->instID[0];
                local_3e0 = uStack_3dc;
                uStack_3d8 = uStack_3dc;
                uStack_3d4 = uStack_3dc;
                uStack_3d0 = (local_790.context)->instPrimID[0];
                uStack_3cc = uStack_3d0;
                uStack_3c8 = uStack_3d0;
                uStack_3c4 = uStack_3d0;
                local_820 = local_640._0_16_;
                local_790.valid = (int *)local_820;
                local_790.geometryUserPtr = pGVar21->userPtr;
                local_790.hit = local_450;
                local_790.N = 4;
                local_790.ray = (RTCRayN *)ray;
                if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar21->intersectionFilterN)(&local_790);
                  auVar308 = ZEXT3264(local_7c0);
                  pre = local_810;
                  context = local_710;
                  k = local_708;
                  fVar198 = (float)local_740._0_4_;
                  fVar213 = (float)local_740._4_4_;
                  fVar215 = fStack_738;
                  fVar217 = fStack_734;
                  fVar197 = fStack_730;
                  fVar212 = fStack_72c;
                  fVar214 = fStack_728;
                }
                if (local_820 == (undefined1  [16])0x0) {
                  auVar241 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar241 = auVar241 ^ _DAT_01f46b70;
                }
                else {
                  p_Var22 = context->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var22)(&local_790);
                    auVar308 = ZEXT3264(local_7c0);
                    pre = local_810;
                    context = local_710;
                    k = local_708;
                    fVar198 = (float)local_740._0_4_;
                    fVar213 = (float)local_740._4_4_;
                    fVar215 = fStack_738;
                    fVar217 = fStack_734;
                    fVar197 = fStack_730;
                    fVar212 = fStack_72c;
                    fVar214 = fStack_728;
                  }
                  auVar203 = vpcmpeqd_avx(local_820,_DAT_01f45a50);
                  auVar223 = vpcmpeqd_avx(auVar241,auVar241);
                  auVar241 = auVar203 ^ auVar223;
                  if (local_820 != (undefined1  [16])0x0) {
                    auVar203 = auVar203 ^ auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])local_790.hit);
                    *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar223;
                    auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar223;
                    auVar203 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])(local_790.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar203;
                  }
                }
                auVar147 = local_4e0;
                auVar181._8_8_ = 0x100000001;
                auVar181._0_8_ = 0x100000001;
                if ((auVar181 & auVar241) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_800._0_4_;
                  auVar241 = local_800;
                }
                else {
                  auVar241 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                auVar232 = ZEXT3264(local_4e0);
                *(undefined4 *)(local_620 + uVar132 * 4) = 0;
                local_800 = auVar241;
                auVar241 = vshufps_avx(auVar241,auVar241,0);
                auVar153._16_16_ = auVar241;
                auVar153._0_16_ = auVar241;
                auVar25 = vcmpps_avx(auVar147,auVar153,2);
                auVar24 = vandps_avx(auVar25,local_620);
                local_620 = local_620 & auVar25;
                if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_620 >> 0x7f,0) == '\0') &&
                      (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0xbf,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_620[0x1f]) break;
                auVar193._8_4_ = 0x7f800000;
                auVar193._0_8_ = 0x7f8000007f800000;
                auVar193._12_4_ = 0x7f800000;
                auVar193._16_4_ = 0x7f800000;
                auVar193._20_4_ = 0x7f800000;
                auVar193._24_4_ = 0x7f800000;
                auVar193._28_4_ = 0x7f800000;
                auVar147 = vblendvps_avx(auVar193,auVar147,auVar24);
                auVar25 = vshufps_avx(auVar147,auVar147,0xb1);
                auVar25 = vminps_avx(auVar147,auVar25);
                auVar26 = vshufpd_avx(auVar25,auVar25,5);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar25 = vcmpps_avx(auVar147,auVar25,0);
                auVar26 = auVar24 & auVar25;
                auVar147 = auVar24;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar147 = vandps_avx(auVar25,auVar24);
                }
                uVar130 = vmovmskps_avx(auVar147);
                uVar18 = 0;
                if (uVar130 != 0) {
                  for (; (uVar130 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar132 = (ulong)uVar18;
                local_620 = auVar24;
              }
            }
          }
        }
      }
      auVar341 = local_7e0._0_16_;
    }
    auVar194 = ZEXT3264(local_5c0);
    local_6a0._0_8_ = prim;
    if (8 < (int)uVar19) {
      _local_340 = vpshufd_avx(ZEXT416(uVar19),0);
      auVar241 = vshufps_avx(auVar341,auVar341,0);
      local_360._16_16_ = auVar241;
      local_360._0_16_ = auVar241;
      auVar241 = vpermilps_avx(_local_760,0);
      register0x00001210 = auVar241;
      _local_380 = auVar241;
      auVar139._0_4_ = 1.0 / (float)local_4c0._0_4_;
      auVar139._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar241 = vshufps_avx(auVar139,auVar139,0);
      register0x00001210 = auVar241;
      _local_100 = auVar241;
      local_670 = vpermilps_avx(local_670,0);
      local_680 = vpermilps_avx(local_680,0);
      local_7c0 = auVar308._0_32_;
      for (lVar133 = 8; local_5c0 = auVar194._0_32_, lVar133 < (int)uVar19; lVar133 = lVar133 + 8) {
        pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar133 * 4 + lVar131);
        fVar216 = *(float *)*pauVar2;
        fVar218 = *(float *)(*pauVar2 + 4);
        fVar219 = *(float *)(*pauVar2 + 8);
        fVar220 = *(float *)(*pauVar2 + 0xc);
        fVar255 = *(float *)(*pauVar2 + 0x10);
        fVar263 = *(float *)(*pauVar2 + 0x14);
        fVar265 = *(float *)(*pauVar2 + 0x18);
        auVar126 = *pauVar2;
        pauVar2 = (undefined1 (*) [28])(lVar131 + 0x21fb768 + lVar133 * 4);
        fVar267 = *(float *)*pauVar2;
        fVar269 = *(float *)(*pauVar2 + 4);
        fVar270 = *(float *)(*pauVar2 + 8);
        fVar271 = *(float *)(*pauVar2 + 0xc);
        fVar272 = *(float *)(*pauVar2 + 0x10);
        fVar280 = *(float *)(*pauVar2 + 0x14);
        fVar282 = *(float *)(*pauVar2 + 0x18);
        auVar125 = *pauVar2;
        pauVar4 = (undefined1 (*) [32])(lVar131 + 0x21fbbec + lVar133 * 4);
        fVar284 = *(float *)*pauVar4;
        fVar286 = *(float *)(*pauVar4 + 4);
        fVar287 = *(float *)(*pauVar4 + 8);
        fVar288 = *(float *)(*pauVar4 + 0xc);
        fVar311 = *(float *)(*pauVar4 + 0x10);
        fVar233 = *(float *)(*pauVar4 + 0x14);
        fVar301 = *(float *)(*pauVar4 + 0x18);
        auVar123 = *(undefined1 (*) [28])*pauVar4;
        pfVar5 = (float *)(lVar131 + 0x21fc070 + lVar133 * 4);
        fVar313 = *pfVar5;
        fVar314 = pfVar5[1];
        fVar234 = pfVar5[2];
        fVar302 = pfVar5[3];
        fVar315 = pfVar5[4];
        fVar316 = pfVar5[5];
        fVar236 = pfVar5[6];
        fVar195 = auVar232._28_4_;
        fVar175 = fVar195 + fVar195 + fStack_484;
        fVar254 = fVar195 + fVar195 + pfVar5[7];
        auVar356._0_4_ =
             (float)local_140._0_4_ * fVar216 +
             fVar267 * (float)local_2e0._0_4_ +
             (float)local_500._0_4_ * fVar284 + (float)local_4a0._0_4_ * fVar313;
        auVar356._4_4_ =
             (float)local_140._4_4_ * fVar218 +
             fVar269 * (float)local_2e0._4_4_ +
             (float)local_500._4_4_ * fVar286 + (float)local_4a0._4_4_ * fVar314;
        auVar356._8_4_ =
             fStack_138 * fVar219 +
             fVar270 * fStack_2d8 + fStack_4f8 * fVar287 + fStack_498 * fVar234;
        auVar356._12_4_ =
             fStack_134 * fVar220 +
             fVar271 * fStack_2d4 + fStack_4f4 * fVar288 + fStack_494 * fVar302;
        auVar356._16_4_ =
             fStack_130 * fVar255 +
             fVar272 * fStack_2d0 + fStack_4f0 * fVar311 + fStack_490 * fVar315;
        auVar356._20_4_ =
             fStack_12c * fVar263 +
             fVar280 * fStack_2cc + fStack_4ec * fVar233 + fStack_48c * fVar316;
        auVar356._24_4_ =
             fStack_128 * fVar265 +
             fVar282 * fStack_2c8 + fStack_4e8 * fVar301 + fStack_488 * fVar236;
        auVar356._28_4_ = fVar195 + pfVar5[7] + fVar175;
        local_7e0._0_4_ =
             fVar198 * fVar216 +
             (float)local_5a0._0_4_ * fVar313 + (float)local_520._0_4_ * fVar284 +
             (float)local_480._0_4_ * fVar267;
        local_7e0._4_4_ =
             fVar213 * fVar218 +
             (float)local_5a0._4_4_ * fVar314 + (float)local_520._4_4_ * fVar286 +
             (float)local_480._4_4_ * fVar269;
        local_7e0._8_4_ =
             fVar215 * fVar219 + fStack_598 * fVar234 + fStack_518 * fVar287 + fStack_478 * fVar270;
        local_7e0._12_4_ =
             fVar217 * fVar220 + fStack_594 * fVar302 + fStack_514 * fVar288 + fStack_474 * fVar271;
        local_7e0._16_4_ =
             fVar197 * fVar255 + fStack_590 * fVar315 + fStack_510 * fVar311 + fStack_470 * fVar272;
        local_7e0._20_4_ =
             fVar212 * fVar263 + fStack_58c * fVar316 + fStack_50c * fVar233 + fStack_46c * fVar280;
        local_7e0._24_4_ =
             fVar214 * fVar265 + fStack_588 * fVar236 + fStack_508 * fVar301 + fStack_468 * fVar282;
        local_7e0._28_4_ = fVar175 + auVar308._28_4_ + fVar195 + fVar195;
        fVar136 = fVar216 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar267 +
                  (float)local_120._0_4_ * fVar284 + fVar313 * (float)local_160._0_4_;
        fVar156 = fVar218 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar269 +
                  (float)local_120._4_4_ * fVar286 + fVar314 * (float)local_160._4_4_;
        fVar160 = fVar219 * fStack_b8 +
                  fStack_98 * fVar270 + fStack_118 * fVar287 + fVar234 * fStack_158;
        fVar163 = fVar220 * fStack_b4 +
                  fStack_94 * fVar271 + fStack_114 * fVar288 + fVar302 * fStack_154;
        fVar166 = fVar255 * fStack_b0 +
                  fStack_90 * fVar272 + fStack_110 * fVar311 + fVar315 * fStack_150;
        fVar169 = fVar263 * fStack_ac +
                  fStack_8c * fVar280 + fStack_10c * fVar233 + fVar316 * fStack_14c;
        fVar172 = fVar265 * fStack_a8 +
                  fStack_88 * fVar282 + fStack_108 * fVar301 + fVar236 * fStack_148;
        fVar175 = fVar175 + fVar254;
        pauVar3 = (undefined1 (*) [32])(bezier_basis1 + lVar133 * 4 + lVar131);
        auVar127 = *(undefined1 (*) [24])*pauVar3;
        pfVar5 = (float *)(lVar131 + 0x21fdb88 + lVar133 * 4);
        fVar255 = *pfVar5;
        fVar263 = pfVar5[1];
        fVar265 = pfVar5[2];
        fVar267 = pfVar5[3];
        fVar269 = pfVar5[4];
        fVar270 = pfVar5[5];
        fVar271 = pfVar5[6];
        pfVar6 = (float *)(lVar131 + 0x21fe00c + lVar133 * 4);
        fVar272 = *pfVar6;
        fVar280 = pfVar6[1];
        fVar282 = pfVar6[2];
        fVar284 = pfVar6[3];
        fVar286 = pfVar6[4];
        fVar287 = pfVar6[5];
        fVar288 = pfVar6[6];
        pfVar7 = (float *)(lVar131 + 0x21fe490 + lVar133 * 4);
        fVar311 = *pfVar7;
        fVar233 = pfVar7[1];
        fVar301 = pfVar7[2];
        fVar195 = pfVar7[3];
        fVar327 = pfVar7[4];
        fVar155 = pfVar7[5];
        fVar159 = pfVar7[6];
        fVar289 = fStack_4e4 + pfVar7[7];
        fVar216 = fStack_4e4 + fStack_4e4 + fVar254;
        local_760._0_4_ = auVar127._0_4_;
        local_760._4_4_ = auVar127._4_4_;
        fStack_758 = auVar127._8_4_;
        fStack_754 = auVar127._12_4_;
        fStack_750 = auVar127._16_4_;
        fStack_74c = auVar127._20_4_;
        fStack_748 = (float)*(undefined8 *)(*pauVar3 + 0x18);
        local_320._0_4_ =
             (float)local_140._0_4_ * (float)local_760._0_4_ +
             fVar255 * (float)local_2e0._0_4_ +
             (float)local_500._0_4_ * fVar272 + (float)local_4a0._0_4_ * fVar311;
        local_320._4_4_ =
             (float)local_140._4_4_ * (float)local_760._4_4_ +
             fVar263 * (float)local_2e0._4_4_ +
             (float)local_500._4_4_ * fVar280 + (float)local_4a0._4_4_ * fVar233;
        local_320._8_4_ =
             fStack_138 * fStack_758 +
             fVar265 * fStack_2d8 + fStack_4f8 * fVar282 + fStack_498 * fVar301;
        local_320._12_4_ =
             fStack_134 * fStack_754 +
             fVar267 * fStack_2d4 + fStack_4f4 * fVar284 + fStack_494 * fVar195;
        local_320._16_4_ =
             fStack_130 * fStack_750 +
             fVar269 * fStack_2d0 + fStack_4f0 * fVar286 + fStack_490 * fVar327;
        local_320._20_4_ =
             fStack_12c * fStack_74c +
             fVar270 * fStack_2cc + fStack_4ec * fVar287 + fStack_48c * fVar155;
        local_320._24_4_ =
             fStack_128 * fStack_748 +
             fVar271 * fStack_2c8 + fStack_4e8 * fVar288 + fStack_488 * fVar159;
        local_320._28_4_ = fVar289 + fVar216;
        auVar261._0_4_ =
             fVar198 * (float)local_760._0_4_ +
             (float)local_480._0_4_ * fVar255 +
             (float)local_520._0_4_ * fVar272 + fVar311 * (float)local_5a0._0_4_;
        auVar261._4_4_ =
             fVar213 * (float)local_760._4_4_ +
             (float)local_480._4_4_ * fVar263 +
             (float)local_520._4_4_ * fVar280 + fVar233 * (float)local_5a0._4_4_;
        auVar261._8_4_ =
             fVar215 * fStack_758 +
             fStack_478 * fVar265 + fStack_518 * fVar282 + fVar301 * fStack_598;
        auVar261._12_4_ =
             fVar217 * fStack_754 +
             fStack_474 * fVar267 + fStack_514 * fVar284 + fVar195 * fStack_594;
        auVar261._16_4_ =
             fVar197 * fStack_750 +
             fStack_470 * fVar269 + fStack_510 * fVar286 + fVar327 * fStack_590;
        auVar261._20_4_ =
             fVar212 * fStack_74c +
             fStack_46c * fVar270 + fStack_50c * fVar287 + fVar155 * fStack_58c;
        auVar261._24_4_ =
             fVar214 * fStack_748 +
             fStack_468 * fVar271 + fStack_508 * fVar288 + fVar159 * fStack_588;
        auVar261._28_4_ = fVar216 + fStack_4e4 + fStack_4e4 + fStack_484;
        auVar300._0_4_ =
             (float)local_a0._0_4_ * fVar255 +
             (float)local_120._0_4_ * fVar272 + fVar311 * (float)local_160._0_4_ +
             (float)local_760._0_4_ * (float)local_c0._0_4_;
        auVar300._4_4_ =
             (float)local_a0._4_4_ * fVar263 +
             (float)local_120._4_4_ * fVar280 + fVar233 * (float)local_160._4_4_ +
             (float)local_760._4_4_ * (float)local_c0._4_4_;
        auVar300._8_4_ =
             fStack_98 * fVar265 + fStack_118 * fVar282 + fVar301 * fStack_158 +
             fStack_758 * fStack_b8;
        auVar300._12_4_ =
             fStack_94 * fVar267 + fStack_114 * fVar284 + fVar195 * fStack_154 +
             fStack_754 * fStack_b4;
        auVar300._16_4_ =
             fStack_90 * fVar269 + fStack_110 * fVar286 + fVar327 * fStack_150 +
             fStack_750 * fStack_b0;
        auVar300._20_4_ =
             fStack_8c * fVar270 + fStack_10c * fVar287 + fVar155 * fStack_14c +
             fStack_74c * fStack_ac;
        auVar300._24_4_ =
             fStack_88 * fVar271 + fStack_108 * fVar288 + fVar159 * fStack_148 +
             fStack_748 * fStack_a8;
        auVar300._28_4_ = fStack_4e4 + fVar289 + fVar216;
        auVar24 = vsubps_avx(local_320,auVar356);
        auVar25 = vsubps_avx(auVar261,local_7e0);
        fVar254 = auVar24._0_4_;
        fVar235 = auVar24._4_4_;
        auVar74._4_4_ = fVar235 * local_7e0._4_4_;
        auVar74._0_4_ = fVar254 * local_7e0._0_4_;
        fVar137 = auVar24._8_4_;
        auVar74._8_4_ = fVar137 * local_7e0._8_4_;
        fVar157 = auVar24._12_4_;
        auVar74._12_4_ = fVar157 * local_7e0._12_4_;
        fVar161 = auVar24._16_4_;
        auVar74._16_4_ = fVar161 * local_7e0._16_4_;
        fVar164 = auVar24._20_4_;
        auVar74._20_4_ = fVar164 * local_7e0._20_4_;
        fVar167 = auVar24._24_4_;
        auVar74._24_4_ = fVar167 * local_7e0._24_4_;
        auVar74._28_4_ = fVar216;
        fVar197 = auVar25._0_4_;
        fVar212 = auVar25._4_4_;
        auVar75._4_4_ = auVar356._4_4_ * fVar212;
        auVar75._0_4_ = auVar356._0_4_ * fVar197;
        fVar214 = auVar25._8_4_;
        auVar75._8_4_ = auVar356._8_4_ * fVar214;
        fVar216 = auVar25._12_4_;
        auVar75._12_4_ = auVar356._12_4_ * fVar216;
        fVar218 = auVar25._16_4_;
        auVar75._16_4_ = auVar356._16_4_ * fVar218;
        fVar219 = auVar25._20_4_;
        auVar75._20_4_ = auVar356._20_4_ * fVar219;
        fVar220 = auVar25._24_4_;
        auVar75._24_4_ = auVar356._24_4_ * fVar220;
        auVar75._28_4_ = auVar261._28_4_;
        auVar26 = vsubps_avx(auVar74,auVar75);
        auVar118._4_4_ = fVar156;
        auVar118._0_4_ = fVar136;
        auVar118._8_4_ = fVar160;
        auVar118._12_4_ = fVar163;
        auVar118._16_4_ = fVar166;
        auVar118._20_4_ = fVar169;
        auVar118._24_4_ = fVar172;
        auVar118._28_4_ = fVar175;
        auVar147 = vmaxps_avx(auVar118,auVar300);
        auVar76._4_4_ = auVar147._4_4_ * auVar147._4_4_ * (fVar235 * fVar235 + fVar212 * fVar212);
        auVar76._0_4_ = auVar147._0_4_ * auVar147._0_4_ * (fVar254 * fVar254 + fVar197 * fVar197);
        auVar76._8_4_ = auVar147._8_4_ * auVar147._8_4_ * (fVar137 * fVar137 + fVar214 * fVar214);
        auVar76._12_4_ = auVar147._12_4_ * auVar147._12_4_ * (fVar157 * fVar157 + fVar216 * fVar216)
        ;
        auVar76._16_4_ = auVar147._16_4_ * auVar147._16_4_ * (fVar161 * fVar161 + fVar218 * fVar218)
        ;
        auVar76._20_4_ = auVar147._20_4_ * auVar147._20_4_ * (fVar164 * fVar164 + fVar219 * fVar219)
        ;
        auVar76._24_4_ = auVar147._24_4_ * auVar147._24_4_ * (fVar167 * fVar167 + fVar220 * fVar220)
        ;
        auVar76._28_4_ = fVar289 + auVar261._28_4_;
        auVar77._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar77._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar77._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar77._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar77._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar77._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar77._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar77._28_4_ = auVar26._28_4_;
        local_640 = vcmpps_avx(auVar77,auVar76,2);
        local_260 = (uint)lVar133;
        auVar203 = vpshufd_avx(ZEXT416(local_260),0);
        auVar241 = vpor_avx(auVar203,_DAT_01f4ad30);
        auVar203 = vpor_avx(auVar203,_DAT_01f7afa0);
        auVar241 = vpcmpgtd_avx(_local_340,auVar241);
        auVar203 = vpcmpgtd_avx(_local_340,auVar203);
        auVar230._16_16_ = auVar203;
        auVar230._0_16_ = auVar241;
        auVar232 = ZEXT3264(auVar230);
        auVar147 = auVar230 & local_640;
        fVar198 = (float)local_740._0_4_;
        fVar213 = (float)local_740._4_4_;
        fVar215 = fStack_738;
        fVar217 = fStack_734;
        fVar197 = fStack_730;
        fVar212 = fStack_72c;
        fVar214 = fStack_728;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar194 = ZEXT3264(local_5c0);
          auVar308 = ZEXT3264(local_7c0);
          _local_760 = *pauVar3;
        }
        else {
          local_660 = (float)local_760._0_4_ * (float)local_180._0_4_ +
                      fVar255 * (float)local_300._0_4_ +
                      (float)local_e0._0_4_ * fVar272 + (float)local_540._0_4_ * fVar311;
          fStack_65c = (float)local_760._4_4_ * (float)local_180._4_4_ +
                       fVar263 * (float)local_300._4_4_ +
                       (float)local_e0._4_4_ * fVar280 + (float)local_540._4_4_ * fVar233;
          fStack_658 = fStack_758 * fStack_178 +
                       fVar265 * fStack_2f8 + fStack_d8 * fVar282 + fStack_538 * fVar301;
          fStack_654 = fStack_754 * fStack_174 +
                       fVar267 * fStack_2f4 + fStack_d4 * fVar284 + fStack_534 * fVar195;
          fStack_650 = fStack_750 * fStack_170 +
                       fVar269 * fStack_2f0 + fStack_d0 * fVar286 + fStack_530 * fVar327;
          fStack_64c = fStack_74c * fStack_16c +
                       fVar270 * fStack_2ec + fStack_cc * fVar287 + fStack_52c * fVar155;
          fStack_648 = fStack_748 * fStack_168 +
                       fVar271 * fStack_2e8 + fStack_c8 * fVar288 + fStack_528 * fVar159;
          fStack_644 = fStack_504 + pfVar6[7] + fStack_164 + 0.0;
          local_700._0_4_ = auVar125._0_4_;
          local_700._4_4_ = auVar125._4_4_;
          fStack_6f8 = auVar125._8_4_;
          fStack_6f4 = auVar125._12_4_;
          fStack_6f0 = auVar125._16_4_;
          fStack_6ec = auVar125._20_4_;
          fStack_6e8 = auVar125._24_4_;
          fVar137 = (float)local_300._0_4_ * (float)local_700._0_4_;
          fVar157 = (float)local_300._4_4_ * (float)local_700._4_4_;
          fVar161 = fStack_2f8 * fStack_6f8;
          fVar164 = fStack_2f4 * fStack_6f4;
          fVar167 = fStack_2f0 * fStack_6f0;
          fVar170 = fStack_2ec * fStack_6ec;
          fVar173 = fStack_2e8 * fStack_6e8;
          local_560._0_4_ = auVar123._0_4_;
          local_560._4_4_ = auVar123._4_4_;
          fStack_558 = auVar123._8_4_;
          fStack_554 = auVar123._12_4_;
          fStack_550 = auVar123._16_4_;
          fStack_54c = auVar123._20_4_;
          fStack_548 = auVar123._24_4_;
          pfVar6 = (float *)(lVar131 + 0x21fcdfc + lVar133 * 4);
          fVar216 = *pfVar6;
          fVar218 = pfVar6[1];
          fVar219 = pfVar6[2];
          fVar220 = pfVar6[3];
          fVar255 = pfVar6[4];
          fVar263 = pfVar6[5];
          fVar265 = pfVar6[6];
          pfVar7 = (float *)(lVar131 + 0x21fd280 + lVar133 * 4);
          fVar267 = *pfVar7;
          fVar269 = pfVar7[1];
          fVar270 = pfVar7[2];
          fVar271 = pfVar7[3];
          fVar272 = pfVar7[4];
          fVar280 = pfVar7[5];
          fVar282 = pfVar7[6];
          fVar290 = pfVar5[7] + 0.0;
          pfVar8 = (float *)(lVar131 + 0x21fc978 + lVar133 * 4);
          fVar284 = *pfVar8;
          fVar286 = pfVar8[1];
          fVar287 = pfVar8[2];
          fVar288 = pfVar8[3];
          fVar311 = pfVar8[4];
          fVar233 = pfVar8[5];
          fVar301 = pfVar8[6];
          fVar176 = pfVar6[7] + pfVar7[7];
          fVar196 = pfVar7[7] + fVar290;
          fVar290 = pfVar5[7] + auVar356._28_4_ + fVar290;
          pfVar5 = (float *)(lVar131 + 0x21fc4f4 + lVar133 * 4);
          fVar195 = *pfVar5;
          fVar327 = pfVar5[1];
          fVar155 = pfVar5[2];
          fVar159 = pfVar5[3];
          fVar254 = pfVar5[4];
          fVar289 = pfVar5[5];
          fVar235 = pfVar5[6];
          local_700._4_4_ =
               (float)local_140._4_4_ * fVar327 +
               fVar286 * (float)local_2e0._4_4_ +
               (float)local_500._4_4_ * fVar218 + (float)local_4a0._4_4_ * fVar269;
          local_700._0_4_ =
               (float)local_140._0_4_ * fVar195 +
               fVar284 * (float)local_2e0._0_4_ +
               (float)local_500._0_4_ * fVar216 + (float)local_4a0._0_4_ * fVar267;
          fStack_6f8 = fStack_138 * fVar155 +
                       fVar287 * fStack_2d8 + fStack_4f8 * fVar219 + fStack_498 * fVar270;
          fStack_6f4 = fStack_134 * fVar159 +
                       fVar288 * fStack_2d4 + fStack_4f4 * fVar220 + fStack_494 * fVar271;
          fStack_6f0 = fStack_130 * fVar254 +
                       fVar311 * fStack_2d0 + fStack_4f0 * fVar255 + fStack_490 * fVar272;
          fStack_6ec = fStack_12c * fVar289 +
                       fVar233 * fStack_2cc + fStack_4ec * fVar263 + fStack_48c * fVar280;
          fStack_6e8 = fStack_128 * fVar235 +
                       fVar301 * fStack_2c8 + fStack_4e8 * fVar265 + fStack_488 * fVar282;
          fStack_6e4 = fVar176 + fVar196;
          auVar189._0_4_ =
               fVar195 * (float)local_740._0_4_ +
               (float)local_520._0_4_ * fVar216 + fVar267 * (float)local_5a0._0_4_ +
               fVar284 * (float)local_480._0_4_;
          auVar189._4_4_ =
               fVar327 * (float)local_740._4_4_ +
               (float)local_520._4_4_ * fVar218 + fVar269 * (float)local_5a0._4_4_ +
               fVar286 * (float)local_480._4_4_;
          auVar189._8_4_ =
               fVar155 * fStack_738 +
               fStack_518 * fVar219 + fVar270 * fStack_598 + fVar287 * fStack_478;
          auVar189._12_4_ =
               fVar159 * fStack_734 +
               fStack_514 * fVar220 + fVar271 * fStack_594 + fVar288 * fStack_474;
          auVar189._16_4_ =
               fVar254 * fStack_730 +
               fStack_510 * fVar255 + fVar272 * fStack_590 + fVar311 * fStack_470;
          auVar189._20_4_ =
               fVar289 * fStack_72c +
               fStack_50c * fVar263 + fVar280 * fStack_58c + fVar233 * fStack_46c;
          auVar189._24_4_ =
               fVar235 * fStack_728 +
               fStack_508 * fVar265 + fVar282 * fStack_588 + fVar301 * fStack_468;
          auVar189._28_4_ = fVar196 + fVar290;
          auVar357._0_4_ =
               fVar284 * (float)local_300._0_4_ +
               (float)local_e0._0_4_ * fVar216 + (float)local_540._0_4_ * fVar267 +
               (float)local_180._0_4_ * fVar195;
          auVar357._4_4_ =
               fVar286 * (float)local_300._4_4_ +
               (float)local_e0._4_4_ * fVar218 + (float)local_540._4_4_ * fVar269 +
               (float)local_180._4_4_ * fVar327;
          auVar357._8_4_ =
               fVar287 * fStack_2f8 + fStack_d8 * fVar219 + fStack_538 * fVar270 +
               fStack_178 * fVar155;
          auVar357._12_4_ =
               fVar288 * fStack_2f4 + fStack_d4 * fVar220 + fStack_534 * fVar271 +
               fStack_174 * fVar159;
          auVar357._16_4_ =
               fVar311 * fStack_2f0 + fStack_d0 * fVar255 + fStack_530 * fVar272 +
               fStack_170 * fVar254;
          auVar357._20_4_ =
               fVar233 * fStack_2ec + fStack_cc * fVar263 + fStack_52c * fVar280 +
               fStack_16c * fVar289;
          auVar357._24_4_ =
               fVar301 * fStack_2e8 + fStack_c8 * fVar265 + fStack_528 * fVar282 +
               fStack_168 * fVar235;
          auVar357._28_4_ = pfVar8[7] + fVar176 + fVar290;
          pfVar5 = (float *)(lVar131 + 0x21ff21c + lVar133 * 4);
          fVar216 = *pfVar5;
          fVar218 = pfVar5[1];
          fVar219 = pfVar5[2];
          fVar220 = pfVar5[3];
          fVar255 = pfVar5[4];
          fVar263 = pfVar5[5];
          fVar265 = pfVar5[6];
          pfVar6 = (float *)(lVar131 + 0x21ff6a0 + lVar133 * 4);
          fVar267 = *pfVar6;
          fVar269 = pfVar6[1];
          fVar270 = pfVar6[2];
          fVar271 = pfVar6[3];
          fVar272 = pfVar6[4];
          fVar280 = pfVar6[5];
          fVar282 = pfVar6[6];
          pfVar7 = (float *)(lVar131 + 0x21fed98 + lVar133 * 4);
          fVar284 = *pfVar7;
          fVar286 = pfVar7[1];
          fVar287 = pfVar7[2];
          fVar288 = pfVar7[3];
          fVar311 = pfVar7[4];
          fVar233 = pfVar7[5];
          fVar301 = pfVar7[6];
          pfVar8 = (float *)(lVar131 + 0x21fe914 + lVar133 * 4);
          fVar195 = *pfVar8;
          fVar327 = pfVar8[1];
          fVar155 = pfVar8[2];
          fVar159 = pfVar8[3];
          fVar254 = pfVar8[4];
          fVar289 = pfVar8[5];
          fVar235 = pfVar8[6];
          auVar322._0_4_ =
               (float)local_140._0_4_ * fVar195 +
               fVar284 * (float)local_2e0._0_4_ +
               (float)local_500._0_4_ * fVar216 + (float)local_4a0._0_4_ * fVar267;
          auVar322._4_4_ =
               (float)local_140._4_4_ * fVar327 +
               fVar286 * (float)local_2e0._4_4_ +
               (float)local_500._4_4_ * fVar218 + (float)local_4a0._4_4_ * fVar269;
          auVar322._8_4_ =
               fStack_138 * fVar155 +
               fVar287 * fStack_2d8 + fStack_4f8 * fVar219 + fStack_498 * fVar270;
          auVar322._12_4_ =
               fStack_134 * fVar159 +
               fVar288 * fStack_2d4 + fStack_4f4 * fVar220 + fStack_494 * fVar271;
          auVar322._16_4_ =
               fStack_130 * fVar254 +
               fVar311 * fStack_2d0 + fStack_4f0 * fVar255 + fStack_490 * fVar272;
          auVar322._20_4_ =
               fStack_12c * fVar289 +
               fVar233 * fStack_2cc + fStack_4ec * fVar263 + fStack_48c * fVar280;
          auVar322._24_4_ =
               fStack_128 * fVar235 +
               fVar301 * fStack_2c8 + fStack_4e8 * fVar265 + fStack_488 * fVar282;
          auVar322._28_4_ = fStack_164 + fStack_164 + fStack_484 + fStack_164;
          auVar350._0_4_ =
               fVar195 * (float)local_740._0_4_ +
               fVar284 * (float)local_480._0_4_ +
               fVar216 * (float)local_520._0_4_ + fVar267 * (float)local_5a0._0_4_;
          auVar350._4_4_ =
               fVar327 * (float)local_740._4_4_ +
               fVar286 * (float)local_480._4_4_ +
               fVar218 * (float)local_520._4_4_ + fVar269 * (float)local_5a0._4_4_;
          auVar350._8_4_ =
               fVar155 * fStack_738 +
               fVar287 * fStack_478 + fVar219 * fStack_518 + fVar270 * fStack_598;
          auVar350._12_4_ =
               fVar159 * fStack_734 +
               fVar288 * fStack_474 + fVar220 * fStack_514 + fVar271 * fStack_594;
          auVar350._16_4_ =
               fVar254 * fStack_730 +
               fVar311 * fStack_470 + fVar255 * fStack_510 + fVar272 * fStack_590;
          auVar350._20_4_ =
               fVar289 * fStack_72c +
               fVar233 * fStack_46c + fVar263 * fStack_50c + fVar280 * fStack_58c;
          auVar350._24_4_ =
               fVar235 * fStack_728 +
               fVar301 * fStack_468 + fVar265 * fStack_508 + fVar282 * fStack_588;
          auVar350._28_4_ = fStack_164 + fStack_164 + fStack_4e4 + fStack_164;
          auVar262._8_4_ = 0x7fffffff;
          auVar262._0_8_ = 0x7fffffff7fffffff;
          auVar262._12_4_ = 0x7fffffff;
          auVar262._16_4_ = 0x7fffffff;
          auVar262._20_4_ = 0x7fffffff;
          auVar262._24_4_ = 0x7fffffff;
          auVar262._28_4_ = 0x7fffffff;
          auVar147 = vandps_avx(_local_700,auVar262);
          auVar26 = vandps_avx(auVar189,auVar262);
          auVar26 = vmaxps_avx(auVar147,auVar26);
          auVar147 = vandps_avx(auVar357,auVar262);
          auVar26 = vmaxps_avx(auVar26,auVar147);
          auVar26 = vcmpps_avx(auVar26,local_360,1);
          auVar27 = vblendvps_avx(_local_700,auVar24,auVar26);
          auVar149._0_4_ =
               fVar195 * (float)local_180._0_4_ +
               fVar284 * (float)local_300._0_4_ +
               fVar267 * (float)local_540._0_4_ + (float)local_e0._0_4_ * fVar216;
          auVar149._4_4_ =
               fVar327 * (float)local_180._4_4_ +
               fVar286 * (float)local_300._4_4_ +
               fVar269 * (float)local_540._4_4_ + (float)local_e0._4_4_ * fVar218;
          auVar149._8_4_ =
               fVar155 * fStack_178 +
               fVar287 * fStack_2f8 + fVar270 * fStack_538 + fStack_d8 * fVar219;
          auVar149._12_4_ =
               fVar159 * fStack_174 +
               fVar288 * fStack_2f4 + fVar271 * fStack_534 + fStack_d4 * fVar220;
          auVar149._16_4_ =
               fVar254 * fStack_170 +
               fVar311 * fStack_2f0 + fVar272 * fStack_530 + fStack_d0 * fVar255;
          auVar149._20_4_ =
               fVar289 * fStack_16c +
               fVar233 * fStack_2ec + fVar280 * fStack_52c + fStack_cc * fVar263;
          auVar149._24_4_ =
               fVar235 * fStack_168 +
               fVar301 * fStack_2e8 + fVar282 * fStack_528 + fStack_c8 * fVar265;
          auVar149._28_4_ = auVar147._28_4_ + pfVar7[7] + pfVar6[7] + pfVar5[7];
          auVar28 = vblendvps_avx(auVar189,auVar25,auVar26);
          auVar147 = vandps_avx(auVar322,auVar262);
          auVar26 = vandps_avx(auVar350,auVar262);
          auVar29 = vmaxps_avx(auVar147,auVar26);
          auVar147 = vandps_avx(auVar149,auVar262);
          auVar147 = vmaxps_avx(auVar29,auVar147);
          local_6c0._0_4_ = auVar126._0_4_;
          local_6c0._4_4_ = auVar126._4_4_;
          uStack_6b8._0_4_ = auVar126._8_4_;
          uStack_6b8._4_4_ = auVar126._12_4_;
          auStack_6b0._0_4_ = auVar126._16_4_;
          auStack_6b0._4_4_ = auVar126._20_4_;
          fStack_6a8 = auVar126._24_4_;
          auVar26 = vcmpps_avx(auVar147,local_360,1);
          auVar147 = vblendvps_avx(auVar322,auVar24,auVar26);
          auVar150._0_4_ =
               (float)local_180._0_4_ * (float)local_6c0._0_4_ +
               fVar137 + (float)local_e0._0_4_ * (float)local_560._0_4_ +
                         (float)local_540._0_4_ * fVar313;
          auVar150._4_4_ =
               (float)local_180._4_4_ * (float)local_6c0._4_4_ +
               fVar157 + (float)local_e0._4_4_ * (float)local_560._4_4_ +
                         (float)local_540._4_4_ * fVar314;
          auVar150._8_4_ =
               fStack_178 * (float)uStack_6b8 +
               fVar161 + fStack_d8 * fStack_558 + fStack_538 * fVar234;
          auVar150._12_4_ =
               fStack_174 * uStack_6b8._4_4_ +
               fVar164 + fStack_d4 * fStack_554 + fStack_534 * fVar302;
          auVar150._16_4_ =
               fStack_170 * (float)auStack_6b0._0_4_ +
               fVar167 + fStack_d0 * fStack_550 + fStack_530 * fVar315;
          auVar150._20_4_ =
               fStack_16c * (float)auStack_6b0._4_4_ +
               fVar170 + fStack_cc * fStack_54c + fStack_52c * fVar316;
          auVar150._24_4_ =
               fStack_168 * fStack_6a8 + fVar173 + fStack_c8 * fStack_548 + fStack_528 * fVar236;
          auVar150._28_4_ = auVar29._28_4_ + fStack_644 + fStack_164 + 0.0;
          auVar26 = vblendvps_avx(auVar350,auVar25,auVar26);
          fVar137 = auVar27._0_4_;
          fVar157 = auVar27._4_4_;
          fVar161 = auVar27._8_4_;
          fVar164 = auVar27._12_4_;
          fVar167 = auVar27._16_4_;
          fVar170 = auVar27._20_4_;
          fVar173 = auVar27._24_4_;
          fVar176 = auVar27._28_4_;
          fVar284 = auVar147._0_4_;
          fVar287 = auVar147._4_4_;
          fVar311 = auVar147._8_4_;
          fVar301 = auVar147._12_4_;
          fVar314 = auVar147._16_4_;
          fVar302 = auVar147._20_4_;
          fVar316 = auVar147._24_4_;
          fVar216 = auVar28._0_4_;
          fVar219 = auVar28._4_4_;
          fVar255 = auVar28._8_4_;
          fVar265 = auVar28._12_4_;
          fVar269 = auVar28._16_4_;
          fVar271 = auVar28._20_4_;
          fVar280 = auVar28._24_4_;
          auVar333._0_4_ = fVar216 * fVar216 + fVar137 * fVar137;
          auVar333._4_4_ = fVar219 * fVar219 + fVar157 * fVar157;
          auVar333._8_4_ = fVar255 * fVar255 + fVar161 * fVar161;
          auVar333._12_4_ = fVar265 * fVar265 + fVar164 * fVar164;
          auVar333._16_4_ = fVar269 * fVar269 + fVar167 * fVar167;
          auVar333._20_4_ = fVar271 * fVar271 + fVar170 * fVar170;
          auVar333._24_4_ = fVar280 * fVar280 + fVar173 * fVar173;
          auVar333._28_4_ = auVar24._28_4_ + auVar25._28_4_;
          auVar24 = vrsqrtps_avx(auVar333);
          fVar218 = auVar24._0_4_;
          fVar220 = auVar24._4_4_;
          auVar78._4_4_ = fVar220 * 1.5;
          auVar78._0_4_ = fVar218 * 1.5;
          fVar263 = auVar24._8_4_;
          auVar78._8_4_ = fVar263 * 1.5;
          fVar267 = auVar24._12_4_;
          auVar78._12_4_ = fVar267 * 1.5;
          fVar270 = auVar24._16_4_;
          auVar78._16_4_ = fVar270 * 1.5;
          fVar272 = auVar24._20_4_;
          auVar78._20_4_ = fVar272 * 1.5;
          fVar282 = auVar24._24_4_;
          auVar78._24_4_ = fVar282 * 1.5;
          auVar78._28_4_ = auVar350._28_4_;
          auVar79._4_4_ = fVar220 * fVar220 * fVar220 * auVar333._4_4_ * 0.5;
          auVar79._0_4_ = fVar218 * fVar218 * fVar218 * auVar333._0_4_ * 0.5;
          auVar79._8_4_ = fVar263 * fVar263 * fVar263 * auVar333._8_4_ * 0.5;
          auVar79._12_4_ = fVar267 * fVar267 * fVar267 * auVar333._12_4_ * 0.5;
          auVar79._16_4_ = fVar270 * fVar270 * fVar270 * auVar333._16_4_ * 0.5;
          auVar79._20_4_ = fVar272 * fVar272 * fVar272 * auVar333._20_4_ * 0.5;
          auVar79._24_4_ = fVar282 * fVar282 * fVar282 * auVar333._24_4_ * 0.5;
          auVar79._28_4_ = auVar333._28_4_;
          auVar25 = vsubps_avx(auVar78,auVar79);
          fVar195 = auVar25._0_4_;
          fVar327 = auVar25._4_4_;
          fVar155 = auVar25._8_4_;
          fVar159 = auVar25._12_4_;
          fVar254 = auVar25._16_4_;
          fVar289 = auVar25._20_4_;
          fVar235 = auVar25._24_4_;
          fVar218 = auVar26._0_4_;
          fVar220 = auVar26._4_4_;
          fVar263 = auVar26._8_4_;
          fVar267 = auVar26._12_4_;
          fVar270 = auVar26._16_4_;
          fVar272 = auVar26._20_4_;
          fVar282 = auVar26._24_4_;
          auVar306._0_4_ = fVar218 * fVar218 + fVar284 * fVar284;
          auVar306._4_4_ = fVar220 * fVar220 + fVar287 * fVar287;
          auVar306._8_4_ = fVar263 * fVar263 + fVar311 * fVar311;
          auVar306._12_4_ = fVar267 * fVar267 + fVar301 * fVar301;
          auVar306._16_4_ = fVar270 * fVar270 + fVar314 * fVar314;
          auVar306._20_4_ = fVar272 * fVar272 + fVar302 * fVar302;
          auVar306._24_4_ = fVar282 * fVar282 + fVar316 * fVar316;
          auVar306._28_4_ = auVar24._28_4_ + auVar147._28_4_;
          auVar147 = vrsqrtps_avx(auVar306);
          fVar286 = auVar147._0_4_;
          fVar288 = auVar147._4_4_;
          auVar80._4_4_ = fVar288 * 1.5;
          auVar80._0_4_ = fVar286 * 1.5;
          fVar233 = auVar147._8_4_;
          auVar80._8_4_ = fVar233 * 1.5;
          fVar313 = auVar147._12_4_;
          auVar80._12_4_ = fVar313 * 1.5;
          fVar234 = auVar147._16_4_;
          auVar80._16_4_ = fVar234 * 1.5;
          fVar315 = auVar147._20_4_;
          auVar80._20_4_ = fVar315 * 1.5;
          fVar236 = auVar147._24_4_;
          auVar80._24_4_ = fVar236 * 1.5;
          auVar80._28_4_ = auVar350._28_4_;
          auVar81._4_4_ = fVar288 * fVar288 * fVar288 * auVar306._4_4_ * 0.5;
          auVar81._0_4_ = fVar286 * fVar286 * fVar286 * auVar306._0_4_ * 0.5;
          auVar81._8_4_ = fVar233 * fVar233 * fVar233 * auVar306._8_4_ * 0.5;
          auVar81._12_4_ = fVar313 * fVar313 * fVar313 * auVar306._12_4_ * 0.5;
          auVar81._16_4_ = fVar234 * fVar234 * fVar234 * auVar306._16_4_ * 0.5;
          auVar81._20_4_ = fVar315 * fVar315 * fVar315 * auVar306._20_4_ * 0.5;
          auVar81._24_4_ = fVar236 * fVar236 * fVar236 * auVar306._24_4_ * 0.5;
          auVar81._28_4_ = auVar306._28_4_;
          auVar24 = vsubps_avx(auVar80,auVar81);
          fVar286 = auVar24._0_4_;
          fVar288 = auVar24._4_4_;
          fVar233 = auVar24._8_4_;
          fVar313 = auVar24._12_4_;
          fVar234 = auVar24._16_4_;
          fVar315 = auVar24._20_4_;
          fVar236 = auVar24._24_4_;
          fVar216 = fVar136 * fVar195 * fVar216;
          fVar219 = fVar156 * fVar327 * fVar219;
          auVar82._4_4_ = fVar219;
          auVar82._0_4_ = fVar216;
          fVar255 = fVar160 * fVar155 * fVar255;
          auVar82._8_4_ = fVar255;
          fVar265 = fVar163 * fVar159 * fVar265;
          auVar82._12_4_ = fVar265;
          fVar269 = fVar166 * fVar254 * fVar269;
          auVar82._16_4_ = fVar269;
          fVar271 = fVar169 * fVar289 * fVar271;
          auVar82._20_4_ = fVar271;
          fVar280 = fVar172 * fVar235 * fVar280;
          auVar82._24_4_ = fVar280;
          auVar82._28_4_ = auVar147._28_4_;
          local_6c0._4_4_ = fVar219 + auVar356._4_4_;
          local_6c0._0_4_ = fVar216 + auVar356._0_4_;
          uStack_6b8._0_4_ = fVar255 + auVar356._8_4_;
          uStack_6b8._4_4_ = fVar265 + auVar356._12_4_;
          auStack_6b0._0_4_ = fVar269 + auVar356._16_4_;
          auStack_6b0._4_4_ = fVar271 + auVar356._20_4_;
          fStack_6a8 = fVar280 + auVar356._24_4_;
          fStack_6a4 = auVar147._28_4_ + auVar356._28_4_;
          local_6e0 = fVar136 * fVar195 * -fVar137;
          fStack_6dc = fVar156 * fVar327 * -fVar157;
          auVar83._4_4_ = fStack_6dc;
          auVar83._0_4_ = local_6e0;
          fStack_6d8 = fVar160 * fVar155 * -fVar161;
          auVar83._8_4_ = fStack_6d8;
          fStack_6d4 = fVar163 * fVar159 * -fVar164;
          auVar83._12_4_ = fStack_6d4;
          fStack_6d0 = fVar166 * fVar254 * -fVar167;
          auVar83._16_4_ = fStack_6d0;
          fStack_6cc = fVar169 * fVar289 * -fVar170;
          auVar83._20_4_ = fStack_6cc;
          fStack_6c8 = fVar172 * fVar235 * -fVar173;
          auVar83._24_4_ = fStack_6c8;
          auVar83._28_4_ = -fVar176;
          local_6e0 = local_7e0._0_4_ + local_6e0;
          fStack_6dc = local_7e0._4_4_ + fStack_6dc;
          fStack_6d8 = local_7e0._8_4_ + fStack_6d8;
          fStack_6d4 = local_7e0._12_4_ + fStack_6d4;
          fStack_6d0 = local_7e0._16_4_ + fStack_6d0;
          fStack_6cc = local_7e0._20_4_ + fStack_6cc;
          fStack_6c8 = local_7e0._24_4_ + fStack_6c8;
          fStack_6c4 = local_7e0._28_4_ + -fVar176;
          fVar216 = fVar195 * 0.0 * fVar136;
          fVar219 = fVar327 * 0.0 * fVar156;
          auVar84._4_4_ = fVar219;
          auVar84._0_4_ = fVar216;
          fVar255 = fVar155 * 0.0 * fVar160;
          auVar84._8_4_ = fVar255;
          fVar265 = fVar159 * 0.0 * fVar163;
          auVar84._12_4_ = fVar265;
          fVar269 = fVar254 * 0.0 * fVar166;
          auVar84._16_4_ = fVar269;
          fVar271 = fVar289 * 0.0 * fVar169;
          auVar84._20_4_ = fVar271;
          fVar280 = fVar235 * 0.0 * fVar172;
          auVar84._24_4_ = fVar280;
          auVar84._28_4_ = fVar176;
          auVar29 = vsubps_avx(auVar356,auVar82);
          auVar371._0_4_ = fVar216 + auVar150._0_4_;
          auVar371._4_4_ = fVar219 + auVar150._4_4_;
          auVar371._8_4_ = fVar255 + auVar150._8_4_;
          auVar371._12_4_ = fVar265 + auVar150._12_4_;
          auVar371._16_4_ = fVar269 + auVar150._16_4_;
          auVar371._20_4_ = fVar271 + auVar150._20_4_;
          auVar371._24_4_ = fVar280 + auVar150._24_4_;
          auVar371._28_4_ = fVar176 + auVar150._28_4_;
          fVar216 = auVar300._0_4_ * fVar286 * fVar218;
          fVar218 = auVar300._4_4_ * fVar288 * fVar220;
          auVar85._4_4_ = fVar218;
          auVar85._0_4_ = fVar216;
          fVar219 = auVar300._8_4_ * fVar233 * fVar263;
          auVar85._8_4_ = fVar219;
          fVar220 = auVar300._12_4_ * fVar313 * fVar267;
          auVar85._12_4_ = fVar220;
          fVar255 = auVar300._16_4_ * fVar234 * fVar270;
          auVar85._16_4_ = fVar255;
          fVar263 = auVar300._20_4_ * fVar315 * fVar272;
          auVar85._20_4_ = fVar263;
          fVar265 = auVar300._24_4_ * fVar236 * fVar282;
          auVar85._24_4_ = fVar265;
          auVar85._28_4_ = fVar175;
          auVar32 = vsubps_avx(local_7e0,auVar83);
          auVar358._0_4_ = local_320._0_4_ + fVar216;
          auVar358._4_4_ = local_320._4_4_ + fVar218;
          auVar358._8_4_ = local_320._8_4_ + fVar219;
          auVar358._12_4_ = local_320._12_4_ + fVar220;
          auVar358._16_4_ = local_320._16_4_ + fVar255;
          auVar358._20_4_ = local_320._20_4_ + fVar263;
          auVar358._24_4_ = local_320._24_4_ + fVar265;
          auVar358._28_4_ = local_320._28_4_ + fVar175;
          fVar216 = fVar286 * -fVar284 * auVar300._0_4_;
          fVar218 = fVar288 * -fVar287 * auVar300._4_4_;
          auVar86._4_4_ = fVar218;
          auVar86._0_4_ = fVar216;
          fVar219 = fVar233 * -fVar311 * auVar300._8_4_;
          auVar86._8_4_ = fVar219;
          fVar220 = fVar313 * -fVar301 * auVar300._12_4_;
          auVar86._12_4_ = fVar220;
          fVar255 = fVar234 * -fVar314 * auVar300._16_4_;
          auVar86._16_4_ = fVar255;
          fVar263 = fVar315 * -fVar302 * auVar300._20_4_;
          auVar86._20_4_ = fVar263;
          fVar265 = fVar236 * -fVar316 * auVar300._24_4_;
          auVar86._24_4_ = fVar265;
          auVar86._28_4_ = auVar356._28_4_;
          auVar140 = vsubps_avx(auVar150,auVar84);
          auVar247._0_4_ = auVar261._0_4_ + fVar216;
          auVar247._4_4_ = auVar261._4_4_ + fVar218;
          auVar247._8_4_ = auVar261._8_4_ + fVar219;
          auVar247._12_4_ = auVar261._12_4_ + fVar220;
          auVar247._16_4_ = auVar261._16_4_ + fVar255;
          auVar247._20_4_ = auVar261._20_4_ + fVar263;
          auVar247._24_4_ = auVar261._24_4_ + fVar265;
          auVar247._28_4_ = auVar261._28_4_ + auVar356._28_4_;
          fVar216 = fVar286 * 0.0 * auVar300._0_4_;
          fVar218 = fVar288 * 0.0 * auVar300._4_4_;
          auVar87._4_4_ = fVar218;
          auVar87._0_4_ = fVar216;
          fVar219 = fVar233 * 0.0 * auVar300._8_4_;
          auVar87._8_4_ = fVar219;
          fVar220 = fVar313 * 0.0 * auVar300._12_4_;
          auVar87._12_4_ = fVar220;
          fVar255 = fVar234 * 0.0 * auVar300._16_4_;
          auVar87._16_4_ = fVar255;
          fVar263 = fVar315 * 0.0 * auVar300._20_4_;
          auVar87._20_4_ = fVar263;
          fVar265 = fVar236 * 0.0 * auVar300._24_4_;
          auVar87._24_4_ = fVar265;
          auVar87._28_4_ = auVar150._28_4_;
          auVar147 = vsubps_avx(local_320,auVar85);
          auVar122._4_4_ = fStack_65c;
          auVar122._0_4_ = local_660;
          auVar122._8_4_ = fStack_658;
          auVar122._12_4_ = fStack_654;
          auVar122._16_4_ = fStack_650;
          auVar122._20_4_ = fStack_64c;
          auVar122._24_4_ = fStack_648;
          auVar122._28_4_ = fStack_644;
          auVar323._0_4_ = local_660 + fVar216;
          auVar323._4_4_ = fStack_65c + fVar218;
          auVar323._8_4_ = fStack_658 + fVar219;
          auVar323._12_4_ = fStack_654 + fVar220;
          auVar323._16_4_ = fStack_650 + fVar255;
          auVar323._20_4_ = fStack_64c + fVar263;
          auVar323._24_4_ = fStack_648 + fVar265;
          auVar323._28_4_ = fStack_644 + auVar150._28_4_;
          auVar25 = vsubps_avx(auVar261,auVar86);
          auVar26 = vsubps_avx(auVar122,auVar87);
          auVar27 = vsubps_avx(auVar247,auVar32);
          auVar28 = vsubps_avx(auVar323,auVar140);
          auVar88._4_4_ = auVar140._4_4_ * auVar27._4_4_;
          auVar88._0_4_ = auVar140._0_4_ * auVar27._0_4_;
          auVar88._8_4_ = auVar140._8_4_ * auVar27._8_4_;
          auVar88._12_4_ = auVar140._12_4_ * auVar27._12_4_;
          auVar88._16_4_ = auVar140._16_4_ * auVar27._16_4_;
          auVar88._20_4_ = auVar140._20_4_ * auVar27._20_4_;
          auVar88._24_4_ = auVar140._24_4_ * auVar27._24_4_;
          auVar88._28_4_ = auVar350._28_4_;
          auVar89._4_4_ = auVar32._4_4_ * auVar28._4_4_;
          auVar89._0_4_ = auVar32._0_4_ * auVar28._0_4_;
          auVar89._8_4_ = auVar32._8_4_ * auVar28._8_4_;
          auVar89._12_4_ = auVar32._12_4_ * auVar28._12_4_;
          auVar89._16_4_ = auVar32._16_4_ * auVar28._16_4_;
          auVar89._20_4_ = auVar32._20_4_ * auVar28._20_4_;
          auVar89._24_4_ = auVar32._24_4_ * auVar28._24_4_;
          auVar89._28_4_ = auVar261._28_4_;
          auVar30 = vsubps_avx(auVar89,auVar88);
          auVar90._4_4_ = auVar29._4_4_ * auVar28._4_4_;
          auVar90._0_4_ = auVar29._0_4_ * auVar28._0_4_;
          auVar90._8_4_ = auVar29._8_4_ * auVar28._8_4_;
          auVar90._12_4_ = auVar29._12_4_ * auVar28._12_4_;
          auVar90._16_4_ = auVar29._16_4_ * auVar28._16_4_;
          auVar90._20_4_ = auVar29._20_4_ * auVar28._20_4_;
          auVar90._24_4_ = auVar29._24_4_ * auVar28._24_4_;
          auVar90._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar358,auVar29);
          auVar91._4_4_ = auVar140._4_4_ * auVar28._4_4_;
          auVar91._0_4_ = auVar140._0_4_ * auVar28._0_4_;
          auVar91._8_4_ = auVar140._8_4_ * auVar28._8_4_;
          auVar91._12_4_ = auVar140._12_4_ * auVar28._12_4_;
          auVar91._16_4_ = auVar140._16_4_ * auVar28._16_4_;
          auVar91._20_4_ = auVar140._20_4_ * auVar28._20_4_;
          auVar91._24_4_ = auVar140._24_4_ * auVar28._24_4_;
          auVar91._28_4_ = auVar24._28_4_;
          auVar31 = vsubps_avx(auVar91,auVar90);
          auVar92._4_4_ = auVar32._4_4_ * auVar28._4_4_;
          auVar92._0_4_ = auVar32._0_4_ * auVar28._0_4_;
          auVar92._8_4_ = auVar32._8_4_ * auVar28._8_4_;
          auVar92._12_4_ = auVar32._12_4_ * auVar28._12_4_;
          auVar92._16_4_ = auVar32._16_4_ * auVar28._16_4_;
          auVar92._20_4_ = auVar32._20_4_ * auVar28._20_4_;
          auVar92._24_4_ = auVar32._24_4_ * auVar28._24_4_;
          auVar92._28_4_ = auVar24._28_4_;
          auVar93._4_4_ = auVar29._4_4_ * auVar27._4_4_;
          auVar93._0_4_ = auVar29._0_4_ * auVar27._0_4_;
          auVar93._8_4_ = auVar29._8_4_ * auVar27._8_4_;
          auVar93._12_4_ = auVar29._12_4_ * auVar27._12_4_;
          auVar93._16_4_ = auVar29._16_4_ * auVar27._16_4_;
          auVar93._20_4_ = auVar29._20_4_ * auVar27._20_4_;
          auVar93._24_4_ = auVar29._24_4_ * auVar27._24_4_;
          auVar93._28_4_ = auVar27._28_4_;
          auVar24 = vsubps_avx(auVar93,auVar92);
          auVar190._0_4_ = auVar30._0_4_ * 0.0 + auVar24._0_4_ + auVar31._0_4_ * 0.0;
          auVar190._4_4_ = auVar30._4_4_ * 0.0 + auVar24._4_4_ + auVar31._4_4_ * 0.0;
          auVar190._8_4_ = auVar30._8_4_ * 0.0 + auVar24._8_4_ + auVar31._8_4_ * 0.0;
          auVar190._12_4_ = auVar30._12_4_ * 0.0 + auVar24._12_4_ + auVar31._12_4_ * 0.0;
          auVar190._16_4_ = auVar30._16_4_ * 0.0 + auVar24._16_4_ + auVar31._16_4_ * 0.0;
          auVar190._20_4_ = auVar30._20_4_ * 0.0 + auVar24._20_4_ + auVar31._20_4_ * 0.0;
          auVar190._24_4_ = auVar30._24_4_ * 0.0 + auVar24._24_4_ + auVar31._24_4_ * 0.0;
          auVar190._28_4_ = auVar30._28_4_ + auVar24._28_4_ + auVar31._28_4_;
          auVar23 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,2);
          auVar147 = vblendvps_avx(auVar147,_local_6c0,auVar23);
          auVar120._4_4_ = fStack_6dc;
          auVar120._0_4_ = local_6e0;
          auVar120._8_4_ = fStack_6d8;
          auVar120._12_4_ = fStack_6d4;
          auVar120._16_4_ = fStack_6d0;
          auVar120._20_4_ = fStack_6cc;
          auVar120._24_4_ = fStack_6c8;
          auVar120._28_4_ = fStack_6c4;
          auVar24 = vblendvps_avx(auVar25,auVar120,auVar23);
          auVar25 = vblendvps_avx(auVar26,auVar371,auVar23);
          auVar26 = vblendvps_avx(auVar29,auVar358,auVar23);
          auVar27 = vblendvps_avx(auVar32,auVar247,auVar23);
          auVar28 = vblendvps_avx(auVar140,auVar323,auVar23);
          auVar29 = vblendvps_avx(auVar358,auVar29,auVar23);
          auVar30 = vblendvps_avx(auVar247,auVar32,auVar23);
          auVar31 = vblendvps_avx(auVar323,auVar140,auVar23);
          local_7e0 = vandps_avx(local_640,auVar230);
          auVar29 = vsubps_avx(auVar29,auVar147);
          auVar141 = vsubps_avx(auVar30,auVar24);
          auVar31 = vsubps_avx(auVar31,auVar25);
          auVar142 = vsubps_avx(auVar24,auVar27);
          fVar216 = auVar141._0_4_;
          fVar162 = auVar25._0_4_;
          fVar267 = auVar141._4_4_;
          fVar165 = auVar25._4_4_;
          auVar94._4_4_ = fVar165 * fVar267;
          auVar94._0_4_ = fVar162 * fVar216;
          fVar284 = auVar141._8_4_;
          fVar168 = auVar25._8_4_;
          auVar94._8_4_ = fVar168 * fVar284;
          fVar313 = auVar141._12_4_;
          fVar171 = auVar25._12_4_;
          auVar94._12_4_ = fVar171 * fVar313;
          fVar195 = auVar141._16_4_;
          fVar174 = auVar25._16_4_;
          auVar94._16_4_ = fVar174 * fVar195;
          fVar137 = auVar141._20_4_;
          fVar237 = auVar25._20_4_;
          auVar94._20_4_ = fVar237 * fVar137;
          fVar176 = auVar141._24_4_;
          fVar248 = auVar25._24_4_;
          auVar94._24_4_ = fVar248 * fVar176;
          auVar94._28_4_ = auVar30._28_4_;
          fVar218 = auVar24._0_4_;
          fVar250 = auVar31._0_4_;
          fVar269 = auVar24._4_4_;
          fVar252 = auVar31._4_4_;
          auVar95._4_4_ = fVar252 * fVar269;
          auVar95._0_4_ = fVar250 * fVar218;
          fVar286 = auVar24._8_4_;
          fVar256 = auVar31._8_4_;
          auVar95._8_4_ = fVar256 * fVar286;
          fVar314 = auVar24._12_4_;
          fVar264 = auVar31._12_4_;
          auVar95._12_4_ = fVar264 * fVar314;
          fVar327 = auVar24._16_4_;
          fVar266 = auVar31._16_4_;
          auVar95._16_4_ = fVar266 * fVar327;
          fVar157 = auVar24._20_4_;
          fVar268 = auVar31._20_4_;
          auVar95._20_4_ = fVar268 * fVar157;
          fVar196 = auVar24._24_4_;
          fVar273 = auVar31._24_4_;
          uVar9 = auVar32._28_4_;
          auVar95._24_4_ = fVar273 * fVar196;
          auVar95._28_4_ = uVar9;
          auVar30 = vsubps_avx(auVar95,auVar94);
          fVar219 = auVar147._0_4_;
          fVar270 = auVar147._4_4_;
          auVar96._4_4_ = fVar252 * fVar270;
          auVar96._0_4_ = fVar250 * fVar219;
          fVar287 = auVar147._8_4_;
          auVar96._8_4_ = fVar256 * fVar287;
          fVar234 = auVar147._12_4_;
          auVar96._12_4_ = fVar264 * fVar234;
          fVar155 = auVar147._16_4_;
          auVar96._16_4_ = fVar266 * fVar155;
          fVar161 = auVar147._20_4_;
          auVar96._20_4_ = fVar268 * fVar161;
          fVar290 = auVar147._24_4_;
          auVar96._24_4_ = fVar273 * fVar290;
          auVar96._28_4_ = uVar9;
          fVar220 = auVar29._0_4_;
          fVar271 = auVar29._4_4_;
          auVar97._4_4_ = fVar165 * fVar271;
          auVar97._0_4_ = fVar162 * fVar220;
          fVar288 = auVar29._8_4_;
          auVar97._8_4_ = fVar168 * fVar288;
          fVar302 = auVar29._12_4_;
          auVar97._12_4_ = fVar171 * fVar302;
          fVar159 = auVar29._16_4_;
          auVar97._16_4_ = fVar174 * fVar159;
          fVar164 = auVar29._20_4_;
          auVar97._20_4_ = fVar237 * fVar164;
          fVar326 = auVar29._24_4_;
          auVar97._24_4_ = fVar248 * fVar326;
          auVar97._28_4_ = auVar358._28_4_;
          auVar32 = vsubps_avx(auVar97,auVar96);
          auVar98._4_4_ = fVar269 * fVar271;
          auVar98._0_4_ = fVar218 * fVar220;
          auVar98._8_4_ = fVar286 * fVar288;
          auVar98._12_4_ = fVar314 * fVar302;
          auVar98._16_4_ = fVar327 * fVar159;
          auVar98._20_4_ = fVar157 * fVar164;
          auVar98._24_4_ = fVar196 * fVar326;
          auVar98._28_4_ = uVar9;
          auVar99._4_4_ = fVar270 * fVar267;
          auVar99._0_4_ = fVar219 * fVar216;
          auVar99._8_4_ = fVar287 * fVar284;
          auVar99._12_4_ = fVar234 * fVar313;
          auVar99._16_4_ = fVar155 * fVar195;
          auVar99._20_4_ = fVar161 * fVar137;
          auVar99._24_4_ = fVar290 * fVar176;
          auVar99._28_4_ = auVar140._28_4_;
          auVar140 = vsubps_avx(auVar99,auVar98);
          auVar25 = vsubps_avx(auVar25,auVar28);
          fVar263 = auVar140._28_4_ + auVar32._28_4_;
          auVar334._0_4_ = auVar140._0_4_ + auVar32._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
          auVar334._4_4_ = auVar140._4_4_ + auVar32._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
          auVar334._8_4_ = auVar140._8_4_ + auVar32._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
          auVar334._12_4_ = auVar140._12_4_ + auVar32._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
          auVar334._16_4_ = auVar140._16_4_ + auVar32._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
          auVar334._20_4_ = auVar140._20_4_ + auVar32._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
          auVar334._24_4_ = auVar140._24_4_ + auVar32._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
          auVar334._28_4_ = fVar263 + auVar30._28_4_;
          fVar255 = auVar142._0_4_;
          fVar272 = auVar142._4_4_;
          auVar100._4_4_ = auVar28._4_4_ * fVar272;
          auVar100._0_4_ = auVar28._0_4_ * fVar255;
          fVar311 = auVar142._8_4_;
          auVar100._8_4_ = auVar28._8_4_ * fVar311;
          fVar315 = auVar142._12_4_;
          auVar100._12_4_ = auVar28._12_4_ * fVar315;
          fVar254 = auVar142._16_4_;
          auVar100._16_4_ = auVar28._16_4_ * fVar254;
          fVar167 = auVar142._20_4_;
          auVar100._20_4_ = auVar28._20_4_ * fVar167;
          fVar135 = auVar142._24_4_;
          auVar100._24_4_ = auVar28._24_4_ * fVar135;
          auVar100._28_4_ = fVar263;
          fVar263 = auVar25._0_4_;
          fVar280 = auVar25._4_4_;
          auVar101._4_4_ = auVar27._4_4_ * fVar280;
          auVar101._0_4_ = auVar27._0_4_ * fVar263;
          fVar233 = auVar25._8_4_;
          auVar101._8_4_ = auVar27._8_4_ * fVar233;
          fVar316 = auVar25._12_4_;
          auVar101._12_4_ = auVar27._12_4_ * fVar316;
          fVar289 = auVar25._16_4_;
          auVar101._16_4_ = auVar27._16_4_ * fVar289;
          fVar170 = auVar25._20_4_;
          auVar101._20_4_ = auVar27._20_4_ * fVar170;
          fVar154 = auVar25._24_4_;
          auVar101._24_4_ = auVar27._24_4_ * fVar154;
          auVar101._28_4_ = auVar140._28_4_;
          auVar32 = vsubps_avx(auVar101,auVar100);
          auVar140 = vsubps_avx(auVar147,auVar26);
          fVar265 = auVar140._0_4_;
          fVar282 = auVar140._4_4_;
          auVar102._4_4_ = auVar28._4_4_ * fVar282;
          auVar102._0_4_ = auVar28._0_4_ * fVar265;
          fVar301 = auVar140._8_4_;
          auVar102._8_4_ = auVar28._8_4_ * fVar301;
          fVar236 = auVar140._12_4_;
          auVar102._12_4_ = auVar28._12_4_ * fVar236;
          fVar235 = auVar140._16_4_;
          auVar102._16_4_ = auVar28._16_4_ * fVar235;
          fVar173 = auVar140._20_4_;
          auVar102._20_4_ = auVar28._20_4_ * fVar173;
          fVar158 = auVar140._24_4_;
          auVar102._24_4_ = auVar28._24_4_ * fVar158;
          auVar102._28_4_ = auVar28._28_4_;
          auVar103._4_4_ = fVar280 * auVar26._4_4_;
          auVar103._0_4_ = fVar263 * auVar26._0_4_;
          auVar103._8_4_ = fVar233 * auVar26._8_4_;
          auVar103._12_4_ = fVar316 * auVar26._12_4_;
          auVar103._16_4_ = fVar289 * auVar26._16_4_;
          auVar103._20_4_ = fVar170 * auVar26._20_4_;
          auVar103._24_4_ = fVar154 * auVar26._24_4_;
          auVar103._28_4_ = auVar30._28_4_;
          auVar147 = vsubps_avx(auVar102,auVar103);
          auVar104._4_4_ = auVar27._4_4_ * fVar282;
          auVar104._0_4_ = auVar27._0_4_ * fVar265;
          auVar104._8_4_ = auVar27._8_4_ * fVar301;
          auVar104._12_4_ = auVar27._12_4_ * fVar236;
          auVar104._16_4_ = auVar27._16_4_ * fVar235;
          auVar104._20_4_ = auVar27._20_4_ * fVar173;
          auVar104._24_4_ = auVar27._24_4_ * fVar158;
          auVar104._28_4_ = auVar27._28_4_;
          auVar105._4_4_ = fVar272 * auVar26._4_4_;
          auVar105._0_4_ = fVar255 * auVar26._0_4_;
          auVar105._8_4_ = fVar311 * auVar26._8_4_;
          auVar105._12_4_ = fVar315 * auVar26._12_4_;
          auVar105._16_4_ = fVar254 * auVar26._16_4_;
          auVar105._20_4_ = fVar167 * auVar26._20_4_;
          auVar105._24_4_ = fVar135 * auVar26._24_4_;
          auVar105._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar105,auVar104);
          auVar151._0_4_ = auVar32._0_4_ * 0.0 + auVar26._0_4_ + auVar147._0_4_ * 0.0;
          auVar151._4_4_ = auVar32._4_4_ * 0.0 + auVar26._4_4_ + auVar147._4_4_ * 0.0;
          auVar151._8_4_ = auVar32._8_4_ * 0.0 + auVar26._8_4_ + auVar147._8_4_ * 0.0;
          auVar151._12_4_ = auVar32._12_4_ * 0.0 + auVar26._12_4_ + auVar147._12_4_ * 0.0;
          auVar151._16_4_ = auVar32._16_4_ * 0.0 + auVar26._16_4_ + auVar147._16_4_ * 0.0;
          auVar151._20_4_ = auVar32._20_4_ * 0.0 + auVar26._20_4_ + auVar147._20_4_ * 0.0;
          auVar151._24_4_ = auVar32._24_4_ * 0.0 + auVar26._24_4_ + auVar147._24_4_ * 0.0;
          auVar151._28_4_ = auVar147._28_4_ + auVar26._28_4_ + auVar147._28_4_;
          auVar147 = vmaxps_avx(auVar334,auVar151);
          auVar147 = vcmpps_avx(auVar147,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar26 = local_7e0 & auVar147;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
LAB_00a44ce7:
            auVar232 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar352._4_4_ = fVar156;
            auVar352._0_4_ = fVar136;
            auVar352._8_4_ = fVar160;
            auVar352._12_4_ = fVar163;
            auVar352._16_4_ = fVar166;
            auVar352._20_4_ = fVar169;
            auVar352._24_4_ = fVar172;
            auVar352._28_4_ = fVar175;
          }
          else {
            auVar26 = vandps_avx(auVar147,local_7e0);
            auVar106._4_4_ = fVar280 * fVar267;
            auVar106._0_4_ = fVar263 * fVar216;
            auVar106._8_4_ = fVar233 * fVar284;
            auVar106._12_4_ = fVar316 * fVar313;
            auVar106._16_4_ = fVar289 * fVar195;
            auVar106._20_4_ = fVar170 * fVar137;
            auVar106._24_4_ = fVar154 * fVar176;
            auVar106._28_4_ = local_7e0._28_4_;
            auVar107._4_4_ = fVar272 * fVar252;
            auVar107._0_4_ = fVar255 * fVar250;
            auVar107._8_4_ = fVar311 * fVar256;
            auVar107._12_4_ = fVar315 * fVar264;
            auVar107._16_4_ = fVar254 * fVar266;
            auVar107._20_4_ = fVar167 * fVar268;
            auVar107._24_4_ = fVar135 * fVar273;
            auVar107._28_4_ = auVar147._28_4_;
            auVar27 = vsubps_avx(auVar107,auVar106);
            auVar108._4_4_ = fVar282 * fVar252;
            auVar108._0_4_ = fVar265 * fVar250;
            auVar108._8_4_ = fVar301 * fVar256;
            auVar108._12_4_ = fVar236 * fVar264;
            auVar108._16_4_ = fVar235 * fVar266;
            auVar108._20_4_ = fVar173 * fVar268;
            auVar108._24_4_ = fVar158 * fVar273;
            auVar108._28_4_ = auVar31._28_4_;
            auVar109._4_4_ = fVar280 * fVar271;
            auVar109._0_4_ = fVar263 * fVar220;
            auVar109._8_4_ = fVar233 * fVar288;
            auVar109._12_4_ = fVar316 * fVar302;
            auVar109._16_4_ = fVar289 * fVar159;
            auVar109._20_4_ = fVar170 * fVar164;
            auVar109._24_4_ = fVar154 * fVar326;
            auVar109._28_4_ = auVar25._28_4_;
            auVar28 = vsubps_avx(auVar109,auVar108);
            auVar110._4_4_ = fVar272 * fVar271;
            auVar110._0_4_ = fVar255 * fVar220;
            auVar110._8_4_ = fVar311 * fVar288;
            auVar110._12_4_ = fVar315 * fVar302;
            auVar110._16_4_ = fVar254 * fVar159;
            auVar110._20_4_ = fVar167 * fVar164;
            auVar110._24_4_ = fVar135 * fVar326;
            auVar110._28_4_ = auVar29._28_4_;
            auVar111._4_4_ = fVar282 * fVar267;
            auVar111._0_4_ = fVar265 * fVar216;
            auVar111._8_4_ = fVar301 * fVar284;
            auVar111._12_4_ = fVar236 * fVar313;
            auVar111._16_4_ = fVar235 * fVar195;
            auVar111._20_4_ = fVar173 * fVar137;
            auVar111._24_4_ = fVar158 * fVar176;
            auVar111._28_4_ = auVar141._28_4_;
            auVar30 = vsubps_avx(auVar111,auVar110);
            auVar307._0_4_ = auVar27._0_4_ * 0.0 + auVar30._0_4_ + auVar28._0_4_ * 0.0;
            auVar307._4_4_ = auVar27._4_4_ * 0.0 + auVar30._4_4_ + auVar28._4_4_ * 0.0;
            auVar307._8_4_ = auVar27._8_4_ * 0.0 + auVar30._8_4_ + auVar28._8_4_ * 0.0;
            auVar307._12_4_ = auVar27._12_4_ * 0.0 + auVar30._12_4_ + auVar28._12_4_ * 0.0;
            auVar307._16_4_ = auVar27._16_4_ * 0.0 + auVar30._16_4_ + auVar28._16_4_ * 0.0;
            auVar307._20_4_ = auVar27._20_4_ * 0.0 + auVar30._20_4_ + auVar28._20_4_ * 0.0;
            auVar307._24_4_ = auVar27._24_4_ * 0.0 + auVar30._24_4_ + auVar28._24_4_ * 0.0;
            auVar307._28_4_ = auVar142._28_4_ + auVar30._28_4_ + auVar29._28_4_;
            auVar147 = vrcpps_avx(auVar307);
            fVar216 = auVar147._0_4_;
            fVar220 = auVar147._4_4_;
            auVar112._4_4_ = auVar307._4_4_ * fVar220;
            auVar112._0_4_ = auVar307._0_4_ * fVar216;
            fVar255 = auVar147._8_4_;
            auVar112._8_4_ = auVar307._8_4_ * fVar255;
            fVar263 = auVar147._12_4_;
            auVar112._12_4_ = auVar307._12_4_ * fVar263;
            fVar265 = auVar147._16_4_;
            auVar112._16_4_ = auVar307._16_4_ * fVar265;
            fVar267 = auVar147._20_4_;
            auVar112._20_4_ = auVar307._20_4_ * fVar267;
            fVar271 = auVar147._24_4_;
            auVar112._24_4_ = auVar307._24_4_ * fVar271;
            auVar112._28_4_ = auVar25._28_4_;
            auVar351._8_4_ = 0x3f800000;
            auVar351._0_8_ = 0x3f8000003f800000;
            auVar351._12_4_ = 0x3f800000;
            auVar351._16_4_ = 0x3f800000;
            auVar351._20_4_ = 0x3f800000;
            auVar351._24_4_ = 0x3f800000;
            auVar351._28_4_ = 0x3f800000;
            auVar147 = vsubps_avx(auVar351,auVar112);
            fVar216 = auVar147._0_4_ * fVar216 + fVar216;
            fVar220 = auVar147._4_4_ * fVar220 + fVar220;
            fVar255 = auVar147._8_4_ * fVar255 + fVar255;
            fVar263 = auVar147._12_4_ * fVar263 + fVar263;
            fVar265 = auVar147._16_4_ * fVar265 + fVar265;
            fVar267 = auVar147._20_4_ * fVar267 + fVar267;
            fVar271 = auVar147._24_4_ * fVar271 + fVar271;
            auVar113._4_4_ =
                 (fVar270 * auVar27._4_4_ + auVar28._4_4_ * fVar269 + fVar165 * auVar30._4_4_) *
                 fVar220;
            auVar113._0_4_ =
                 (fVar219 * auVar27._0_4_ + auVar28._0_4_ * fVar218 + fVar162 * auVar30._0_4_) *
                 fVar216;
            auVar113._8_4_ =
                 (fVar287 * auVar27._8_4_ + auVar28._8_4_ * fVar286 + fVar168 * auVar30._8_4_) *
                 fVar255;
            auVar113._12_4_ =
                 (fVar234 * auVar27._12_4_ + auVar28._12_4_ * fVar314 + fVar171 * auVar30._12_4_) *
                 fVar263;
            auVar113._16_4_ =
                 (fVar155 * auVar27._16_4_ + auVar28._16_4_ * fVar327 + fVar174 * auVar30._16_4_) *
                 fVar265;
            auVar113._20_4_ =
                 (fVar161 * auVar27._20_4_ + auVar28._20_4_ * fVar157 + fVar237 * auVar30._20_4_) *
                 fVar267;
            auVar113._24_4_ =
                 (fVar290 * auVar27._24_4_ + auVar28._24_4_ * fVar196 + fVar248 * auVar30._24_4_) *
                 fVar271;
            auVar113._28_4_ = auVar24._28_4_ + auVar30._28_4_;
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar231._4_4_ = uVar9;
            auVar231._0_4_ = uVar9;
            auVar231._8_4_ = uVar9;
            auVar231._12_4_ = uVar9;
            auVar231._16_4_ = uVar9;
            auVar231._20_4_ = uVar9;
            auVar231._24_4_ = uVar9;
            auVar231._28_4_ = uVar9;
            auVar24 = vcmpps_avx(_local_380,auVar113,2);
            auVar147 = vcmpps_avx(auVar113,auVar231,2);
            auVar147 = vandps_avx(auVar24,auVar147);
            auVar25 = auVar26 & auVar147;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) goto LAB_00a44ce7;
            auVar147 = vandps_avx(auVar26,auVar147);
            auVar25 = vcmpps_avx(auVar307,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar26 = auVar147 & auVar25;
            auVar232 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar352._4_4_ = fVar156;
            auVar352._0_4_ = fVar136;
            auVar352._8_4_ = fVar160;
            auVar352._12_4_ = fVar163;
            auVar352._16_4_ = fVar166;
            auVar352._20_4_ = fVar169;
            auVar352._24_4_ = fVar172;
            auVar352._28_4_ = fVar175;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar25,auVar147);
              auVar232 = ZEXT3264(auVar147);
              auVar114._4_4_ = auVar334._4_4_ * fVar220;
              auVar114._0_4_ = auVar334._0_4_ * fVar216;
              auVar114._8_4_ = auVar334._8_4_ * fVar255;
              auVar114._12_4_ = auVar334._12_4_ * fVar263;
              auVar114._16_4_ = auVar334._16_4_ * fVar265;
              auVar114._20_4_ = auVar334._20_4_ * fVar267;
              auVar114._24_4_ = auVar334._24_4_ * fVar271;
              auVar114._28_4_ = auVar24._28_4_;
              auVar115._4_4_ = auVar151._4_4_ * fVar220;
              auVar115._0_4_ = auVar151._0_4_ * fVar216;
              auVar115._8_4_ = auVar151._8_4_ * fVar255;
              auVar115._12_4_ = auVar151._12_4_ * fVar263;
              auVar115._16_4_ = auVar151._16_4_ * fVar265;
              auVar115._20_4_ = auVar151._20_4_ * fVar267;
              auVar115._24_4_ = auVar151._24_4_ * fVar271;
              auVar115._28_4_ = auVar151._28_4_;
              auVar279._8_4_ = 0x3f800000;
              auVar279._0_8_ = 0x3f8000003f800000;
              auVar279._12_4_ = 0x3f800000;
              auVar279._16_4_ = 0x3f800000;
              auVar279._20_4_ = 0x3f800000;
              auVar279._24_4_ = 0x3f800000;
              auVar279._28_4_ = 0x3f800000;
              auVar147 = vsubps_avx(auVar279,auVar114);
              local_5c0 = vblendvps_avx(auVar147,auVar114,auVar23);
              auVar147 = vsubps_avx(auVar279,auVar115);
              _local_3c0 = vblendvps_avx(auVar147,auVar115,auVar23);
              local_580 = auVar113;
            }
          }
          auVar308 = ZEXT3264(local_7c0);
          auVar147 = auVar232._0_32_;
          _local_760 = auVar300;
          local_4c0 = auVar230;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar232[0x1f]) {
LAB_00a449ea:
            auVar194 = ZEXT3264(local_5c0);
            fVar198 = (float)local_740._0_4_;
            fVar213 = (float)local_740._4_4_;
            fVar215 = fStack_738;
            fVar217 = fStack_734;
            fVar197 = fStack_730;
            fVar212 = fStack_72c;
            fVar214 = fStack_728;
          }
          else {
            auVar24 = vsubps_avx(auVar300,auVar352);
            fVar218 = auVar352._0_4_ + auVar24._0_4_ * local_5c0._0_4_;
            fVar219 = auVar352._4_4_ + auVar24._4_4_ * local_5c0._4_4_;
            fVar220 = auVar352._8_4_ + auVar24._8_4_ * local_5c0._8_4_;
            fVar255 = auVar352._12_4_ + auVar24._12_4_ * local_5c0._12_4_;
            fVar263 = auVar352._16_4_ + auVar24._16_4_ * local_5c0._16_4_;
            fVar265 = auVar352._20_4_ + auVar24._20_4_ * local_5c0._20_4_;
            fVar267 = auVar352._24_4_ + auVar24._24_4_ * local_5c0._24_4_;
            fVar269 = auVar352._28_4_ + auVar24._28_4_;
            fVar216 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar116._4_4_ = (fVar219 + fVar219) * fVar216;
            auVar116._0_4_ = (fVar218 + fVar218) * fVar216;
            auVar116._8_4_ = (fVar220 + fVar220) * fVar216;
            auVar116._12_4_ = (fVar255 + fVar255) * fVar216;
            auVar116._16_4_ = (fVar263 + fVar263) * fVar216;
            auVar116._20_4_ = (fVar265 + fVar265) * fVar216;
            auVar116._24_4_ = (fVar267 + fVar267) * fVar216;
            auVar116._28_4_ = fVar269 + fVar269;
            auVar24 = vcmpps_avx(local_580,auVar116,6);
            auVar25 = auVar147 & auVar24;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) {
              auVar194 = ZEXT3264(local_5c0);
            }
            else {
              local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
              local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
              uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
              uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
              uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
              uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
              uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
              uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
              local_2c0 = local_5c0;
              auVar127 = _local_3c0;
              auVar25 = _local_3c0;
              local_2a0 = (float)local_3c0._0_4_;
              fStack_29c = (float)local_3c0._4_4_;
              fStack_298 = (float)uStack_3b8;
              fStack_294 = uStack_3b8._4_4_;
              fStack_290 = (float)uStack_3b0;
              fStack_28c = uStack_3b0._4_4_;
              fStack_288 = (float)uStack_3a8;
              fStack_284 = uStack_3a8._4_4_;
              local_280 = local_580;
              local_25c = uVar19;
              local_250 = local_8a0;
              fStack_24c = fStack_89c;
              fStack_248 = fStack_898;
              fStack_244 = fStack_894;
              local_240 = local_880;
              fStack_23c = fStack_87c;
              fStack_238 = fStack_878;
              fStack_234 = fStack_874;
              local_230 = local_890;
              fStack_22c = fStack_88c;
              fStack_228 = fStack_888;
              fStack_224 = fStack_884;
              local_220 = local_830;
              fStack_21c = fStack_82c;
              fStack_218 = fStack_828;
              fStack_214 = fStack_824;
              pGVar21 = (context->scene->geometries).items[uVar128].ptr;
              auVar194 = ZEXT3264(local_5c0);
              if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_620 = vandps_avx(auVar24,auVar147);
                auVar202._0_4_ = (float)(int)local_260;
                auVar202._4_12_ = auVar140._4_12_;
                auVar241 = vshufps_avx(auVar202,auVar202,0);
                local_1e0[0] = (auVar241._0_4_ + local_5c0._0_4_ + 0.0) * (float)local_100._0_4_;
                local_1e0[1] = (auVar241._4_4_ + local_5c0._4_4_ + 1.0) * (float)local_100._4_4_;
                local_1e0[2] = (auVar241._8_4_ + local_5c0._8_4_ + 2.0) * fStack_f8;
                local_1e0[3] = (auVar241._12_4_ + local_5c0._12_4_ + 3.0) * fStack_f4;
                fStack_1d0 = (auVar241._0_4_ + local_5c0._16_4_ + 4.0) * fStack_f0;
                fStack_1cc = (auVar241._4_4_ + local_5c0._20_4_ + 5.0) * fStack_ec;
                fStack_1c8 = (auVar241._8_4_ + local_5c0._24_4_ + 6.0) * fStack_e8;
                fStack_1c4 = auVar241._12_4_ + local_5c0._28_4_ + 7.0;
                uStack_3b0 = auVar127._16_8_;
                uStack_3a8 = auVar25._24_8_;
                local_1c0 = local_3c0;
                uStack_1b8 = uStack_3b8;
                uStack_1b0 = uStack_3b0;
                uStack_1a8 = uStack_3a8;
                local_1a0 = local_580;
                auVar191._8_4_ = 0x7f800000;
                auVar191._0_8_ = 0x7f8000007f800000;
                auVar191._12_4_ = 0x7f800000;
                auVar191._16_4_ = 0x7f800000;
                auVar191._20_4_ = 0x7f800000;
                auVar191._24_4_ = 0x7f800000;
                auVar191._28_4_ = 0x7f800000;
                auVar147 = vblendvps_avx(auVar191,local_580,local_620);
                auVar24 = vshufps_avx(auVar147,auVar147,0xb1);
                auVar24 = vminps_avx(auVar147,auVar24);
                auVar26 = vshufpd_avx(auVar24,auVar24,5);
                auVar24 = vminps_avx(auVar24,auVar26);
                auVar26 = vperm2f128_avx(auVar24,auVar24,1);
                auVar24 = vminps_avx(auVar24,auVar26);
                auVar24 = vcmpps_avx(auVar147,auVar24,0);
                auVar26 = local_620 & auVar24;
                auVar147 = local_620;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar147 = vandps_avx(auVar24,local_620);
                }
                uVar130 = vmovmskps_avx(auVar147);
                uVar18 = 0;
                if (uVar130 != 0) {
                  for (; (uVar130 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar132 = (ulong)uVar18;
                _local_3c0 = auVar25;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar197 = local_1e0[uVar132];
                  uVar9 = *(undefined4 *)((long)&local_1c0 + uVar132 * 4);
                  fVar214 = 1.0 - fVar197;
                  fVar212 = fVar197 * fVar214 + fVar197 * fVar214;
                  auVar241 = ZEXT416((uint)(fVar197 * fVar197 * 3.0));
                  auVar241 = vshufps_avx(auVar241,auVar241,0);
                  auVar203 = ZEXT416((uint)((fVar212 - fVar197 * fVar197) * 3.0));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  auVar223 = ZEXT416((uint)((fVar214 * fVar214 - fVar212) * 3.0));
                  auVar223 = vshufps_avx(auVar223,auVar223,0);
                  auVar205 = ZEXT416((uint)(fVar214 * fVar214 * -3.0));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  auVar204._0_4_ =
                       local_8a0 * auVar205._0_4_ +
                       local_880 * auVar223._0_4_ +
                       local_830 * auVar241._0_4_ + local_890 * auVar203._0_4_;
                  auVar204._4_4_ =
                       fStack_89c * auVar205._4_4_ +
                       fStack_87c * auVar223._4_4_ +
                       fStack_82c * auVar241._4_4_ + fStack_88c * auVar203._4_4_;
                  auVar204._8_4_ =
                       fStack_898 * auVar205._8_4_ +
                       fStack_878 * auVar223._8_4_ +
                       fStack_828 * auVar241._8_4_ + fStack_888 * auVar203._8_4_;
                  auVar204._12_4_ =
                       fStack_894 * auVar205._12_4_ +
                       fStack_874 * auVar223._12_4_ +
                       fStack_824 * auVar241._12_4_ + fStack_884 * auVar203._12_4_;
                  auVar232 = ZEXT464(*(uint *)(local_1a0 + uVar132 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1a0 + uVar132 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = auVar204._0_4_;
                  uVar20 = vextractps_avx(auVar204,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
                  uVar20 = vextractps_avx(auVar204,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
                  *(float *)(ray + k * 4 + 0xf0) = fVar197;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                  *(uint *)(ray + k * 4 + 0x120) = uVar128;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  stack0xfffffffffffff968 = auVar261._8_24_;
                  auStack_7f0 = auVar356._16_16_;
                  local_800 = *local_718;
                  local_7e0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  local_720 = ray;
                  _local_560 = *pauVar4;
                  while( true ) {
                    local_420 = local_1e0[uVar132];
                    local_760 = (undefined1  [8])uVar132;
                    local_410 = *(undefined4 *)((long)&local_1c0 + uVar132 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar132 * 4);
                    fVar212 = 1.0 - local_420;
                    fVar197 = local_420 * fVar212 + local_420 * fVar212;
                    auVar241 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                    auVar241 = vshufps_avx(auVar241,auVar241,0);
                    auVar203 = ZEXT416((uint)((fVar197 - local_420 * local_420) * 3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar223 = ZEXT416((uint)((fVar212 * fVar212 - fVar197) * 3.0));
                    auVar223 = vshufps_avx(auVar223,auVar223,0);
                    local_790.context = context->user;
                    auVar205 = ZEXT416((uint)(fVar212 * fVar212 * -3.0));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    auVar206._0_4_ =
                         local_8a0 * auVar205._0_4_ +
                         local_880 * auVar223._0_4_ +
                         auVar241._0_4_ * local_830 + local_890 * auVar203._0_4_;
                    auVar206._4_4_ =
                         fStack_89c * auVar205._4_4_ +
                         fStack_87c * auVar223._4_4_ +
                         auVar241._4_4_ * fStack_82c + fStack_88c * auVar203._4_4_;
                    auVar206._8_4_ =
                         fStack_898 * auVar205._8_4_ +
                         fStack_878 * auVar223._8_4_ +
                         auVar241._8_4_ * fStack_828 + fStack_888 * auVar203._8_4_;
                    auVar206._12_4_ =
                         fStack_894 * auVar205._12_4_ +
                         fStack_874 * auVar223._12_4_ +
                         auVar241._12_4_ * fStack_824 + fStack_884 * auVar203._12_4_;
                    auVar241 = vshufps_avx(auVar206,auVar206,0);
                    local_450[0] = (RTCHitN)auVar241[0];
                    local_450[1] = (RTCHitN)auVar241[1];
                    local_450[2] = (RTCHitN)auVar241[2];
                    local_450[3] = (RTCHitN)auVar241[3];
                    local_450[4] = (RTCHitN)auVar241[4];
                    local_450[5] = (RTCHitN)auVar241[5];
                    local_450[6] = (RTCHitN)auVar241[6];
                    local_450[7] = (RTCHitN)auVar241[7];
                    local_450[8] = (RTCHitN)auVar241[8];
                    local_450[9] = (RTCHitN)auVar241[9];
                    local_450[10] = (RTCHitN)auVar241[10];
                    local_450[0xb] = (RTCHitN)auVar241[0xb];
                    local_450[0xc] = (RTCHitN)auVar241[0xc];
                    local_450[0xd] = (RTCHitN)auVar241[0xd];
                    local_450[0xe] = (RTCHitN)auVar241[0xe];
                    local_450[0xf] = (RTCHitN)auVar241[0xf];
                    auVar241 = vshufps_avx(auVar206,auVar206,0x55);
                    local_440 = auVar241;
                    local_430 = vshufps_avx(auVar206,auVar206,0xaa);
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_680._0_8_;
                    uStack_3f8 = local_680._8_8_;
                    local_3f0 = local_670;
                    vcmpps_avx(ZEXT1632(local_670),ZEXT1632(local_670),0xf);
                    uStack_3dc = (local_790.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_790.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_820 = local_800;
                    local_790.valid = (int *)local_820;
                    local_790.geometryUserPtr = pGVar21->userPtr;
                    local_790.hit = local_450;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar21->intersectionFilterN)(&local_790);
                      ray = local_720;
                    }
                    if (local_820 == (undefined1  [16])0x0) {
                      auVar241 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar241 = auVar241 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var22 = context->args->filter;
                      if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var22)(&local_790);
                        ray = local_720;
                      }
                      auVar203 = vpcmpeqd_avx(local_820,_DAT_01f45a50);
                      auVar223 = vpcmpeqd_avx(auVar241,auVar241);
                      auVar241 = auVar203 ^ auVar223;
                      if (local_820 != (undefined1  [16])0x0) {
                        auVar203 = auVar203 ^ auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])local_790.hit);
                        *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x10));
                        *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x20));
                        *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x30));
                        *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x40));
                        *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x50));
                        *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x60));
                        *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x70));
                        *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar223;
                        auVar203 = vmaskmovps_avx(auVar203,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x80));
                        *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar203;
                      }
                    }
                    auVar147 = local_580;
                    auVar232 = ZEXT3264(local_580);
                    auVar180._8_8_ = 0x100000001;
                    auVar180._0_8_ = 0x100000001;
                    if ((auVar180 & auVar241) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
                      auVar241 = local_7e0._0_16_;
                    }
                    else {
                      auVar241 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_620 + (long)local_760 * 4) = 0;
                    local_7e0._0_16_ = auVar241;
                    auVar241 = vshufps_avx(auVar241,auVar241,0);
                    auVar152._16_16_ = auVar241;
                    auVar152._0_16_ = auVar241;
                    auVar25 = vcmpps_avx(auVar147,auVar152,2);
                    auVar24 = vandps_avx(auVar25,local_620);
                    local_620 = local_620 & auVar25;
                    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_620 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_620 >> 0x7f,0) == '\0') &&
                          (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_620 >> 0xbf,0) == '\0') &&
                        (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_620[0x1f]) break;
                    auVar192._8_4_ = 0x7f800000;
                    auVar192._0_8_ = 0x7f8000007f800000;
                    auVar192._12_4_ = 0x7f800000;
                    auVar192._16_4_ = 0x7f800000;
                    auVar192._20_4_ = 0x7f800000;
                    auVar192._24_4_ = 0x7f800000;
                    auVar192._28_4_ = 0x7f800000;
                    auVar147 = vblendvps_avx(auVar192,auVar147,auVar24);
                    auVar25 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar25 = vminps_avx(auVar147,auVar25);
                    auVar26 = vshufpd_avx(auVar25,auVar25,5);
                    auVar25 = vminps_avx(auVar25,auVar26);
                    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                    auVar25 = vminps_avx(auVar25,auVar26);
                    auVar25 = vcmpps_avx(auVar147,auVar25,0);
                    auVar26 = auVar24 & auVar25;
                    auVar147 = auVar24;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0xbf,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar26[0x1f] < '\0') {
                      auVar147 = vandps_avx(auVar25,auVar24);
                    }
                    uVar130 = vmovmskps_avx(auVar147);
                    uVar18 = 0;
                    if (uVar130 != 0) {
                      for (; (uVar130 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    uVar132 = (ulong)uVar18;
                    local_620 = auVar24;
                  }
                  auVar308 = ZEXT3264(local_7c0);
                  pre = local_810;
                }
                goto LAB_00a449ea;
              }
            }
          }
        }
      }
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar148._4_4_ = uVar9;
    auVar148._0_4_ = uVar9;
    auVar148._8_4_ = uVar9;
    auVar148._12_4_ = uVar9;
    auVar148._16_4_ = uVar9;
    auVar148._20_4_ = uVar9;
    auVar148._24_4_ = uVar9;
    auVar148._28_4_ = uVar9;
    auVar147 = vcmpps_avx(local_80,auVar148,2);
    uVar128 = vmovmskps_avx(auVar147);
    uVar128 = (uint)uVar134 & uVar128;
    prim = (Primitive *)local_6a0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }